

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx512::CurveNiIntersectorK<4,16>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::CatmullRomCurveT,16>,embree::avx512::Intersect1KEpilog1<16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  uint uVar1;
  uint uVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  RTCRayQueryContext *pRVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  int iVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [60];
  undefined1 auVar50 [60];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  int iVar55;
  int iVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  byte bVar73;
  byte bVar74;
  byte bVar75;
  byte bVar76;
  byte bVar77;
  ulong uVar78;
  byte bVar79;
  ulong uVar80;
  undefined8 in_R10;
  long lVar81;
  bool bVar82;
  ulong uVar83;
  uint uVar84;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  uint uVar154;
  uint uVar155;
  uint uVar157;
  uint uVar158;
  uint uVar159;
  undefined1 in_ZmmResult [64];
  undefined1 auVar148 [64];
  undefined1 auVar96 [16];
  uint uVar156;
  uint uVar160;
  undefined1 auVar149 [64];
  undefined1 auVar150 [64];
  undefined1 auVar151 [64];
  undefined1 auVar152 [64];
  undefined1 auVar153 [64];
  float fVar161;
  vint4 bi_2;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined4 uVar182;
  vint4 bi_1;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar196 [32];
  undefined1 auVar185 [16];
  undefined1 auVar197 [32];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar198 [32];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar199 [32];
  undefined1 auVar200 [64];
  float fVar201;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  float fVar217;
  float fVar238;
  float fVar239;
  vint4 ai_2;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  float fVar240;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  float fVar241;
  float fVar242;
  float fVar243;
  undefined1 auVar237 [32];
  float fVar244;
  vint4 bi;
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [32];
  vint4 ai;
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar256 [32];
  undefined1 auVar255 [16];
  undefined1 auVar257 [32];
  undefined1 auVar258 [64];
  float fVar265;
  vint4 ai_1;
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  float fVar266;
  float fVar267;
  float fVar268;
  undefined1 auVar264 [32];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [32];
  undefined1 auVar273 [64];
  float fVar274;
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  float fVar281;
  undefined1 auVar277 [32];
  float fVar279;
  float fVar280;
  undefined1 auVar278 [64];
  float fVar282;
  undefined1 auVar283 [32];
  undefined1 auVar284 [64];
  undefined1 auVar285 [64];
  float s;
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [32];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [32];
  RTCFilterFunctionNArguments args;
  vint<16> mask;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  vfloatx_conflict vu0;
  StackEntry stack [3];
  int local_d24;
  RTCFilterFunctionNArguments local_ad0;
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 (*local_a58) [32];
  Primitive *local_a50;
  ulong local_a48;
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [16];
  undefined1 local_9f0 [16];
  undefined1 local_9e0 [8];
  float fStack_9d8;
  float fStack_9d4;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_950 [16];
  undefined1 local_940 [16];
  float local_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  undefined1 local_920 [16];
  undefined1 local_910 [16];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [64];
  undefined1 local_7c0 [64];
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  float local_740;
  float fStack_73c;
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [16];
  undefined1 local_710 [16];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  RTCHitN local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  byte abStack_1a0 [32];
  undefined1 auStack_180 [32];
  ulong uStack_160;
  int aiStack_158 [74];
  undefined1 auVar172 [32];
  
  uVar83 = (ulong)(byte)prim[1];
  fVar161 = *(float *)(prim + uVar83 * 0x19 + 0x12);
  auVar91 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar91 = vinsertps_avx(auVar91,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar90 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar90 = vinsertps_avx(auVar90,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar91 = vsubps_avx(auVar91,*(undefined1 (*) [16])(prim + uVar83 * 0x19 + 6));
  auVar218._0_4_ = fVar161 * auVar91._0_4_;
  auVar218._4_4_ = fVar161 * auVar91._4_4_;
  auVar218._8_4_ = fVar161 * auVar91._8_4_;
  auVar218._12_4_ = fVar161 * auVar91._12_4_;
  auVar96._0_4_ = fVar161 * auVar90._0_4_;
  auVar96._4_4_ = fVar161 * auVar90._4_4_;
  auVar96._8_4_ = fVar161 * auVar90._8_4_;
  auVar96._12_4_ = fVar161 * auVar90._12_4_;
  auVar91 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 4 + 6)));
  auVar90 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 5 + 6)));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar85 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 6 + 6)));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar92 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0xb + 6)));
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0xc + 6)));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar86 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0xd + 6)));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar166 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0x12 + 6)));
  auVar93 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0x13 + 6)));
  auVar166 = vcvtdq2ps_avx(auVar166);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar87 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0x14 + 6)));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar290._4_4_ = auVar96._0_4_;
  auVar290._0_4_ = auVar96._0_4_;
  auVar290._8_4_ = auVar96._0_4_;
  auVar290._12_4_ = auVar96._0_4_;
  auVar94 = vshufps_avx(auVar96,auVar96,0x55);
  auVar95 = vshufps_avx(auVar96,auVar96,0xaa);
  fVar161 = auVar95._0_4_;
  auVar245._0_4_ = fVar161 * auVar85._0_4_;
  fVar244 = auVar95._4_4_;
  auVar245._4_4_ = fVar244 * auVar85._4_4_;
  fVar217 = auVar95._8_4_;
  auVar245._8_4_ = fVar217 * auVar85._8_4_;
  fVar238 = auVar95._12_4_;
  auVar245._12_4_ = fVar238 * auVar85._12_4_;
  auVar183._0_4_ = auVar86._0_4_ * fVar161;
  auVar183._4_4_ = auVar86._4_4_ * fVar244;
  auVar183._8_4_ = auVar86._8_4_ * fVar217;
  auVar183._12_4_ = auVar86._12_4_ * fVar238;
  auVar162._0_4_ = auVar87._0_4_ * fVar161;
  auVar162._4_4_ = auVar87._4_4_ * fVar244;
  auVar162._8_4_ = auVar87._8_4_ * fVar217;
  auVar162._12_4_ = auVar87._12_4_ * fVar238;
  auVar95 = vfmadd231ps_fma(auVar245,auVar94,auVar90);
  auVar89 = vfmadd231ps_fma(auVar183,auVar94,auVar19);
  auVar94 = vfmadd231ps_fma(auVar162,auVar93,auVar94);
  auVar88 = vfmadd231ps_fma(auVar95,auVar290,auVar91);
  auVar89 = vfmadd231ps_fma(auVar89,auVar290,auVar92);
  auVar96 = vfmadd231ps_fma(auVar94,auVar166,auVar290);
  auVar291._4_4_ = auVar218._0_4_;
  auVar291._0_4_ = auVar218._0_4_;
  auVar291._8_4_ = auVar218._0_4_;
  auVar291._12_4_ = auVar218._0_4_;
  auVar94 = vshufps_avx(auVar218,auVar218,0x55);
  auVar95 = vshufps_avx(auVar218,auVar218,0xaa);
  auVar148._16_48_ = in_ZmmResult._16_48_;
  auVar85 = vmulps_avx512vl(auVar95,auVar85);
  auVar219._0_4_ = auVar95._0_4_ * auVar86._0_4_;
  auVar219._4_4_ = auVar95._4_4_ * auVar86._4_4_;
  auVar219._8_4_ = auVar95._8_4_ * auVar86._8_4_;
  auVar219._12_4_ = auVar95._12_4_ * auVar86._12_4_;
  auVar202._0_4_ = auVar95._0_4_ * auVar87._0_4_;
  auVar202._4_4_ = auVar95._4_4_ * auVar87._4_4_;
  auVar202._8_4_ = auVar95._8_4_ * auVar87._8_4_;
  auVar202._12_4_ = auVar95._12_4_ * auVar87._12_4_;
  auVar86 = vfmadd231ps_avx512vl(auVar85,auVar94,auVar90);
  auVar90 = vfmadd231ps_fma(auVar219,auVar94,auVar19);
  auVar85 = vfmadd231ps_fma(auVar202,auVar94,auVar93);
  auVar87 = vfmadd231ps_avx512vl(auVar86,auVar291,auVar91);
  auVar86 = vfmadd231ps_fma(auVar90,auVar291,auVar92);
  auVar93 = vfmadd231ps_fma(auVar85,auVar291,auVar166);
  auVar269._8_4_ = 0x7fffffff;
  auVar269._0_8_ = 0x7fffffff7fffffff;
  auVar269._12_4_ = 0x7fffffff;
  auVar91 = vandps_avx(auVar88,auVar269);
  auVar259._8_4_ = 0x219392ef;
  auVar259._0_8_ = 0x219392ef219392ef;
  auVar259._12_4_ = 0x219392ef;
  uVar78 = vcmpps_avx512vl(auVar91,auVar259,1);
  bVar82 = (bool)((byte)uVar78 & 1);
  auVar95._0_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar88._0_4_;
  bVar82 = (bool)((byte)(uVar78 >> 1) & 1);
  auVar95._4_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar88._4_4_;
  bVar82 = (bool)((byte)(uVar78 >> 2) & 1);
  auVar95._8_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar88._8_4_;
  bVar82 = (bool)((byte)(uVar78 >> 3) & 1);
  auVar95._12_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar88._12_4_;
  auVar91 = vandps_avx(auVar89,auVar269);
  uVar78 = vcmpps_avx512vl(auVar91,auVar259,1);
  bVar82 = (bool)((byte)uVar78 & 1);
  auVar88._0_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar89._0_4_;
  bVar82 = (bool)((byte)(uVar78 >> 1) & 1);
  auVar88._4_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar89._4_4_;
  bVar82 = (bool)((byte)(uVar78 >> 2) & 1);
  auVar88._8_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar89._8_4_;
  bVar82 = (bool)((byte)(uVar78 >> 3) & 1);
  auVar88._12_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar89._12_4_;
  auVar91 = vandps_avx(auVar96,auVar269);
  uVar78 = vcmpps_avx512vl(auVar91,auVar259,1);
  bVar82 = (bool)((byte)uVar78 & 1);
  auVar89._0_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar96._0_4_;
  bVar82 = (bool)((byte)(uVar78 >> 1) & 1);
  auVar89._4_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar96._4_4_;
  bVar82 = (bool)((byte)(uVar78 >> 2) & 1);
  auVar89._8_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar96._8_4_;
  bVar82 = (bool)((byte)(uVar78 >> 3) & 1);
  auVar89._12_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar96._12_4_;
  auVar90 = vrcp14ps_avx512vl(auVar95);
  auVar260._8_4_ = 0x3f800000;
  auVar260._0_8_ = 0x3f8000003f800000;
  auVar260._12_4_ = 0x3f800000;
  auVar91 = vfnmadd213ps_fma(auVar95,auVar90,auVar260);
  auVar85 = vfmadd132ps_fma(auVar91,auVar90,auVar90);
  auVar90 = vrcp14ps_avx512vl(auVar88);
  auVar91 = vfnmadd213ps_fma(auVar88,auVar90,auVar260);
  auVar19 = vfmadd132ps_fma(auVar91,auVar90,auVar90);
  auVar90 = vrcp14ps_avx512vl(auVar89);
  auVar91 = vfnmadd213ps_fma(auVar89,auVar90,auVar260);
  auVar166 = vfmadd132ps_fma(auVar91,auVar90,auVar90);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *(ulong *)(prim + uVar83 * 7 + 6);
  auVar91 = vpmovsxwd_avx(auVar91);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx512vl(auVar91,auVar87);
  auVar252._0_4_ = auVar85._0_4_ * auVar91._0_4_;
  auVar252._4_4_ = auVar85._4_4_ * auVar91._4_4_;
  auVar252._8_4_ = auVar85._8_4_ * auVar91._8_4_;
  auVar252._12_4_ = auVar85._12_4_ * auVar91._12_4_;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar83 * 9 + 6);
  auVar91 = vpmovsxwd_avx(auVar90);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx512vl(auVar91,auVar87);
  auVar246._0_4_ = auVar85._0_4_ * auVar91._0_4_;
  auVar246._4_4_ = auVar85._4_4_ * auVar91._4_4_;
  auVar246._8_4_ = auVar85._8_4_ * auVar91._8_4_;
  auVar246._12_4_ = auVar85._12_4_ * auVar91._12_4_;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar83 * 0xe + 6);
  auVar91 = vpmovsxwd_avx(auVar85);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,auVar86);
  auVar261._0_4_ = auVar19._0_4_ * auVar91._0_4_;
  auVar261._4_4_ = auVar19._4_4_ * auVar91._4_4_;
  auVar261._8_4_ = auVar19._8_4_ * auVar91._8_4_;
  auVar261._12_4_ = auVar19._12_4_ * auVar91._12_4_;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + (ulong)(byte)prim[1] * 0x10 + 6);
  auVar91 = vpmovsxwd_avx(auVar92);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,auVar86);
  auVar184._0_4_ = auVar19._0_4_ * auVar91._0_4_;
  auVar184._4_4_ = auVar19._4_4_ * auVar91._4_4_;
  auVar184._8_4_ = auVar19._8_4_ * auVar91._8_4_;
  auVar184._12_4_ = auVar19._12_4_ * auVar91._12_4_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar83 * 0x15 + 6);
  auVar91 = vpmovsxwd_avx(auVar19);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,auVar93);
  auVar220._0_4_ = auVar166._0_4_ * auVar91._0_4_;
  auVar220._4_4_ = auVar166._4_4_ * auVar91._4_4_;
  auVar220._8_4_ = auVar166._8_4_ * auVar91._8_4_;
  auVar220._12_4_ = auVar166._12_4_ * auVar91._12_4_;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar83 * 0x17 + 6);
  auVar91 = vpmovsxwd_avx(auVar86);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,auVar93);
  auVar163._0_4_ = auVar166._0_4_ * auVar91._0_4_;
  auVar163._4_4_ = auVar166._4_4_ * auVar91._4_4_;
  auVar163._8_4_ = auVar166._8_4_ * auVar91._8_4_;
  auVar163._12_4_ = auVar166._12_4_ * auVar91._12_4_;
  auVar91 = vpminsd_avx(auVar252,auVar246);
  auVar90 = vpminsd_avx(auVar261,auVar184);
  auVar91 = vmaxps_avx(auVar91,auVar90);
  auVar90 = vpminsd_avx(auVar220,auVar163);
  uVar182 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar166._4_4_ = uVar182;
  auVar166._0_4_ = uVar182;
  auVar166._8_4_ = uVar182;
  auVar166._12_4_ = uVar182;
  auVar90 = vmaxps_avx512vl(auVar90,auVar166);
  auVar91 = vmaxps_avx(auVar91,auVar90);
  auVar93._8_4_ = 0x3f7ffffa;
  auVar93._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar93._12_4_ = 0x3f7ffffa;
  local_720 = vmulps_avx512vl(auVar91,auVar93);
  auVar91 = vpmaxsd_avx(auVar252,auVar246);
  auVar90 = vpmaxsd_avx(auVar261,auVar184);
  auVar91 = vminps_avx(auVar91,auVar90);
  auVar90 = vpmaxsd_avx(auVar220,auVar163);
  uVar182 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar87._4_4_ = uVar182;
  auVar87._0_4_ = uVar182;
  auVar87._8_4_ = uVar182;
  auVar87._12_4_ = uVar182;
  auVar90 = vminps_avx512vl(auVar90,auVar87);
  auVar91 = vminps_avx(auVar91,auVar90);
  auVar94._8_4_ = 0x3f800003;
  auVar94._0_8_ = 0x3f8000033f800003;
  auVar94._12_4_ = 0x3f800003;
  auVar91 = vmulps_avx512vl(auVar91,auVar94);
  auVar148._0_16_ = vpbroadcastd_avx512vl();
  uVar20 = vcmpps_avx512vl(local_720,auVar91,2);
  uVar22 = vpcmpgtd_avx512vl(auVar148._0_16_,_DAT_01f4ad30);
  local_a48 = CONCAT44((int)((ulong)in_R10 >> 0x20),(uint)((byte)uVar20 & 0xf & (byte)uVar22));
  local_a58 = (undefined1 (*) [32])local_240;
  auVar181 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_4c0 = vmovdqa64_avx512f(auVar181);
  local_a50 = prim;
LAB_017f81a5:
  if (local_a48 == 0) {
    return;
  }
  lVar81 = 0;
  for (uVar78 = local_a48; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x8000000000000000) {
    lVar81 = lVar81 + 1;
  }
  uVar1 = *(uint *)(prim + 2);
  uVar2 = *(uint *)(prim + lVar81 * 4 + 6);
  pGVar3 = (context->scene->geometries).items[uVar1].ptr;
  uVar78 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar2);
  p_Var4 = pGVar3[1].intersectionFilterN;
  lVar81 = *(long *)&pGVar3[1].time_range.upper;
  auVar91 = *(undefined1 (*) [16])(lVar81 + (long)p_Var4 * uVar78);
  auVar90 = *(undefined1 (*) [16])(lVar81 + (uVar78 + 1) * (long)p_Var4);
  local_a48 = local_a48 - 1 & local_a48;
  if (local_a48 != 0) {
    uVar80 = local_a48 - 1 & local_a48;
    for (uVar83 = local_a48; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x8000000000000000) {
    }
    if (uVar80 != 0) {
      for (; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar85 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar92 = vinsertps_avx(auVar85,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  uVar182 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar286._4_4_ = uVar182;
  auVar286._0_4_ = uVar182;
  auVar286._8_4_ = uVar182;
  auVar286._12_4_ = uVar182;
  local_860._16_4_ = uVar182;
  local_860._0_16_ = auVar286;
  local_860._20_4_ = uVar182;
  local_860._24_4_ = uVar182;
  local_860._28_4_ = uVar182;
  uVar182 = *(undefined4 *)(ray + k * 4 + 0x140);
  auVar292._4_4_ = uVar182;
  auVar292._0_4_ = uVar182;
  auVar292._8_4_ = uVar182;
  auVar292._12_4_ = uVar182;
  local_6e0._16_4_ = uVar182;
  local_6e0._0_16_ = auVar292;
  local_6e0._20_4_ = uVar182;
  local_6e0._24_4_ = uVar182;
  local_6e0._28_4_ = uVar182;
  auVar85 = vunpcklps_avx(auVar286,auVar292);
  auVar181._32_32_ = auVar148._32_32_;
  auVar150._0_32_ = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x180)));
  auVar166 = auVar150._0_16_;
  local_9f0 = vinsertps_avx512f(auVar85,auVar166,0x28);
  auVar253._0_4_ = auVar91._0_4_ + auVar90._0_4_;
  auVar253._4_4_ = auVar91._4_4_ + auVar90._4_4_;
  auVar253._8_4_ = auVar91._8_4_ + auVar90._8_4_;
  auVar253._12_4_ = auVar91._12_4_ + auVar90._12_4_;
  auVar24._8_4_ = 0x3f000000;
  auVar24._0_8_ = 0x3f0000003f000000;
  auVar24._12_4_ = 0x3f000000;
  auVar85 = vmulps_avx512vl(auVar253,auVar24);
  auVar85 = vsubps_avx(auVar85,auVar92);
  auVar85 = vdpps_avx(auVar85,local_9f0,0x7f);
  local_a00 = vdpps_avx(local_9f0,local_9f0,0x7f);
  auVar284 = ZEXT1664(local_a00);
  fVar161 = *(float *)(ray + k * 4 + 0xc0);
  auVar285 = ZEXT464((uint)fVar161);
  auVar262._4_12_ = ZEXT812(0) << 0x20;
  auVar262._0_4_ = local_a00._0_4_;
  auVar86 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar262);
  auVar19 = vfnmadd213ss_fma(auVar86,local_a00,ZEXT416(0x40000000));
  local_660 = auVar85._0_4_ * auVar86._0_4_ * auVar19._0_4_;
  auVar263._4_4_ = local_660;
  auVar263._0_4_ = local_660;
  auVar263._8_4_ = local_660;
  auVar263._12_4_ = local_660;
  fStack_810 = local_660;
  _local_820 = auVar263;
  fStack_80c = local_660;
  fStack_808 = local_660;
  fStack_804 = local_660;
  auVar85 = vfmadd231ps_fma(auVar92,local_9f0,auVar263);
  auVar85 = vblendps_avx(auVar85,ZEXT816(0) << 0x40,8);
  auVar91 = vsubps_avx(auVar91,auVar85);
  auVar92 = vsubps_avx(*(undefined1 (*) [16])(lVar81 + (uVar78 + 2) * (long)p_Var4),auVar85);
  auVar273 = ZEXT1664(auVar92);
  auVar90 = vsubps_avx(auVar90,auVar85);
  auVar278 = ZEXT1664(auVar90);
  auVar85 = vsubps_avx(*(undefined1 (*) [16])(lVar81 + (uVar78 + 3) * (long)p_Var4),auVar85);
  auVar97 = vbroadcastss_avx512vl(auVar91);
  auVar109._8_4_ = 1;
  auVar109._0_8_ = 0x100000001;
  auVar109._12_4_ = 1;
  auVar109._16_4_ = 1;
  auVar109._20_4_ = 1;
  auVar109._24_4_ = 1;
  auVar109._28_4_ = 1;
  local_980 = ZEXT1632(auVar91);
  auVar98 = vpermps_avx512vl(auVar109,local_980);
  auVar110._8_4_ = 2;
  auVar110._0_8_ = 0x200000002;
  auVar110._12_4_ = 2;
  auVar110._16_4_ = 2;
  auVar110._20_4_ = 2;
  auVar110._24_4_ = 2;
  auVar110._28_4_ = 2;
  auVar99 = vpermps_avx512vl(auVar110,local_980);
  auVar107._8_4_ = 3;
  auVar107._0_8_ = 0x300000003;
  auVar107._12_4_ = 3;
  auVar107._16_4_ = 3;
  auVar107._20_4_ = 3;
  auVar107._24_4_ = 3;
  auVar107._28_4_ = 3;
  auVar100 = vpermps_avx512vl(auVar107,local_980);
  auVar101 = vbroadcastss_avx512vl(auVar90);
  local_9c0 = ZEXT1632(auVar90);
  auVar102 = vpermps_avx512vl(auVar109,local_9c0);
  auVar103 = vpermps_avx512vl(auVar110,local_9c0);
  auVar104 = vpermps_avx512vl(auVar107,local_9c0);
  auVar105 = vbroadcastss_avx512vl(auVar92);
  local_9a0 = ZEXT1632(auVar92);
  auVar149._0_32_ = vpermps_avx512vl(auVar109,local_9a0);
  local_5e0 = vpermps_avx512vl(auVar110,local_9a0);
  local_560 = vpermps_avx2(auVar107,local_9a0);
  local_600 = auVar85._0_4_;
  _local_9e0 = ZEXT1632(auVar85);
  local_580 = vpermps_avx2(auVar109,_local_9e0);
  auVar181._0_32_ = vpermps_avx512vl(auVar110,_local_9e0);
  local_640 = vpermps_avx2(auVar107,_local_9e0);
  auVar200._16_48_ = auVar181._16_48_;
  auVar200._0_16_ = vmulss_avx512f(auVar166,auVar166);
  auVar91 = vfmadd231ps_fma(ZEXT1632(auVar200._0_16_),local_6e0,local_6e0);
  auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),local_860,local_860);
  local_5a0._0_4_ = auVar91._0_4_;
  local_5a0._4_4_ = local_5a0._0_4_;
  local_5a0._8_4_ = local_5a0._0_4_;
  local_5a0._12_4_ = local_5a0._0_4_;
  local_5a0._16_4_ = local_5a0._0_4_;
  local_5a0._20_4_ = local_5a0._0_4_;
  local_5a0._24_4_ = local_5a0._0_4_;
  local_5a0._28_4_ = local_5a0._0_4_;
  auVar106._8_4_ = 0x7fffffff;
  auVar106._0_8_ = 0x7fffffff7fffffff;
  auVar106._12_4_ = 0x7fffffff;
  auVar106._16_4_ = 0x7fffffff;
  auVar106._20_4_ = 0x7fffffff;
  auVar106._24_4_ = 0x7fffffff;
  auVar106._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_5a0,auVar106);
  local_5c0 = auVar200._0_32_;
  local_950 = ZEXT416((uint)local_660);
  local_660 = fVar161 - local_660;
  fStack_65c = local_660;
  fStack_658 = local_660;
  fStack_654 = local_660;
  fStack_650 = local_660;
  fStack_64c = local_660;
  fStack_648 = local_660;
  fStack_644 = local_660;
  auVar148 = vpbroadcastd_avx512f();
  local_440 = vmovdqa64_avx512f(auVar148);
  uVar78 = 0;
  local_d24 = 1;
  auVar148 = vpbroadcastd_avx512f();
  local_480 = vmovdqa64_avx512f(auVar148);
  auVar91 = vsqrtss_avx(local_a00,local_a00);
  auVar90 = vsqrtss_avx(local_a00,local_a00);
  auVar200 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar258 = ZEXT3264(_DAT_01f7b040);
  fStack_5fc = local_600;
  fStack_5f8 = local_600;
  fStack_5f4 = local_600;
  fStack_5f0 = local_600;
  fStack_5ec = local_600;
  fStack_5e8 = local_600;
  fStack_5e4 = local_600;
  local_620 = auVar181._0_32_;
  do {
    local_710 = auVar200._0_16_;
    auVar85 = vmovshdup_avx(local_710);
    auVar85 = vsubps_avx(auVar85,local_710);
    auVar164._0_4_ = auVar85._0_4_;
    fVar244 = auVar164._0_4_ * 0.04761905;
    uVar182 = auVar200._0_4_;
    auVar251._4_4_ = uVar182;
    auVar251._0_4_ = uVar182;
    auVar251._8_4_ = uVar182;
    auVar251._12_4_ = uVar182;
    auVar251._16_4_ = uVar182;
    auVar251._20_4_ = uVar182;
    auVar251._24_4_ = uVar182;
    auVar251._28_4_ = uVar182;
    auVar164._4_4_ = auVar164._0_4_;
    auVar164._8_4_ = auVar164._0_4_;
    auVar164._12_4_ = auVar164._0_4_;
    auVar172._16_4_ = auVar164._0_4_;
    auVar172._0_16_ = auVar164;
    auVar172._20_4_ = auVar164._0_4_;
    auVar172._24_4_ = auVar164._0_4_;
    auVar172._28_4_ = auVar164._0_4_;
    auVar85 = vfmadd231ps_fma(auVar251,auVar172,auVar258._0_32_);
    auVar106 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar106 = vsubps_avx512vl(auVar106,ZEXT1632(auVar85));
    fVar217 = auVar85._0_4_;
    fVar238 = auVar85._4_4_;
    fVar239 = auVar85._8_4_;
    fVar240 = auVar85._12_4_;
    fVar242 = auVar106._0_4_;
    fVar243 = auVar106._4_4_;
    fVar265 = auVar106._8_4_;
    fVar266 = auVar106._12_4_;
    fVar267 = auVar106._16_4_;
    fVar201 = auVar106._20_4_;
    fVar268 = auVar106._24_4_;
    auVar113._4_4_ = fVar243 * fVar243 * -fVar238;
    auVar113._0_4_ = fVar242 * fVar242 * -fVar217;
    auVar113._8_4_ = fVar265 * fVar265 * -fVar239;
    auVar113._12_4_ = fVar266 * fVar266 * -fVar240;
    auVar113._16_4_ = fVar267 * fVar267 * -0.0;
    auVar113._20_4_ = fVar201 * fVar201 * -0.0;
    auVar113._24_4_ = fVar268 * fVar268 * -0.0;
    auVar113._28_4_ = 0x80000000;
    auVar258._28_36_ = auVar273._28_36_;
    auVar258._0_28_ =
         ZEXT1628(CONCAT412(fVar240 * fVar240,
                            CONCAT48(fVar239 * fVar239,CONCAT44(fVar238 * fVar238,fVar217 * fVar217)
                                    )));
    fVar274 = fVar217 * 3.0;
    fVar279 = fVar238 * 3.0;
    fVar280 = fVar239 * 3.0;
    fVar281 = fVar240 * 3.0;
    auVar273._28_36_ = auVar278._28_36_;
    auVar273._0_28_ = ZEXT1628(CONCAT412(fVar281,CONCAT48(fVar280,CONCAT44(fVar279,fVar274))));
    fVar282 = auVar278._28_4_ + -5.0;
    auVar128._0_4_ = (fVar274 + -5.0) * fVar217 * fVar217 + 2.0;
    auVar128._4_4_ = (fVar279 + -5.0) * fVar238 * fVar238 + 2.0;
    auVar128._8_4_ = (fVar280 + -5.0) * fVar239 * fVar239 + 2.0;
    auVar128._12_4_ = (fVar281 + -5.0) * fVar240 * fVar240 + 2.0;
    auVar128._16_4_ = 0x40000000;
    auVar128._20_4_ = 0x40000000;
    auVar128._24_4_ = 0x40000000;
    auVar128._28_4_ = auVar200._28_4_ + 2.0;
    auVar278._0_4_ = fVar242 * fVar242;
    auVar278._4_4_ = fVar243 * fVar243;
    auVar278._8_4_ = fVar265 * fVar265;
    auVar278._12_4_ = fVar266 * fVar266;
    auVar278._16_4_ = fVar267 * fVar267;
    auVar278._20_4_ = fVar201 * fVar201;
    auVar278._28_36_ = auVar284._28_36_;
    auVar278._24_4_ = fVar268 * fVar268;
    auVar129._0_4_ = auVar278._0_4_ * (fVar242 * 3.0 + -5.0) + 2.0;
    auVar129._4_4_ = auVar278._4_4_ * (fVar243 * 3.0 + -5.0) + 2.0;
    auVar129._8_4_ = auVar278._8_4_ * (fVar265 * 3.0 + -5.0) + 2.0;
    auVar129._12_4_ = auVar278._12_4_ * (fVar266 * 3.0 + -5.0) + 2.0;
    auVar129._16_4_ = auVar278._16_4_ * (fVar267 * 3.0 + -5.0) + 2.0;
    auVar129._20_4_ = auVar278._20_4_ * (fVar201 * 3.0 + -5.0) + 2.0;
    auVar129._24_4_ = auVar278._24_4_ * (fVar268 * 3.0 + -5.0) + 2.0;
    auVar129._28_4_ = auVar285._28_4_ + -5.0 + 2.0;
    fVar241 = auVar106._28_4_;
    auVar114._4_4_ = fVar238 * fVar238 * -fVar243;
    auVar114._0_4_ = fVar217 * fVar217 * -fVar242;
    auVar114._8_4_ = fVar239 * fVar239 * -fVar265;
    auVar114._12_4_ = fVar240 * fVar240 * -fVar266;
    auVar114._16_4_ = -fVar267 * 0.0 * 0.0;
    auVar114._20_4_ = -fVar201 * 0.0 * 0.0;
    auVar114._24_4_ = -fVar268 * 0.0 * 0.0;
    auVar114._28_4_ = -fVar241;
    auVar107 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar106 = vmulps_avx512vl(auVar113,auVar107);
    auVar108 = vmulps_avx512vl(auVar128,auVar107);
    auVar109 = vmulps_avx512vl(auVar129,auVar107);
    auVar110 = vmulps_avx512vl(auVar114,auVar107);
    auVar115._4_4_ = fStack_5fc * auVar110._4_4_;
    auVar115._0_4_ = local_600 * auVar110._0_4_;
    auVar115._8_4_ = fStack_5f8 * auVar110._8_4_;
    auVar115._12_4_ = fStack_5f4 * auVar110._12_4_;
    auVar115._16_4_ = fStack_5f0 * auVar110._16_4_;
    auVar115._20_4_ = fStack_5ec * auVar110._20_4_;
    auVar115._24_4_ = fStack_5e8 * auVar110._24_4_;
    auVar115._28_4_ = auVar129._28_4_;
    auVar111 = vmulps_avx512vl(local_580,auVar110);
    auVar112 = vmulps_avx512vl(local_620,auVar110);
    auVar117._4_4_ = local_640._4_4_ * auVar110._4_4_;
    auVar117._0_4_ = local_640._0_4_ * auVar110._0_4_;
    auVar117._8_4_ = local_640._8_4_ * auVar110._8_4_;
    auVar117._12_4_ = local_640._12_4_ * auVar110._12_4_;
    auVar117._16_4_ = local_640._16_4_ * auVar110._16_4_;
    auVar117._20_4_ = local_640._20_4_ * auVar110._20_4_;
    auVar117._24_4_ = local_640._24_4_ * auVar110._24_4_;
    auVar117._28_4_ = auVar110._28_4_;
    auVar110 = vfmadd231ps_avx512vl(auVar115,auVar109,auVar105);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar109,auVar149._0_32_);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar109,local_5e0);
    auVar109 = vfmadd231ps_avx512vl(auVar117,local_560,auVar109);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar108,auVar101);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar108,auVar102);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar108,auVar103);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar104,auVar108);
    auVar113 = vfmadd231ps_avx512vl(auVar110,auVar106,auVar97);
    auVar114 = vfmadd231ps_avx512vl(auVar111,auVar106,auVar98);
    auVar115 = vfmadd231ps_avx512vl(auVar112,auVar106,auVar99);
    auVar112 = vfmadd231ps_avx512vl(auVar109,auVar100,auVar106);
    auVar118._4_4_ = (fVar243 + fVar243) * fVar238;
    auVar118._0_4_ = (fVar242 + fVar242) * fVar217;
    auVar118._8_4_ = (fVar265 + fVar265) * fVar239;
    auVar118._12_4_ = (fVar266 + fVar266) * fVar240;
    auVar118._16_4_ = (fVar267 + fVar267) * 0.0;
    auVar118._20_4_ = (fVar201 + fVar201) * 0.0;
    auVar118._24_4_ = (fVar268 + fVar268) * 0.0;
    auVar118._28_4_ = auVar108._28_4_;
    auVar106 = vsubps_avx(auVar118,auVar278._0_32_);
    auVar130._0_28_ =
         ZEXT1628(CONCAT412((fVar240 + fVar240) * (fVar281 + -5.0) + fVar281 * fVar240,
                            CONCAT48((fVar239 + fVar239) * (fVar280 + -5.0) + fVar280 * fVar239,
                                     CONCAT44((fVar238 + fVar238) * (fVar279 + -5.0) +
                                              fVar279 * fVar238,
                                              (fVar217 + fVar217) * (fVar274 + -5.0) +
                                              fVar274 * fVar217))));
    auVar130._28_4_ = fVar282 + 0.0;
    auVar111._8_4_ = 0x40000000;
    auVar111._0_8_ = 0x4000000040000000;
    auVar111._12_4_ = 0x40000000;
    auVar111._16_4_ = 0x40000000;
    auVar111._20_4_ = 0x40000000;
    auVar111._24_4_ = 0x40000000;
    auVar111._28_4_ = 0x40000000;
    auVar109 = vaddps_avx512vl(auVar273._0_32_,auVar111);
    auVar119._4_4_ = (fVar243 + fVar243) * auVar109._4_4_;
    auVar119._0_4_ = (fVar242 + fVar242) * auVar109._0_4_;
    auVar119._8_4_ = (fVar265 + fVar265) * auVar109._8_4_;
    auVar119._12_4_ = (fVar266 + fVar266) * auVar109._12_4_;
    auVar119._16_4_ = (fVar267 + fVar267) * auVar109._16_4_;
    auVar119._20_4_ = (fVar201 + fVar201) * auVar109._20_4_;
    auVar119._24_4_ = (fVar268 + fVar268) * auVar109._24_4_;
    auVar119._28_4_ = auVar109._28_4_;
    auVar120._4_4_ = fVar243 * 3.0 * fVar243;
    auVar120._0_4_ = fVar242 * 3.0 * fVar242;
    auVar120._8_4_ = fVar265 * 3.0 * fVar265;
    auVar120._12_4_ = fVar266 * 3.0 * fVar266;
    auVar120._16_4_ = fVar267 * 3.0 * fVar267;
    auVar120._20_4_ = fVar201 * 3.0 * fVar201;
    auVar120._24_4_ = fVar268 * 3.0 * fVar268;
    auVar120._28_4_ = fVar241;
    auVar109 = vsubps_avx(auVar119,auVar120);
    auVar110 = vsubps_avx(auVar258._0_32_,auVar118);
    auVar106 = vmulps_avx512vl(auVar106,auVar107);
    auVar111 = vmulps_avx512vl(auVar130,auVar107);
    auVar109 = vmulps_avx512vl(auVar109,auVar107);
    auVar110 = vmulps_avx512vl(auVar110,auVar107);
    auVar121._4_4_ = fStack_5fc * auVar110._4_4_;
    auVar121._0_4_ = local_600 * auVar110._0_4_;
    auVar121._8_4_ = fStack_5f8 * auVar110._8_4_;
    auVar121._12_4_ = fStack_5f4 * auVar110._12_4_;
    auVar121._16_4_ = fStack_5f0 * auVar110._16_4_;
    auVar121._20_4_ = fStack_5ec * auVar110._20_4_;
    auVar121._24_4_ = fStack_5e8 * auVar110._24_4_;
    auVar121._28_4_ = fVar282;
    auVar107 = vmulps_avx512vl(local_580,auVar110);
    auVar116 = vmulps_avx512vl(local_620,auVar110);
    auVar122._4_4_ = local_640._4_4_ * auVar110._4_4_;
    auVar122._0_4_ = local_640._0_4_ * auVar110._0_4_;
    auVar122._8_4_ = local_640._8_4_ * auVar110._8_4_;
    auVar122._12_4_ = local_640._12_4_ * auVar110._12_4_;
    auVar122._16_4_ = local_640._16_4_ * auVar110._16_4_;
    auVar122._20_4_ = local_640._20_4_ * auVar110._20_4_;
    auVar122._24_4_ = local_640._24_4_ * auVar110._24_4_;
    auVar122._28_4_ = auVar110._28_4_;
    auVar110 = vfmadd231ps_avx512vl(auVar121,auVar109,auVar105);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar109,auVar149._0_32_);
    auVar116 = vfmadd231ps_avx512vl(auVar116,auVar109,local_5e0);
    auVar109 = vfmadd231ps_avx512vl(auVar122,local_560,auVar109);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar111,auVar101);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar111,auVar102);
    auVar116 = vfmadd231ps_avx512vl(auVar116,auVar111,auVar103);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar104,auVar111);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar106,auVar97);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar106,auVar98);
    auVar111 = vfmadd231ps_avx512vl(auVar116,auVar106,auVar99);
    auVar106 = vfmadd231ps_avx512vl(auVar109,auVar100,auVar106);
    auVar135._4_4_ = auVar110._4_4_ * fVar244;
    auVar135._0_4_ = auVar110._0_4_ * fVar244;
    auVar135._8_4_ = auVar110._8_4_ * fVar244;
    auVar135._12_4_ = auVar110._12_4_ * fVar244;
    auVar135._16_4_ = auVar110._16_4_ * fVar244;
    auVar135._20_4_ = auVar110._20_4_ * fVar244;
    auVar135._24_4_ = auVar110._24_4_ * fVar244;
    auVar135._28_4_ = fVar241 + fVar241;
    auVar136._4_4_ = auVar107._4_4_ * fVar244;
    auVar136._0_4_ = auVar107._0_4_ * fVar244;
    auVar136._8_4_ = auVar107._8_4_ * fVar244;
    auVar136._12_4_ = auVar107._12_4_ * fVar244;
    auVar136._16_4_ = auVar107._16_4_ * fVar244;
    auVar136._20_4_ = auVar107._20_4_ * fVar244;
    auVar136._24_4_ = auVar107._24_4_ * fVar244;
    auVar136._28_4_ = auVar108._28_4_;
    auVar137._4_4_ = auVar111._4_4_ * fVar244;
    auVar137._0_4_ = auVar111._0_4_ * fVar244;
    auVar137._8_4_ = auVar111._8_4_ * fVar244;
    auVar137._12_4_ = auVar111._12_4_ * fVar244;
    auVar137._16_4_ = auVar111._16_4_ * fVar244;
    auVar137._20_4_ = auVar111._20_4_ * fVar244;
    auVar137._24_4_ = auVar111._24_4_ * fVar244;
    auVar137._28_4_ = 0;
    fVar217 = fVar244 * auVar106._0_4_;
    fVar238 = fVar244 * auVar106._4_4_;
    auVar126._4_4_ = fVar238;
    auVar126._0_4_ = fVar217;
    fVar239 = fVar244 * auVar106._8_4_;
    auVar126._8_4_ = fVar239;
    fVar240 = fVar244 * auVar106._12_4_;
    auVar126._12_4_ = fVar240;
    fVar241 = fVar244 * auVar106._16_4_;
    auVar126._16_4_ = fVar241;
    fVar242 = fVar244 * auVar106._20_4_;
    auVar126._20_4_ = fVar242;
    fVar243 = fVar244 * auVar106._24_4_;
    auVar126._24_4_ = fVar243;
    auVar126._28_4_ = fVar244;
    auVar85 = vxorps_avx512vl(auVar104._0_16_,auVar104._0_16_);
    auVar117 = vpermt2ps_avx512vl(auVar113,_DAT_01fb9fc0,ZEXT1632(auVar85));
    auVar118 = vpermt2ps_avx512vl(auVar114,_DAT_01fb9fc0,ZEXT1632(auVar85));
    auVar284 = ZEXT3264(auVar118);
    auVar110 = ZEXT1632(auVar85);
    auVar119 = vpermt2ps_avx512vl(auVar115,_DAT_01fb9fc0,auVar110);
    auVar285 = ZEXT3264(auVar119);
    auVar131._0_4_ = auVar112._0_4_ + fVar217;
    auVar131._4_4_ = auVar112._4_4_ + fVar238;
    auVar131._8_4_ = auVar112._8_4_ + fVar239;
    auVar131._12_4_ = auVar112._12_4_ + fVar240;
    auVar131._16_4_ = auVar112._16_4_ + fVar241;
    auVar131._20_4_ = auVar112._20_4_ + fVar242;
    auVar131._24_4_ = auVar112._24_4_ + fVar243;
    auVar131._28_4_ = auVar112._28_4_ + fVar244;
    auVar106 = vmaxps_avx(auVar112,auVar131);
    auVar109 = vminps_avx(auVar112,auVar131);
    auVar112 = vpermt2ps_avx512vl(auVar112,_DAT_01fb9fc0,auVar110);
    auVar120 = vpermt2ps_avx512vl(auVar135,_DAT_01fb9fc0,auVar110);
    auVar121 = vpermt2ps_avx512vl(auVar136,_DAT_01fb9fc0,auVar110);
    auVar131 = ZEXT1632(auVar85);
    auVar122 = vpermt2ps_avx512vl(auVar137,_DAT_01fb9fc0,auVar131);
    auVar110 = vpermt2ps_avx512vl(auVar126,_DAT_01fb9fc0,auVar131);
    auVar116 = vsubps_avx512vl(auVar112,auVar110);
    auVar110 = vsubps_avx(auVar117,auVar113);
    auVar278 = ZEXT3264(auVar110);
    auVar107 = vsubps_avx(auVar118,auVar114);
    auVar273 = ZEXT3264(auVar107);
    auVar111 = vsubps_avx(auVar119,auVar115);
    auVar108 = vmulps_avx512vl(auVar107,auVar137);
    auVar108 = vfmsub231ps_avx512vl(auVar108,auVar136,auVar111);
    auVar123 = vmulps_avx512vl(auVar111,auVar135);
    auVar123 = vfmsub231ps_avx512vl(auVar123,auVar137,auVar110);
    auVar124 = vmulps_avx512vl(auVar110,auVar136);
    auVar124 = vfmsub231ps_avx512vl(auVar124,auVar135,auVar107);
    auVar124 = vmulps_avx512vl(auVar124,auVar124);
    auVar123 = vfmadd231ps_avx512vl(auVar124,auVar123,auVar123);
    auVar123 = vfmadd231ps_avx512vl(auVar123,auVar108,auVar108);
    auVar108 = vmulps_avx512vl(auVar111,auVar111);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar107,auVar107);
    auVar124 = vfmadd231ps_avx512vl(auVar108,auVar110,auVar110);
    auVar125 = vrcp14ps_avx512vl(auVar124);
    auVar108._8_4_ = 0x3f800000;
    auVar108._0_8_ = 0x3f8000003f800000;
    auVar108._12_4_ = 0x3f800000;
    auVar108._16_4_ = 0x3f800000;
    auVar108._20_4_ = 0x3f800000;
    auVar108._24_4_ = 0x3f800000;
    auVar108._28_4_ = 0x3f800000;
    auVar108 = vfnmadd213ps_avx512vl(auVar125,auVar124,auVar108);
    auVar108 = vfmadd132ps_avx512vl(auVar108,auVar125,auVar125);
    auVar123 = vmulps_avx512vl(auVar123,auVar108);
    auVar125 = vmulps_avx512vl(auVar107,auVar122);
    auVar125 = vfmsub231ps_avx512vl(auVar125,auVar121,auVar111);
    auVar126 = vmulps_avx512vl(auVar111,auVar120);
    auVar126 = vfmsub231ps_avx512vl(auVar126,auVar122,auVar110);
    auVar127 = vmulps_avx512vl(auVar110,auVar121);
    auVar127 = vfmsub231ps_avx512vl(auVar127,auVar120,auVar107);
    auVar127 = vmulps_avx512vl(auVar127,auVar127);
    auVar126 = vfmadd231ps_avx512vl(auVar127,auVar126,auVar126);
    auVar125 = vfmadd231ps_avx512vl(auVar126,auVar125,auVar125);
    auVar108 = vmulps_avx512vl(auVar125,auVar108);
    auVar108 = vmaxps_avx512vl(auVar123,auVar108);
    auVar108 = vsqrtps_avx512vl(auVar108);
    auVar123 = vmaxps_avx512vl(auVar116,auVar112);
    auVar106 = vmaxps_avx512vl(auVar106,auVar123);
    auVar125 = vaddps_avx512vl(auVar108,auVar106);
    auVar106 = vminps_avx512vl(auVar116,auVar112);
    auVar106 = vminps_avx(auVar109,auVar106);
    auVar106 = vsubps_avx512vl(auVar106,auVar108);
    auVar112._8_4_ = 0x3f800002;
    auVar112._0_8_ = 0x3f8000023f800002;
    auVar112._12_4_ = 0x3f800002;
    auVar112._16_4_ = 0x3f800002;
    auVar112._20_4_ = 0x3f800002;
    auVar112._24_4_ = 0x3f800002;
    auVar112._28_4_ = 0x3f800002;
    auVar109 = vmulps_avx512vl(auVar125,auVar112);
    auVar116._8_4_ = 0x3f7ffffc;
    auVar116._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar116._12_4_ = 0x3f7ffffc;
    auVar116._16_4_ = 0x3f7ffffc;
    auVar116._20_4_ = 0x3f7ffffc;
    auVar116._24_4_ = 0x3f7ffffc;
    auVar116._28_4_ = 0x3f7ffffc;
    auVar106 = vmulps_avx512vl(auVar106,auVar116);
    auVar109 = vmulps_avx512vl(auVar109,auVar109);
    auVar108 = vrsqrt14ps_avx512vl(auVar124);
    auVar123._8_4_ = 0xbf000000;
    auVar123._0_8_ = 0xbf000000bf000000;
    auVar123._12_4_ = 0xbf000000;
    auVar123._16_4_ = 0xbf000000;
    auVar123._20_4_ = 0xbf000000;
    auVar123._24_4_ = 0xbf000000;
    auVar123._28_4_ = 0xbf000000;
    auVar112 = vmulps_avx512vl(auVar124,auVar123);
    fVar244 = auVar108._0_4_;
    fVar217 = auVar108._4_4_;
    fVar238 = auVar108._8_4_;
    fVar239 = auVar108._12_4_;
    fVar240 = auVar108._16_4_;
    fVar241 = auVar108._20_4_;
    fVar242 = auVar108._24_4_;
    auVar127._4_4_ = fVar217 * fVar217 * fVar217 * auVar112._4_4_;
    auVar127._0_4_ = fVar244 * fVar244 * fVar244 * auVar112._0_4_;
    auVar127._8_4_ = fVar238 * fVar238 * fVar238 * auVar112._8_4_;
    auVar127._12_4_ = fVar239 * fVar239 * fVar239 * auVar112._12_4_;
    auVar127._16_4_ = fVar240 * fVar240 * fVar240 * auVar112._16_4_;
    auVar127._20_4_ = fVar241 * fVar241 * fVar241 * auVar112._20_4_;
    auVar127._24_4_ = fVar242 * fVar242 * fVar242 * auVar112._24_4_;
    auVar127._28_4_ = auVar125._28_4_;
    auVar124._8_4_ = 0x3fc00000;
    auVar124._0_8_ = 0x3fc000003fc00000;
    auVar124._12_4_ = 0x3fc00000;
    auVar124._16_4_ = 0x3fc00000;
    auVar124._20_4_ = 0x3fc00000;
    auVar124._24_4_ = 0x3fc00000;
    auVar124._28_4_ = 0x3fc00000;
    auVar108 = vfmadd231ps_avx512vl(auVar127,auVar108,auVar124);
    auVar112 = vmulps_avx512vl(auVar110,auVar108);
    auVar116 = vmulps_avx512vl(auVar107,auVar108);
    auVar123 = vmulps_avx512vl(auVar111,auVar108);
    auVar124 = vsubps_avx512vl(auVar131,auVar113);
    auVar126 = vsubps_avx512vl(auVar131,auVar114);
    auVar127 = vsubps_avx512vl(auVar131,auVar115);
    auVar125 = vmulps_avx512vl(auVar150._0_32_,auVar127);
    auVar125 = vfmadd231ps_avx512vl(auVar125,local_6e0,auVar126);
    auVar125 = vfmadd231ps_avx512vl(auVar125,local_860,auVar124);
    auVar128 = vmulps_avx512vl(auVar127,auVar127);
    auVar128 = vfmadd231ps_avx512vl(auVar128,auVar126,auVar126);
    auVar128 = vfmadd231ps_avx512vl(auVar128,auVar124,auVar124);
    auVar129 = vmulps_avx512vl(auVar150._0_32_,auVar123);
    auVar129 = vfmadd231ps_avx512vl(auVar129,auVar116,local_6e0);
    auVar129 = vfmadd231ps_avx512vl(auVar129,auVar112,local_860);
    auVar123 = vmulps_avx512vl(auVar127,auVar123);
    auVar116 = vfmadd231ps_avx512vl(auVar123,auVar126,auVar116);
    auVar112 = vfmadd231ps_avx512vl(auVar116,auVar124,auVar112);
    auVar116 = vmulps_avx512vl(auVar129,auVar129);
    auVar123 = vsubps_avx512vl(local_5a0,auVar116);
    auVar130 = vmulps_avx512vl(auVar129,auVar112);
    auVar125 = vsubps_avx512vl(auVar125,auVar130);
    auVar130 = vaddps_avx512vl(auVar125,auVar125);
    auVar125 = vmulps_avx512vl(auVar112,auVar112);
    auVar128 = vsubps_avx512vl(auVar128,auVar125);
    auVar109 = vsubps_avx512vl(auVar128,auVar109);
    local_a80 = vmulps_avx512vl(auVar130,auVar130);
    auVar125._8_4_ = 0x40800000;
    auVar125._0_8_ = 0x4080000040800000;
    auVar125._12_4_ = 0x40800000;
    auVar125._16_4_ = 0x40800000;
    auVar125._20_4_ = 0x40800000;
    auVar125._24_4_ = 0x40800000;
    auVar125._28_4_ = 0x40800000;
    _local_880 = vmulps_avx512vl(auVar123,auVar125);
    auVar125 = vmulps_avx512vl(_local_880,auVar109);
    auVar125 = vsubps_avx512vl(local_a80,auVar125);
    uVar83 = vcmpps_avx512vl(auVar125,auVar131,5);
    bVar73 = (byte)uVar83;
    if (bVar73 == 0) {
LAB_017f8ed4:
      auVar258 = ZEXT3264(_DAT_01f7b040);
      auVar149._32_32_ = auVar148._32_32_;
      auVar148 = auVar149;
    }
    else {
      local_800._0_32_ = auVar128;
      auVar125 = vsqrtps_avx512vl(auVar125);
      local_8a0 = vaddps_avx512vl(auVar123,auVar123);
      local_8c0 = vrcp14ps_avx512vl(local_8a0);
      auVar132._8_4_ = 0x3f800000;
      auVar132._0_8_ = 0x3f8000003f800000;
      auVar132._12_4_ = 0x3f800000;
      auVar132._16_4_ = 0x3f800000;
      auVar132._20_4_ = 0x3f800000;
      auVar132._24_4_ = 0x3f800000;
      auVar132._28_4_ = 0x3f800000;
      auVar131 = vfnmadd213ps_avx512vl(local_8c0,local_8a0,auVar132);
      auVar131 = vfmadd132ps_avx512vl(auVar131,local_8c0,local_8c0);
      auVar34._8_4_ = 0x80000000;
      auVar34._0_8_ = 0x8000000080000000;
      auVar34._12_4_ = 0x80000000;
      auVar34._16_4_ = 0x80000000;
      auVar34._20_4_ = 0x80000000;
      auVar34._24_4_ = 0x80000000;
      auVar34._28_4_ = 0x80000000;
      local_8e0 = vxorps_avx512vl(auVar130,auVar34);
      auVar132 = vsubps_avx512vl(local_8e0,auVar125);
      local_aa0 = vmulps_avx512vl(auVar132,auVar131);
      auVar125 = vsubps_avx512vl(auVar125,auVar130);
      local_a20 = vmulps_avx512vl(auVar125,auVar131);
      auVar125 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar131 = vblendmps_avx512vl(auVar125,local_aa0);
      auVar133._0_4_ =
           (uint)(bVar73 & 1) * auVar131._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar125._0_4_;
      bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
      auVar133._4_4_ = (uint)bVar82 * auVar131._4_4_ | (uint)!bVar82 * auVar125._4_4_;
      bVar82 = (bool)((byte)(uVar83 >> 2) & 1);
      auVar133._8_4_ = (uint)bVar82 * auVar131._8_4_ | (uint)!bVar82 * auVar125._8_4_;
      bVar82 = (bool)((byte)(uVar83 >> 3) & 1);
      auVar133._12_4_ = (uint)bVar82 * auVar131._12_4_ | (uint)!bVar82 * auVar125._12_4_;
      bVar82 = (bool)((byte)(uVar83 >> 4) & 1);
      auVar133._16_4_ = (uint)bVar82 * auVar131._16_4_ | (uint)!bVar82 * auVar125._16_4_;
      bVar82 = (bool)((byte)(uVar83 >> 5) & 1);
      auVar133._20_4_ = (uint)bVar82 * auVar131._20_4_ | (uint)!bVar82 * auVar125._20_4_;
      bVar82 = (bool)((byte)(uVar83 >> 6) & 1);
      auVar133._24_4_ = (uint)bVar82 * auVar131._24_4_ | (uint)!bVar82 * auVar125._24_4_;
      bVar82 = SUB81(uVar83 >> 7,0);
      auVar133._28_4_ = (uint)bVar82 * auVar131._28_4_ | (uint)!bVar82 * auVar125._28_4_;
      auVar125 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar131 = vblendmps_avx512vl(auVar125,local_a20);
      auVar134._0_4_ =
           (uint)(bVar73 & 1) * auVar131._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar125._0_4_;
      bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
      auVar134._4_4_ = (uint)bVar82 * auVar131._4_4_ | (uint)!bVar82 * auVar125._4_4_;
      bVar82 = (bool)((byte)(uVar83 >> 2) & 1);
      auVar134._8_4_ = (uint)bVar82 * auVar131._8_4_ | (uint)!bVar82 * auVar125._8_4_;
      bVar82 = (bool)((byte)(uVar83 >> 3) & 1);
      auVar134._12_4_ = (uint)bVar82 * auVar131._12_4_ | (uint)!bVar82 * auVar125._12_4_;
      bVar82 = (bool)((byte)(uVar83 >> 4) & 1);
      auVar134._16_4_ = (uint)bVar82 * auVar131._16_4_ | (uint)!bVar82 * auVar125._16_4_;
      bVar82 = (bool)((byte)(uVar83 >> 5) & 1);
      auVar134._20_4_ = (uint)bVar82 * auVar131._20_4_ | (uint)!bVar82 * auVar125._20_4_;
      bVar82 = (bool)((byte)(uVar83 >> 6) & 1);
      auVar134._24_4_ = (uint)bVar82 * auVar131._24_4_ | (uint)!bVar82 * auVar125._24_4_;
      bVar82 = SUB81(uVar83 >> 7,0);
      auVar134._28_4_ = (uint)bVar82 * auVar131._28_4_ | (uint)!bVar82 * auVar125._28_4_;
      auVar125 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar116,auVar125);
      local_a40 = vmaxps_avx512vl(local_5c0,auVar125);
      auVar35._8_4_ = 0x36000000;
      auVar35._0_8_ = 0x3600000036000000;
      auVar35._12_4_ = 0x36000000;
      auVar35._16_4_ = 0x36000000;
      auVar35._20_4_ = 0x36000000;
      auVar35._24_4_ = 0x36000000;
      auVar35._28_4_ = 0x36000000;
      local_900 = vmulps_avx512vl(local_a40,auVar35);
      vandps_avx512vl(auVar123,auVar125);
      uVar80 = vcmpps_avx512vl(local_900,local_900,1);
      uVar83 = uVar83 & uVar80;
      bVar79 = (byte)uVar83;
      if (bVar79 != 0) {
        uVar80 = vcmpps_avx512vl(auVar109,_DAT_01f7b000,2);
        auVar109 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar116 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar123 = vblendmps_avx512vl(auVar109,auVar116);
        bVar77 = (byte)uVar80;
        uVar84 = (uint)(bVar77 & 1) * auVar123._0_4_ | (uint)!(bool)(bVar77 & 1) * local_900._0_4_;
        bVar82 = (bool)((byte)(uVar80 >> 1) & 1);
        uVar154 = (uint)bVar82 * auVar123._4_4_ | (uint)!bVar82 * local_900._4_4_;
        bVar82 = (bool)((byte)(uVar80 >> 2) & 1);
        uVar155 = (uint)bVar82 * auVar123._8_4_ | (uint)!bVar82 * local_900._8_4_;
        bVar82 = (bool)((byte)(uVar80 >> 3) & 1);
        uVar156 = (uint)bVar82 * auVar123._12_4_ | (uint)!bVar82 * local_900._12_4_;
        bVar82 = (bool)((byte)(uVar80 >> 4) & 1);
        uVar157 = (uint)bVar82 * auVar123._16_4_ | (uint)!bVar82 * local_900._16_4_;
        bVar82 = (bool)((byte)(uVar80 >> 5) & 1);
        uVar158 = (uint)bVar82 * auVar123._20_4_ | (uint)!bVar82 * local_900._20_4_;
        bVar82 = (bool)((byte)(uVar80 >> 6) & 1);
        uVar159 = (uint)bVar82 * auVar123._24_4_ | (uint)!bVar82 * local_900._24_4_;
        bVar82 = SUB81(uVar80 >> 7,0);
        uVar160 = (uint)bVar82 * auVar123._28_4_ | (uint)!bVar82 * local_900._28_4_;
        auVar133._0_4_ = (bVar79 & 1) * uVar84 | !(bool)(bVar79 & 1) * auVar133._0_4_;
        bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar133._4_4_ = bVar82 * uVar154 | !bVar82 * auVar133._4_4_;
        bVar82 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar133._8_4_ = bVar82 * uVar155 | !bVar82 * auVar133._8_4_;
        bVar82 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar133._12_4_ = bVar82 * uVar156 | !bVar82 * auVar133._12_4_;
        bVar82 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar133._16_4_ = bVar82 * uVar157 | !bVar82 * auVar133._16_4_;
        bVar82 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar133._20_4_ = bVar82 * uVar158 | !bVar82 * auVar133._20_4_;
        bVar82 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar133._24_4_ = bVar82 * uVar159 | !bVar82 * auVar133._24_4_;
        bVar82 = SUB81(uVar83 >> 7,0);
        auVar133._28_4_ = bVar82 * uVar160 | !bVar82 * auVar133._28_4_;
        auVar109 = vblendmps_avx512vl(auVar116,auVar109);
        bVar82 = (bool)((byte)(uVar80 >> 1) & 1);
        bVar7 = (bool)((byte)(uVar80 >> 2) & 1);
        bVar8 = (bool)((byte)(uVar80 >> 3) & 1);
        bVar9 = (bool)((byte)(uVar80 >> 4) & 1);
        bVar10 = (bool)((byte)(uVar80 >> 5) & 1);
        bVar11 = (bool)((byte)(uVar80 >> 6) & 1);
        bVar12 = SUB81(uVar80 >> 7,0);
        auVar134._0_4_ =
             (uint)(bVar79 & 1) *
             ((uint)(bVar77 & 1) * auVar109._0_4_ | !(bool)(bVar77 & 1) * uVar84) |
             !(bool)(bVar79 & 1) * auVar134._0_4_;
        bVar6 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar134._4_4_ =
             (uint)bVar6 * ((uint)bVar82 * auVar109._4_4_ | !bVar82 * uVar154) |
             !bVar6 * auVar134._4_4_;
        bVar82 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar134._8_4_ =
             (uint)bVar82 * ((uint)bVar7 * auVar109._8_4_ | !bVar7 * uVar155) |
             !bVar82 * auVar134._8_4_;
        bVar82 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar134._12_4_ =
             (uint)bVar82 * ((uint)bVar8 * auVar109._12_4_ | !bVar8 * uVar156) |
             !bVar82 * auVar134._12_4_;
        bVar82 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar134._16_4_ =
             (uint)bVar82 * ((uint)bVar9 * auVar109._16_4_ | !bVar9 * uVar157) |
             !bVar82 * auVar134._16_4_;
        bVar82 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar134._20_4_ =
             (uint)bVar82 * ((uint)bVar10 * auVar109._20_4_ | !bVar10 * uVar158) |
             !bVar82 * auVar134._20_4_;
        bVar82 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar134._24_4_ =
             (uint)bVar82 * ((uint)bVar11 * auVar109._24_4_ | !bVar11 * uVar159) |
             !bVar82 * auVar134._24_4_;
        bVar82 = SUB81(uVar83 >> 7,0);
        auVar134._28_4_ =
             (uint)bVar82 * ((uint)bVar12 * auVar109._28_4_ | !bVar12 * uVar160) |
             !bVar82 * auVar134._28_4_;
        bVar73 = (~bVar79 | bVar77) & bVar73;
      }
      if ((bVar73 & 0x7f) == 0) goto LAB_017f8ed4;
      auVar125 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar122 = vxorps_avx512vl(auVar122,auVar125);
      auVar120 = vxorps_avx512vl(auVar120,auVar125);
      auVar181 = ZEXT464(*(uint *)(ray + k * 4 + 0x200));
      auVar121 = vxorps_avx512vl(auVar121,auVar125);
      auVar85 = vsubss_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x200)),
                               ZEXT416((uint)local_950._0_4_));
      auVar109 = vbroadcastss_avx512vl(auVar85);
      auVar109 = vminps_avx512vl(auVar109,auVar134);
      auVar72._4_4_ = fStack_65c;
      auVar72._0_4_ = local_660;
      auVar72._8_4_ = fStack_658;
      auVar72._12_4_ = fStack_654;
      auVar72._16_4_ = fStack_650;
      auVar72._20_4_ = fStack_64c;
      auVar72._24_4_ = fStack_648;
      auVar72._28_4_ = fStack_644;
      auVar116 = vmaxps_avx512vl(auVar72,auVar133);
      auVar123 = vmulps_avx512vl(auVar127,auVar137);
      auVar123 = vfmadd213ps_avx512vl(auVar126,auVar136,auVar123);
      auVar85 = vfmadd213ps_fma(auVar124,auVar135,auVar123);
      auVar123 = vmulps_avx512vl(auVar150._0_32_,auVar137);
      auVar123 = vfmadd231ps_avx512vl(auVar123,local_6e0,auVar136);
      auVar123 = vfmadd231ps_avx512vl(auVar123,local_860,auVar135);
      auVar124 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar123,auVar124);
      auVar135 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar20 = vcmpps_avx512vl(auVar124,auVar135,1);
      auVar136 = vxorps_avx512vl(ZEXT1632(auVar85),auVar125);
      auVar137 = vrcp14ps_avx512vl(auVar123);
      auVar126 = vxorps_avx512vl(auVar123,auVar125);
      auVar127 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar131 = vfnmadd213ps_avx512vl(auVar137,auVar123,auVar127);
      auVar85 = vfmadd132ps_fma(auVar131,auVar137,auVar137);
      fVar244 = auVar85._0_4_ * auVar136._0_4_;
      fVar217 = auVar85._4_4_ * auVar136._4_4_;
      auVar40._4_4_ = fVar217;
      auVar40._0_4_ = fVar244;
      fVar238 = auVar85._8_4_ * auVar136._8_4_;
      auVar40._8_4_ = fVar238;
      fVar239 = auVar85._12_4_ * auVar136._12_4_;
      auVar40._12_4_ = fVar239;
      fVar240 = auVar136._16_4_ * 0.0;
      auVar40._16_4_ = fVar240;
      fVar241 = auVar136._20_4_ * 0.0;
      auVar40._20_4_ = fVar241;
      fVar242 = auVar136._24_4_ * 0.0;
      auVar40._24_4_ = fVar242;
      auVar40._28_4_ = auVar136._28_4_;
      uVar22 = vcmpps_avx512vl(auVar123,auVar126,1);
      bVar79 = (byte)uVar20 | (byte)uVar22;
      auVar131 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar132 = vblendmps_avx512vl(auVar40,auVar131);
      auVar138._0_4_ =
           (uint)(bVar79 & 1) * auVar132._0_4_ | (uint)!(bool)(bVar79 & 1) * auVar137._0_4_;
      bVar82 = (bool)(bVar79 >> 1 & 1);
      auVar138._4_4_ = (uint)bVar82 * auVar132._4_4_ | (uint)!bVar82 * auVar137._4_4_;
      bVar82 = (bool)(bVar79 >> 2 & 1);
      auVar138._8_4_ = (uint)bVar82 * auVar132._8_4_ | (uint)!bVar82 * auVar137._8_4_;
      bVar82 = (bool)(bVar79 >> 3 & 1);
      auVar138._12_4_ = (uint)bVar82 * auVar132._12_4_ | (uint)!bVar82 * auVar137._12_4_;
      bVar82 = (bool)(bVar79 >> 4 & 1);
      auVar138._16_4_ = (uint)bVar82 * auVar132._16_4_ | (uint)!bVar82 * auVar137._16_4_;
      bVar82 = (bool)(bVar79 >> 5 & 1);
      auVar138._20_4_ = (uint)bVar82 * auVar132._20_4_ | (uint)!bVar82 * auVar137._20_4_;
      bVar82 = (bool)(bVar79 >> 6 & 1);
      auVar138._24_4_ = (uint)bVar82 * auVar132._24_4_ | (uint)!bVar82 * auVar137._24_4_;
      auVar138._28_4_ =
           (uint)(bVar79 >> 7) * auVar132._28_4_ | (uint)!(bool)(bVar79 >> 7) * auVar137._28_4_;
      auVar137 = vmaxps_avx512vl(auVar116,auVar138);
      uVar22 = vcmpps_avx512vl(auVar123,auVar126,6);
      bVar79 = (byte)uVar20 | (byte)uVar22;
      auVar126 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar139._0_4_ =
           (uint)(bVar79 & 1) * auVar126._0_4_ | (uint)!(bool)(bVar79 & 1) * (int)fVar244;
      bVar82 = (bool)(bVar79 >> 1 & 1);
      auVar139._4_4_ = (uint)bVar82 * auVar126._4_4_ | (uint)!bVar82 * (int)fVar217;
      bVar82 = (bool)(bVar79 >> 2 & 1);
      auVar139._8_4_ = (uint)bVar82 * auVar126._8_4_ | (uint)!bVar82 * (int)fVar238;
      bVar82 = (bool)(bVar79 >> 3 & 1);
      auVar139._12_4_ = (uint)bVar82 * auVar126._12_4_ | (uint)!bVar82 * (int)fVar239;
      bVar82 = (bool)(bVar79 >> 4 & 1);
      auVar139._16_4_ = (uint)bVar82 * auVar126._16_4_ | (uint)!bVar82 * (int)fVar240;
      bVar82 = (bool)(bVar79 >> 5 & 1);
      auVar139._20_4_ = (uint)bVar82 * auVar126._20_4_ | (uint)!bVar82 * (int)fVar241;
      bVar82 = (bool)(bVar79 >> 6 & 1);
      auVar139._24_4_ = (uint)bVar82 * auVar126._24_4_ | (uint)!bVar82 * (int)fVar242;
      auVar139._28_4_ =
           (uint)(bVar79 >> 7) * auVar126._28_4_ | (uint)!(bool)(bVar79 >> 7) * auVar136._28_4_;
      auVar136 = vminps_avx512vl(auVar109,auVar139);
      auVar109 = vsubps_avx(ZEXT832(0) << 0x20,auVar117);
      auVar116 = vsubps_avx(ZEXT832(0) << 0x20,auVar118);
      auVar117 = ZEXT832(0) << 0x20;
      auVar123 = vsubps_avx(auVar117,auVar119);
      auVar123 = vmulps_avx512vl(auVar123,auVar122);
      auVar116 = vfmadd231ps_avx512vl(auVar123,auVar121,auVar116);
      auVar109 = vfmadd231ps_avx512vl(auVar116,auVar120,auVar109);
      auVar116 = vmulps_avx512vl(auVar150._0_32_,auVar122);
      auVar116 = vfmadd231ps_avx512vl(auVar116,local_6e0,auVar121);
      auVar116 = vfmadd231ps_avx512vl(auVar116,local_860,auVar120);
      vandps_avx512vl(auVar116,auVar124);
      uVar20 = vcmpps_avx512vl(auVar116,auVar135,1);
      auVar109 = vxorps_avx512vl(auVar109,auVar125);
      auVar123 = vrcp14ps_avx512vl(auVar116);
      auVar124 = vxorps_avx512vl(auVar116,auVar125);
      auVar285 = ZEXT3264(auVar124);
      auVar125 = vfnmadd213ps_avx512vl(auVar123,auVar116,auVar127);
      auVar85 = vfmadd132ps_fma(auVar125,auVar123,auVar123);
      fVar244 = auVar85._0_4_ * auVar109._0_4_;
      fVar217 = auVar85._4_4_ * auVar109._4_4_;
      auVar41._4_4_ = fVar217;
      auVar41._0_4_ = fVar244;
      fVar238 = auVar85._8_4_ * auVar109._8_4_;
      auVar41._8_4_ = fVar238;
      fVar239 = auVar85._12_4_ * auVar109._12_4_;
      auVar41._12_4_ = fVar239;
      fVar240 = auVar109._16_4_ * 0.0;
      auVar41._16_4_ = fVar240;
      fVar241 = auVar109._20_4_ * 0.0;
      auVar41._20_4_ = fVar241;
      fVar242 = auVar109._24_4_ * 0.0;
      auVar41._24_4_ = fVar242;
      auVar41._28_4_ = auVar109._28_4_;
      uVar22 = vcmpps_avx512vl(auVar116,auVar124,1);
      bVar79 = (byte)uVar20 | (byte)uVar22;
      auVar125 = vblendmps_avx512vl(auVar41,auVar131);
      auVar140._0_4_ =
           (uint)(bVar79 & 1) * auVar125._0_4_ | (uint)!(bool)(bVar79 & 1) * auVar123._0_4_;
      bVar82 = (bool)(bVar79 >> 1 & 1);
      auVar140._4_4_ = (uint)bVar82 * auVar125._4_4_ | (uint)!bVar82 * auVar123._4_4_;
      bVar82 = (bool)(bVar79 >> 2 & 1);
      auVar140._8_4_ = (uint)bVar82 * auVar125._8_4_ | (uint)!bVar82 * auVar123._8_4_;
      bVar82 = (bool)(bVar79 >> 3 & 1);
      auVar140._12_4_ = (uint)bVar82 * auVar125._12_4_ | (uint)!bVar82 * auVar123._12_4_;
      bVar82 = (bool)(bVar79 >> 4 & 1);
      auVar140._16_4_ = (uint)bVar82 * auVar125._16_4_ | (uint)!bVar82 * auVar123._16_4_;
      bVar82 = (bool)(bVar79 >> 5 & 1);
      auVar140._20_4_ = (uint)bVar82 * auVar125._20_4_ | (uint)!bVar82 * auVar123._20_4_;
      bVar82 = (bool)(bVar79 >> 6 & 1);
      auVar140._24_4_ = (uint)bVar82 * auVar125._24_4_ | (uint)!bVar82 * auVar123._24_4_;
      auVar140._28_4_ =
           (uint)(bVar79 >> 7) * auVar125._28_4_ | (uint)!(bool)(bVar79 >> 7) * auVar123._28_4_;
      local_840 = vmaxps_avx(auVar137,auVar140);
      auVar284 = ZEXT3264(local_840);
      uVar22 = vcmpps_avx512vl(auVar116,auVar124,6);
      bVar79 = (byte)uVar20 | (byte)uVar22;
      auVar141._0_4_ =
           (uint)(bVar79 & 1) * auVar126._0_4_ | (uint)!(bool)(bVar79 & 1) * (int)fVar244;
      bVar82 = (bool)(bVar79 >> 1 & 1);
      auVar141._4_4_ = (uint)bVar82 * auVar126._4_4_ | (uint)!bVar82 * (int)fVar217;
      bVar82 = (bool)(bVar79 >> 2 & 1);
      auVar141._8_4_ = (uint)bVar82 * auVar126._8_4_ | (uint)!bVar82 * (int)fVar238;
      bVar82 = (bool)(bVar79 >> 3 & 1);
      auVar141._12_4_ = (uint)bVar82 * auVar126._12_4_ | (uint)!bVar82 * (int)fVar239;
      bVar82 = (bool)(bVar79 >> 4 & 1);
      auVar141._16_4_ = (uint)bVar82 * auVar126._16_4_ | (uint)!bVar82 * (int)fVar240;
      bVar82 = (bool)(bVar79 >> 5 & 1);
      auVar141._20_4_ = (uint)bVar82 * auVar126._20_4_ | (uint)!bVar82 * (int)fVar241;
      bVar82 = (bool)(bVar79 >> 6 & 1);
      auVar141._24_4_ = (uint)bVar82 * auVar126._24_4_ | (uint)!bVar82 * (int)fVar242;
      auVar141._28_4_ =
           (uint)(bVar79 >> 7) * auVar126._28_4_ | (uint)!(bool)(bVar79 >> 7) * auVar109._28_4_;
      local_6a0 = vminps_avx(auVar136,auVar141);
      uVar20 = vcmpps_avx512vl(local_840,local_6a0,2);
      bVar73 = bVar73 & 0x7f & (byte)uVar20;
      if (bVar73 == 0) goto LAB_017f8ed4;
      auVar106 = vmaxps_avx(auVar117,auVar106);
      auVar109 = vfmadd213ps_avx512vl(local_aa0,auVar129,auVar112);
      fVar244 = auVar108._0_4_;
      fVar217 = auVar108._4_4_;
      auVar42._4_4_ = fVar217 * auVar109._4_4_;
      auVar42._0_4_ = fVar244 * auVar109._0_4_;
      fVar238 = auVar108._8_4_;
      auVar42._8_4_ = fVar238 * auVar109._8_4_;
      fVar239 = auVar108._12_4_;
      auVar42._12_4_ = fVar239 * auVar109._12_4_;
      fVar240 = auVar108._16_4_;
      auVar42._16_4_ = fVar240 * auVar109._16_4_;
      fVar241 = auVar108._20_4_;
      auVar42._20_4_ = fVar241 * auVar109._20_4_;
      fVar242 = auVar108._24_4_;
      auVar42._24_4_ = fVar242 * auVar109._24_4_;
      auVar42._28_4_ = auVar109._28_4_;
      auVar109 = vfmadd213ps_avx512vl(local_a20,auVar129,auVar112);
      auVar43._4_4_ = fVar217 * auVar109._4_4_;
      auVar43._0_4_ = fVar244 * auVar109._0_4_;
      auVar43._8_4_ = fVar238 * auVar109._8_4_;
      auVar43._12_4_ = fVar239 * auVar109._12_4_;
      auVar43._16_4_ = fVar240 * auVar109._16_4_;
      auVar43._20_4_ = fVar241 * auVar109._20_4_;
      auVar43._24_4_ = fVar242 * auVar109._24_4_;
      auVar43._28_4_ = auVar109._28_4_;
      auVar109 = vminps_avx512vl(auVar42,auVar127);
      auVar116 = ZEXT832(0) << 0x20;
      auVar109 = vmaxps_avx(auVar109,ZEXT832(0) << 0x20);
      auVar123 = vminps_avx512vl(auVar43,auVar127);
      auVar44._4_4_ = (auVar109._4_4_ + 1.0) * 0.125;
      auVar44._0_4_ = (auVar109._0_4_ + 0.0) * 0.125;
      auVar44._8_4_ = (auVar109._8_4_ + 2.0) * 0.125;
      auVar44._12_4_ = (auVar109._12_4_ + 3.0) * 0.125;
      auVar44._16_4_ = (auVar109._16_4_ + 4.0) * 0.125;
      auVar44._20_4_ = (auVar109._20_4_ + 5.0) * 0.125;
      auVar44._24_4_ = (auVar109._24_4_ + 6.0) * 0.125;
      auVar44._28_4_ = auVar109._28_4_ + 7.0;
      local_4e0 = vfmadd213ps_avx512vl(auVar44,auVar172,auVar251);
      auVar109 = vmaxps_avx(auVar123,ZEXT832(0) << 0x20);
      auVar45._4_4_ = (auVar109._4_4_ + 1.0) * 0.125;
      auVar45._0_4_ = (auVar109._0_4_ + 0.0) * 0.125;
      auVar45._8_4_ = (auVar109._8_4_ + 2.0) * 0.125;
      auVar45._12_4_ = (auVar109._12_4_ + 3.0) * 0.125;
      auVar45._16_4_ = (auVar109._16_4_ + 4.0) * 0.125;
      auVar45._20_4_ = (auVar109._20_4_ + 5.0) * 0.125;
      auVar45._24_4_ = (auVar109._24_4_ + 6.0) * 0.125;
      auVar45._28_4_ = auVar109._28_4_ + 7.0;
      local_500 = vfmadd213ps_avx512vl(auVar45,auVar172,auVar251);
      auVar46._4_4_ = auVar106._4_4_ * auVar106._4_4_;
      auVar46._0_4_ = auVar106._0_4_ * auVar106._0_4_;
      auVar46._8_4_ = auVar106._8_4_ * auVar106._8_4_;
      auVar46._12_4_ = auVar106._12_4_ * auVar106._12_4_;
      auVar46._16_4_ = auVar106._16_4_ * auVar106._16_4_;
      auVar46._20_4_ = auVar106._20_4_ * auVar106._20_4_;
      auVar46._24_4_ = auVar106._24_4_ * auVar106._24_4_;
      auVar46._28_4_ = auVar106._28_4_;
      auVar109 = vsubps_avx(auVar128,auVar46);
      auVar47._4_4_ = auVar109._4_4_ * (float)local_880._4_4_;
      auVar47._0_4_ = auVar109._0_4_ * (float)local_880._0_4_;
      auVar47._8_4_ = auVar109._8_4_ * fStack_878;
      auVar47._12_4_ = auVar109._12_4_ * fStack_874;
      auVar47._16_4_ = auVar109._16_4_ * fStack_870;
      auVar47._20_4_ = auVar109._20_4_ * fStack_86c;
      auVar47._24_4_ = auVar109._24_4_ * fStack_868;
      auVar47._28_4_ = auVar106._28_4_;
      auVar106 = vsubps_avx(local_a80,auVar47);
      uVar20 = vcmpps_avx512vl(auVar106,ZEXT832(0) << 0x20,5);
      bVar79 = (byte)uVar20;
      if (bVar79 == 0) {
        bVar79 = 0;
        auVar110 = ZEXT832(0) << 0x20;
        auVar107 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar106 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar123 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar284 = ZEXT864(0) << 0x20;
        auVar142._8_4_ = 0x7f800000;
        auVar142._0_8_ = 0x7f8000007f800000;
        auVar142._12_4_ = 0x7f800000;
        auVar142._16_4_ = 0x7f800000;
        auVar142._20_4_ = 0x7f800000;
        auVar142._24_4_ = 0x7f800000;
        auVar142._28_4_ = 0x7f800000;
        auVar143._8_4_ = 0xff800000;
        auVar143._0_8_ = 0xff800000ff800000;
        auVar143._12_4_ = 0xff800000;
        auVar143._16_4_ = 0xff800000;
        auVar143._20_4_ = 0xff800000;
        auVar143._24_4_ = 0xff800000;
        auVar143._28_4_ = 0xff800000;
      }
      else {
        auVar92 = vxorps_avx512vl(auVar164,auVar164);
        uVar83 = vcmpps_avx512vl(auVar106,auVar117,5);
        auVar106 = vsqrtps_avx(auVar106);
        auVar116 = vfnmadd213ps_avx512vl(local_8a0,local_8c0,auVar127);
        auVar85 = vfmadd132ps_fma(auVar116,local_8c0,local_8c0);
        auVar116 = vsubps_avx(local_8e0,auVar106);
        auVar48._4_4_ = auVar85._4_4_ * auVar116._4_4_;
        auVar48._0_4_ = auVar85._0_4_ * auVar116._0_4_;
        auVar48._8_4_ = auVar85._8_4_ * auVar116._8_4_;
        auVar48._12_4_ = auVar85._12_4_ * auVar116._12_4_;
        auVar48._16_4_ = auVar116._16_4_ * 0.0;
        auVar48._20_4_ = auVar116._20_4_ * 0.0;
        auVar48._24_4_ = auVar116._24_4_ * 0.0;
        auVar48._28_4_ = 0x3e000000;
        auVar106 = vsubps_avx512vl(auVar106,auVar130);
        auVar293._0_4_ = auVar85._0_4_ * auVar106._0_4_;
        auVar293._4_4_ = auVar85._4_4_ * auVar106._4_4_;
        auVar293._8_4_ = auVar85._8_4_ * auVar106._8_4_;
        auVar293._12_4_ = auVar85._12_4_ * auVar106._12_4_;
        auVar293._16_4_ = auVar106._16_4_ * 0.0;
        auVar293._20_4_ = auVar106._20_4_ * 0.0;
        auVar293._24_4_ = auVar106._24_4_ * 0.0;
        auVar293._28_4_ = 0;
        auVar106 = vfmadd213ps_avx512vl(auVar129,auVar48,auVar112);
        auVar283._0_4_ = fVar244 * auVar106._0_4_;
        auVar283._4_4_ = fVar217 * auVar106._4_4_;
        auVar283._8_4_ = fVar238 * auVar106._8_4_;
        auVar283._12_4_ = fVar239 * auVar106._12_4_;
        auVar283._16_4_ = fVar240 * auVar106._16_4_;
        auVar283._20_4_ = fVar241 * auVar106._20_4_;
        auVar283._24_4_ = fVar242 * auVar106._24_4_;
        auVar283._28_4_ = 0;
        auVar106 = vmulps_avx512vl(local_860,auVar48);
        auVar116 = vmulps_avx512vl(local_6e0,auVar48);
        auVar124 = vmulps_avx512vl(auVar150._0_32_,auVar48);
        auVar123 = vfmadd213ps_avx512vl(auVar110,auVar283,auVar113);
        auVar106 = vsubps_avx512vl(auVar106,auVar123);
        auVar123 = vfmadd213ps_avx512vl(auVar107,auVar283,auVar114);
        auVar123 = vsubps_avx512vl(auVar116,auVar123);
        auVar85 = vfmadd213ps_fma(auVar283,auVar111,auVar115);
        auVar116 = vsubps_avx(auVar124,ZEXT1632(auVar85));
        auVar284 = ZEXT3264(auVar116);
        auVar112 = vfmadd213ps_avx512vl(auVar129,auVar293,auVar112);
        auVar108 = vmulps_avx512vl(auVar108,auVar112);
        auVar112 = vmulps_avx512vl(local_860,auVar293);
        auVar124 = vmulps_avx512vl(local_6e0,auVar293);
        auVar125 = vmulps_avx512vl(auVar150._0_32_,auVar293);
        auVar85 = vfmadd213ps_fma(auVar110,auVar108,auVar113);
        auVar116 = vsubps_avx(auVar112,ZEXT1632(auVar85));
        auVar85 = vfmadd213ps_fma(auVar107,auVar108,auVar114);
        auVar110 = vsubps_avx512vl(auVar124,ZEXT1632(auVar85));
        auVar85 = vfmadd213ps_fma(auVar111,auVar108,auVar115);
        auVar107 = vsubps_avx512vl(auVar125,ZEXT1632(auVar85));
        auVar173._8_4_ = 0x7f800000;
        auVar173._0_8_ = 0x7f8000007f800000;
        auVar173._12_4_ = 0x7f800000;
        auVar173._16_4_ = 0x7f800000;
        auVar173._20_4_ = 0x7f800000;
        auVar173._24_4_ = 0x7f800000;
        auVar173._28_4_ = 0x7f800000;
        auVar111 = vblendmps_avx512vl(auVar173,auVar48);
        bVar82 = (bool)((byte)uVar83 & 1);
        auVar142._0_4_ = (uint)bVar82 * auVar111._0_4_ | (uint)!bVar82 * auVar113._0_4_;
        bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar142._4_4_ = (uint)bVar82 * auVar111._4_4_ | (uint)!bVar82 * auVar113._4_4_;
        bVar82 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar142._8_4_ = (uint)bVar82 * auVar111._8_4_ | (uint)!bVar82 * auVar113._8_4_;
        bVar82 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar142._12_4_ = (uint)bVar82 * auVar111._12_4_ | (uint)!bVar82 * auVar113._12_4_;
        bVar82 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar142._16_4_ = (uint)bVar82 * auVar111._16_4_ | (uint)!bVar82 * auVar113._16_4_;
        bVar82 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar142._20_4_ = (uint)bVar82 * auVar111._20_4_ | (uint)!bVar82 * auVar113._20_4_;
        bVar82 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar142._24_4_ = (uint)bVar82 * auVar111._24_4_ | (uint)!bVar82 * auVar113._24_4_;
        bVar82 = SUB81(uVar83 >> 7,0);
        auVar142._28_4_ = (uint)bVar82 * auVar111._28_4_ | (uint)!bVar82 * auVar113._28_4_;
        auVar174._8_4_ = 0xff800000;
        auVar174._0_8_ = 0xff800000ff800000;
        auVar174._12_4_ = 0xff800000;
        auVar174._16_4_ = 0xff800000;
        auVar174._20_4_ = 0xff800000;
        auVar174._24_4_ = 0xff800000;
        auVar174._28_4_ = 0xff800000;
        auVar111 = vblendmps_avx512vl(auVar174,auVar293);
        bVar82 = (bool)((byte)uVar83 & 1);
        auVar143._0_4_ = (uint)bVar82 * auVar111._0_4_ | (uint)!bVar82 * -0x800000;
        bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar143._4_4_ = (uint)bVar82 * auVar111._4_4_ | (uint)!bVar82 * -0x800000;
        bVar82 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar143._8_4_ = (uint)bVar82 * auVar111._8_4_ | (uint)!bVar82 * -0x800000;
        bVar82 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar143._12_4_ = (uint)bVar82 * auVar111._12_4_ | (uint)!bVar82 * -0x800000;
        bVar82 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar143._16_4_ = (uint)bVar82 * auVar111._16_4_ | (uint)!bVar82 * -0x800000;
        bVar82 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar143._20_4_ = (uint)bVar82 * auVar111._20_4_ | (uint)!bVar82 * -0x800000;
        bVar82 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar143._24_4_ = (uint)bVar82 * auVar111._24_4_ | (uint)!bVar82 * -0x800000;
        bVar82 = SUB81(uVar83 >> 7,0);
        auVar143._28_4_ = (uint)bVar82 * auVar111._28_4_ | (uint)!bVar82 * -0x800000;
        auVar36._8_4_ = 0x36000000;
        auVar36._0_8_ = 0x3600000036000000;
        auVar36._12_4_ = 0x36000000;
        auVar36._16_4_ = 0x36000000;
        auVar36._20_4_ = 0x36000000;
        auVar36._24_4_ = 0x36000000;
        auVar36._28_4_ = 0x36000000;
        auVar111 = vmulps_avx512vl(local_a40,auVar36);
        uVar80 = vcmpps_avx512vl(auVar111,local_900,0xe);
        uVar83 = uVar83 & uVar80;
        bVar77 = (byte)uVar83;
        if (bVar77 != 0) {
          uVar80 = vcmpps_avx512vl(auVar109,ZEXT1632(auVar92),2);
          auVar277._8_4_ = 0x7f800000;
          auVar277._0_8_ = 0x7f8000007f800000;
          auVar277._12_4_ = 0x7f800000;
          auVar277._16_4_ = 0x7f800000;
          auVar277._20_4_ = 0x7f800000;
          auVar277._24_4_ = 0x7f800000;
          auVar277._28_4_ = 0x7f800000;
          auVar289._8_4_ = 0xff800000;
          auVar289._0_8_ = 0xff800000ff800000;
          auVar289._12_4_ = 0xff800000;
          auVar289._16_4_ = 0xff800000;
          auVar289._20_4_ = 0xff800000;
          auVar289._24_4_ = 0xff800000;
          auVar289._28_4_ = 0xff800000;
          auVar109 = vblendmps_avx512vl(auVar277,auVar289);
          bVar74 = (byte)uVar80;
          uVar84 = (uint)(bVar74 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar74 & 1) * auVar111._0_4_;
          bVar82 = (bool)((byte)(uVar80 >> 1) & 1);
          uVar154 = (uint)bVar82 * auVar109._4_4_ | (uint)!bVar82 * auVar111._4_4_;
          bVar82 = (bool)((byte)(uVar80 >> 2) & 1);
          uVar155 = (uint)bVar82 * auVar109._8_4_ | (uint)!bVar82 * auVar111._8_4_;
          bVar82 = (bool)((byte)(uVar80 >> 3) & 1);
          uVar156 = (uint)bVar82 * auVar109._12_4_ | (uint)!bVar82 * auVar111._12_4_;
          bVar82 = (bool)((byte)(uVar80 >> 4) & 1);
          uVar157 = (uint)bVar82 * auVar109._16_4_ | (uint)!bVar82 * auVar111._16_4_;
          bVar82 = (bool)((byte)(uVar80 >> 5) & 1);
          uVar158 = (uint)bVar82 * auVar109._20_4_ | (uint)!bVar82 * auVar111._20_4_;
          bVar82 = (bool)((byte)(uVar80 >> 6) & 1);
          uVar159 = (uint)bVar82 * auVar109._24_4_ | (uint)!bVar82 * auVar111._24_4_;
          bVar82 = SUB81(uVar80 >> 7,0);
          uVar160 = (uint)bVar82 * auVar109._28_4_ | (uint)!bVar82 * auVar111._28_4_;
          auVar142._0_4_ = (bVar77 & 1) * uVar84 | !(bool)(bVar77 & 1) * auVar142._0_4_;
          bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
          auVar142._4_4_ = bVar82 * uVar154 | !bVar82 * auVar142._4_4_;
          bVar82 = (bool)((byte)(uVar83 >> 2) & 1);
          auVar142._8_4_ = bVar82 * uVar155 | !bVar82 * auVar142._8_4_;
          bVar82 = (bool)((byte)(uVar83 >> 3) & 1);
          auVar142._12_4_ = bVar82 * uVar156 | !bVar82 * auVar142._12_4_;
          bVar82 = (bool)((byte)(uVar83 >> 4) & 1);
          auVar142._16_4_ = bVar82 * uVar157 | !bVar82 * auVar142._16_4_;
          bVar82 = (bool)((byte)(uVar83 >> 5) & 1);
          auVar142._20_4_ = bVar82 * uVar158 | !bVar82 * auVar142._20_4_;
          bVar82 = (bool)((byte)(uVar83 >> 6) & 1);
          auVar142._24_4_ = bVar82 * uVar159 | !bVar82 * auVar142._24_4_;
          bVar82 = SUB81(uVar83 >> 7,0);
          auVar142._28_4_ = bVar82 * uVar160 | !bVar82 * auVar142._28_4_;
          auVar109 = vblendmps_avx512vl(auVar289,auVar277);
          bVar82 = (bool)((byte)(uVar80 >> 1) & 1);
          bVar7 = (bool)((byte)(uVar80 >> 2) & 1);
          bVar8 = (bool)((byte)(uVar80 >> 3) & 1);
          bVar9 = (bool)((byte)(uVar80 >> 4) & 1);
          bVar10 = (bool)((byte)(uVar80 >> 5) & 1);
          bVar11 = (bool)((byte)(uVar80 >> 6) & 1);
          bVar12 = SUB81(uVar80 >> 7,0);
          auVar143._0_4_ =
               (uint)(bVar77 & 1) *
               ((uint)(bVar74 & 1) * auVar109._0_4_ | !(bool)(bVar74 & 1) * uVar84) |
               !(bool)(bVar77 & 1) * auVar143._0_4_;
          bVar6 = (bool)((byte)(uVar83 >> 1) & 1);
          auVar143._4_4_ =
               (uint)bVar6 * ((uint)bVar82 * auVar109._4_4_ | !bVar82 * uVar154) |
               !bVar6 * auVar143._4_4_;
          bVar82 = (bool)((byte)(uVar83 >> 2) & 1);
          auVar143._8_4_ =
               (uint)bVar82 * ((uint)bVar7 * auVar109._8_4_ | !bVar7 * uVar155) |
               !bVar82 * auVar143._8_4_;
          bVar82 = (bool)((byte)(uVar83 >> 3) & 1);
          auVar143._12_4_ =
               (uint)bVar82 * ((uint)bVar8 * auVar109._12_4_ | !bVar8 * uVar156) |
               !bVar82 * auVar143._12_4_;
          bVar82 = (bool)((byte)(uVar83 >> 4) & 1);
          auVar143._16_4_ =
               (uint)bVar82 * ((uint)bVar9 * auVar109._16_4_ | !bVar9 * uVar157) |
               !bVar82 * auVar143._16_4_;
          bVar82 = (bool)((byte)(uVar83 >> 5) & 1);
          auVar143._20_4_ =
               (uint)bVar82 * ((uint)bVar10 * auVar109._20_4_ | !bVar10 * uVar158) |
               !bVar82 * auVar143._20_4_;
          bVar82 = (bool)((byte)(uVar83 >> 6) & 1);
          auVar143._24_4_ =
               (uint)bVar82 * ((uint)bVar11 * auVar109._24_4_ | !bVar11 * uVar159) |
               !bVar82 * auVar143._24_4_;
          bVar82 = SUB81(uVar83 >> 7,0);
          auVar143._28_4_ =
               (uint)bVar82 * ((uint)bVar12 * auVar109._28_4_ | !bVar12 * uVar160) |
               !bVar82 * auVar143._28_4_;
          bVar79 = (~bVar77 | bVar74) & bVar79;
        }
      }
      auVar109 = vmulps_avx512vl(auVar150._0_32_,auVar107);
      auVar109 = vfmadd231ps_avx512vl(auVar109,local_6e0,auVar110);
      auVar278 = ZEXT3264(local_6e0);
      auVar148._0_32_ = vfmadd231ps_avx512vl(auVar109,local_860,auVar116);
      auVar285 = ZEXT3264(local_840);
      _local_540 = local_840;
      local_520 = vminps_avx(local_6a0,auVar142);
      auVar272._8_4_ = 0x7fffffff;
      auVar272._0_8_ = 0x7fffffff7fffffff;
      auVar272._12_4_ = 0x7fffffff;
      auVar272._16_4_ = 0x7fffffff;
      auVar272._20_4_ = 0x7fffffff;
      auVar272._24_4_ = 0x7fffffff;
      auVar272._28_4_ = 0x7fffffff;
      auVar273 = ZEXT3264(auVar272);
      auVar109 = vandps_avx(auVar148._0_32_,auVar272);
      _local_760 = vmaxps_avx(local_840,auVar143);
      auVar264._8_4_ = 0x3e99999a;
      auVar264._0_8_ = 0x3e99999a3e99999a;
      auVar264._12_4_ = 0x3e99999a;
      auVar264._16_4_ = 0x3e99999a;
      auVar264._20_4_ = 0x3e99999a;
      auVar264._24_4_ = 0x3e99999a;
      auVar264._28_4_ = 0x3e99999a;
      uVar20 = vcmpps_avx512vl(auVar109,auVar264,1);
      uVar22 = vcmpps_avx512vl(local_840,local_520,2);
      bVar77 = (byte)uVar22 & bVar73;
      uVar21 = vcmpps_avx512vl(_local_760,local_6a0,2);
      if ((bVar73 & ((byte)uVar21 | (byte)uVar22)) == 0) {
        auVar258 = ZEXT3264(_DAT_01f7b040);
      }
      else {
        bVar74 = (byte)uVar20 | ~bVar79;
        auVar109 = vmulps_avx512vl(auVar150._0_32_,auVar284._0_32_);
        auVar85 = vfmadd213ps_fma(auVar123,local_6e0,auVar109);
        auVar106 = vfmadd213ps_avx512vl(auVar106,local_860,ZEXT1632(auVar85));
        auVar106 = vandps_avx(auVar106,auVar272);
        uVar20 = vcmpps_avx512vl(auVar106,auVar264,1);
        bVar79 = (byte)uVar20 | ~bVar79;
        auVar176._8_4_ = 2;
        auVar176._0_8_ = 0x200000002;
        auVar176._12_4_ = 2;
        auVar176._16_4_ = 2;
        auVar176._20_4_ = 2;
        auVar176._24_4_ = 2;
        auVar176._28_4_ = 2;
        auVar37._8_4_ = 3;
        auVar37._0_8_ = 0x300000003;
        auVar37._12_4_ = 3;
        auVar37._16_4_ = 3;
        auVar37._20_4_ = 3;
        auVar37._24_4_ = 3;
        auVar37._28_4_ = 3;
        auVar106 = vpblendmd_avx512vl(auVar176,auVar37);
        local_680._0_4_ = (uint)(bVar79 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar79 & 1) * 2;
        bVar82 = (bool)(bVar79 >> 1 & 1);
        local_680._4_4_ = (uint)bVar82 * auVar106._4_4_ | (uint)!bVar82 * 2;
        bVar82 = (bool)(bVar79 >> 2 & 1);
        local_680._8_4_ = (uint)bVar82 * auVar106._8_4_ | (uint)!bVar82 * 2;
        bVar82 = (bool)(bVar79 >> 3 & 1);
        local_680._12_4_ = (uint)bVar82 * auVar106._12_4_ | (uint)!bVar82 * 2;
        bVar82 = (bool)(bVar79 >> 4 & 1);
        local_680._16_4_ = (uint)bVar82 * auVar106._16_4_ | (uint)!bVar82 * 2;
        bVar82 = (bool)(bVar79 >> 5 & 1);
        local_680._20_4_ = (uint)bVar82 * auVar106._20_4_ | (uint)!bVar82 * 2;
        bVar82 = (bool)(bVar79 >> 6 & 1);
        local_680._24_4_ = (uint)bVar82 * auVar106._24_4_ | (uint)!bVar82 * 2;
        local_680._28_4_ = (uint)(bVar79 >> 7) * auVar106._28_4_ | (uint)!(bool)(bVar79 >> 7) * 2;
        auVar152._0_32_ = vpbroadcastd_avx512vl();
        auVar152._32_32_ = auVar148._32_32_;
        uVar20 = vpcmpd_avx512vl(auVar152._0_32_,local_680,5);
        local_740 = local_840._0_4_ + (float)local_820._0_4_;
        fStack_73c = local_840._4_4_ + (float)local_820._4_4_;
        fStack_738 = local_840._8_4_ + fStack_818;
        fStack_734 = local_840._12_4_ + fStack_814;
        fStack_730 = local_840._16_4_ + fStack_810;
        fStack_72c = local_840._20_4_ + fStack_80c;
        fStack_728 = local_840._24_4_ + fStack_808;
        fStack_724 = local_840._28_4_ + fStack_804;
        local_700 = auVar152._0_32_;
        _local_6c0 = _local_760;
        for (bVar79 = (byte)uVar20 & bVar77; bVar79 != 0;
            bVar79 = ~('\x01' << ((byte)iVar23 & 0x1f)) & bVar79 & (byte)uVar20) {
          auVar177._8_4_ = 0x7f800000;
          auVar177._0_8_ = 0x7f8000007f800000;
          auVar177._12_4_ = 0x7f800000;
          auVar177._16_4_ = 0x7f800000;
          auVar177._20_4_ = 0x7f800000;
          auVar177._24_4_ = 0x7f800000;
          auVar177._28_4_ = 0x7f800000;
          auVar148._32_32_ = vblendmps_avx512vl(auVar177,local_840);
          auVar145._0_4_ =
               (uint)(bVar79 & 1) * auVar148._32_4_ | (uint)!(bool)(bVar79 & 1) * 0x7f800000;
          bVar82 = (bool)(bVar79 >> 1 & 1);
          auVar145._4_4_ = (uint)bVar82 * auVar148._36_4_ | (uint)!bVar82 * 0x7f800000;
          bVar82 = (bool)(bVar79 >> 2 & 1);
          auVar145._8_4_ = (uint)bVar82 * auVar148._40_4_ | (uint)!bVar82 * 0x7f800000;
          bVar82 = (bool)(bVar79 >> 3 & 1);
          auVar145._12_4_ = (uint)bVar82 * auVar148._44_4_ | (uint)!bVar82 * 0x7f800000;
          bVar82 = (bool)(bVar79 >> 4 & 1);
          auVar145._16_4_ = (uint)bVar82 * auVar148._48_4_ | (uint)!bVar82 * 0x7f800000;
          bVar82 = (bool)(bVar79 >> 5 & 1);
          auVar145._20_4_ = (uint)bVar82 * auVar148._52_4_ | (uint)!bVar82 * 0x7f800000;
          auVar145._24_4_ =
               (uint)(bVar79 >> 6) * auVar148._56_4_ | (uint)!(bool)(bVar79 >> 6) * 0x7f800000;
          auVar145._28_4_ = 0x7f800000;
          auVar152._0_32_ = auVar145;
          auVar148._32_32_ = vshufps_avx(auVar145,auVar145,0xb1);
          auVar148._32_32_ = vminps_avx(auVar145,auVar148._32_32_);
          auVar106 = vshufpd_avx(auVar148._32_32_,auVar148._32_32_,5);
          auVar148._32_32_ = vminps_avx(auVar148._32_32_,auVar106);
          auVar106 = vpermpd_avx2(auVar148._32_32_,0x4e);
          auVar148._32_32_ = vminps_avx(auVar148._32_32_,auVar106);
          uVar20 = vcmpps_avx512vl(auVar145,auVar148._32_32_,0);
          bVar75 = (byte)uVar20 & bVar79;
          bVar76 = bVar79;
          if (bVar75 != 0) {
            bVar76 = bVar75;
          }
          iVar23 = 0;
          for (uVar84 = (uint)bVar76; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x80000000) {
            iVar23 = iVar23 + 1;
          }
          uVar84 = *(uint *)(local_4e0 + (uint)(iVar23 << 2));
          uVar154 = *(uint *)(local_540 + (uint)(iVar23 << 2));
          fVar244 = auVar90._0_4_;
          if ((float)local_a00._0_4_ < 0.0) {
            auVar278 = ZEXT1664(auVar278._0_16_);
            auVar284 = ZEXT1664(auVar284._0_16_);
            auVar285 = ZEXT1664(auVar285._0_16_);
            fVar244 = sqrtf((float)local_a00._0_4_);
            auVar150._32_32_ = auVar152._32_32_;
            auVar152 = auVar150;
          }
          auVar273 = ZEXT464(uVar154);
          auVar92 = vminps_avx(local_980._0_16_,local_9c0._0_16_);
          auVar85 = vmaxps_avx(local_980._0_16_,local_9c0._0_16_);
          auVar19 = vminps_avx(local_9a0._0_16_,local_9e0._0_16_);
          auVar86 = vminps_avx(auVar92,auVar19);
          auVar92 = vmaxps_avx(local_9a0._0_16_,local_9e0._0_16_);
          auVar19 = vmaxps_avx(auVar85,auVar92);
          auVar221._8_4_ = 0x7fffffff;
          auVar221._0_8_ = 0x7fffffff7fffffff;
          auVar221._12_4_ = 0x7fffffff;
          auVar85 = vandps_avx(auVar86,auVar221);
          auVar92 = vandps_avx(auVar19,auVar221);
          auVar85 = vmaxps_avx(auVar85,auVar92);
          auVar92 = vmovshdup_avx(auVar85);
          auVar92 = vmaxss_avx(auVar92,auVar85);
          auVar85 = vshufpd_avx(auVar85,auVar85,1);
          auVar85 = vmaxss_avx(auVar85,auVar92);
          fVar217 = auVar85._0_4_ * 1.9073486e-06;
          local_940 = vshufps_avx(auVar19,auVar19,0xff);
          auVar85 = vinsertps_avx(ZEXT416(uVar154),ZEXT416(uVar84),0x10);
          auVar148 = ZEXT1664(auVar85);
          lVar81 = 5;
          do {
            do {
              bVar82 = lVar81 == 0;
              lVar81 = lVar81 + -1;
              if (bVar82) goto LAB_017f9ba5;
              uVar182 = auVar148._0_4_;
              auVar165._4_4_ = uVar182;
              auVar165._0_4_ = uVar182;
              auVar165._8_4_ = uVar182;
              auVar165._12_4_ = uVar182;
              auVar85 = vfmadd132ps_fma(auVar165,ZEXT816(0) << 0x40,local_9f0);
              auVar92 = vmovshdup_avx(auVar148._0_16_);
              fVar265 = auVar92._0_4_;
              fVar243 = 1.0 - fVar265;
              fVar238 = fVar265 * fVar265;
              auVar87 = SUB6416(ZEXT464(0x40400000),0);
              auVar93 = SUB6416(ZEXT464(0xc0a00000),0);
              auVar86 = vfmadd213ss_fma(auVar87,auVar92,auVar93);
              auVar19 = vfmadd213ss_fma(auVar86,ZEXT416((uint)fVar238),
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar166 = vfmadd213ss_fma(auVar87,ZEXT416((uint)fVar243),auVar93);
              auVar166 = vfmadd213ss_fma(auVar166,ZEXT416((uint)(fVar243 * fVar243)),
                                         SUB6416(ZEXT464(0x40000000),0));
              fVar239 = fVar243 * fVar243 * -fVar265 * 0.5;
              fVar240 = auVar19._0_4_ * 0.5;
              fVar241 = auVar166._0_4_ * 0.5;
              fVar242 = fVar265 * fVar265 * -fVar243 * 0.5;
              auVar222._0_4_ = fVar242 * (float)local_9e0._0_4_;
              auVar222._4_4_ = fVar242 * (float)local_9e0._4_4_;
              auVar222._8_4_ = fVar242 * fStack_9d8;
              auVar222._12_4_ = fVar242 * fStack_9d4;
              auVar247._4_4_ = fVar241;
              auVar247._0_4_ = fVar241;
              auVar247._8_4_ = fVar241;
              auVar247._12_4_ = fVar241;
              auVar19 = vfmadd132ps_fma(auVar247,auVar222,local_9a0._0_16_);
              auVar203._4_4_ = fVar240;
              auVar203._0_4_ = fVar240;
              auVar203._8_4_ = fVar240;
              auVar203._12_4_ = fVar240;
              auVar19 = vfmadd132ps_fma(auVar203,auVar19,local_9c0._0_16_);
              auVar223._4_4_ = fVar239;
              auVar223._0_4_ = fVar239;
              auVar223._8_4_ = fVar239;
              auVar223._12_4_ = fVar239;
              auVar19 = vfmadd132ps_fma(auVar223,auVar19,local_980._0_16_);
              auVar166 = vfmadd231ss_fma(auVar93,auVar92,ZEXT416(0x41100000));
              local_8a0._0_16_ = auVar166;
              auVar166 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar92,ZEXT416(0x40800000))
              ;
              local_8c0._0_16_ = auVar166;
              auVar166 = vfmadd213ss_fma(auVar87,auVar92,ZEXT416(0xbf800000));
              local_8e0._0_16_ = auVar166;
              _local_880 = auVar19;
              auVar19 = vsubps_avx(auVar85,auVar19);
              auVar85 = vdpps_avx(auVar19,auVar19,0x7f);
              fVar239 = auVar85._0_4_;
              local_800 = auVar148;
              if (fVar239 < 0.0) {
                local_a80._0_4_ = auVar86._0_4_;
                local_aa0._0_16_ = ZEXT416((uint)fVar243);
                local_a20._0_4_ = fVar238;
                local_a40._0_4_ = fVar243 * -2.0;
                auVar285._0_4_ = sqrtf(fVar239);
                auVar285._4_60_ = extraout_var;
                auVar86 = ZEXT416((uint)local_a80._0_4_);
                auVar166 = auVar285._0_16_;
                auVar93 = local_aa0._0_16_;
              }
              else {
                auVar166 = vsqrtss_avx(auVar85,auVar85);
                local_a40._0_4_ = fVar243 * -2.0;
                local_a20._0_4_ = fVar238;
                auVar93 = ZEXT416((uint)fVar243);
              }
              fVar238 = auVar93._0_4_;
              auVar94 = vfnmadd231ss_fma(ZEXT416((uint)(fVar265 * (fVar238 + fVar238))),auVar93,
                                         auVar93);
              auVar86 = vfmadd213ss_fma(auVar86,ZEXT416((uint)(fVar265 + fVar265)),
                                        ZEXT416((uint)(fVar265 * fVar265 * 3.0)));
              auVar93 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar92,
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar87 = vfmadd231ss_fma(ZEXT416((uint)(fVar238 * fVar238 * -3.0)),
                                        ZEXT416((uint)(fVar238 + fVar238)),auVar93);
              auVar93 = vfmadd213ss_fma(ZEXT416((uint)local_a40._0_4_),auVar92,
                                        ZEXT416((uint)local_a20._0_4_));
              fVar238 = auVar94._0_4_ * 0.5;
              fVar240 = auVar86._0_4_ * 0.5;
              fVar241 = auVar87._0_4_ * 0.5;
              fVar242 = auVar93._0_4_ * 0.5;
              auVar224._0_4_ = fVar242 * (float)local_9e0._0_4_;
              auVar224._4_4_ = fVar242 * (float)local_9e0._4_4_;
              auVar224._8_4_ = fVar242 * fStack_9d8;
              auVar224._12_4_ = fVar242 * fStack_9d4;
              auVar204._4_4_ = fVar241;
              auVar204._0_4_ = fVar241;
              auVar204._8_4_ = fVar241;
              auVar204._12_4_ = fVar241;
              auVar86 = vfmadd132ps_fma(auVar204,auVar224,local_9a0._0_16_);
              auVar186._4_4_ = fVar240;
              auVar186._0_4_ = fVar240;
              auVar186._8_4_ = fVar240;
              auVar186._12_4_ = fVar240;
              auVar86 = vfmadd132ps_fma(auVar186,auVar86,local_9c0._0_16_);
              auVar287._4_4_ = fVar238;
              auVar287._0_4_ = fVar238;
              auVar287._8_4_ = fVar238;
              auVar287._12_4_ = fVar238;
              local_a80._0_16_ = vfmadd132ps_fma(auVar287,auVar86,local_980._0_16_);
              local_a20._0_16_ = vdpps_avx(local_a80._0_16_,local_a80._0_16_,0x7f);
              auVar51._12_4_ = 0;
              auVar51._0_12_ = ZEXT812(0);
              fVar238 = local_a20._0_4_;
              auVar86 = vrsqrt14ss_avx512f(auVar51 << 0x20,ZEXT416((uint)fVar238));
              fVar240 = auVar86._0_4_;
              local_a40._0_16_ = vrcp14ss_avx512f(auVar51 << 0x20,ZEXT416((uint)fVar238));
              auVar25._8_4_ = 0x80000000;
              auVar25._0_8_ = 0x8000000080000000;
              auVar25._12_4_ = 0x80000000;
              auVar93 = vxorps_avx512vl(local_a20._0_16_,auVar25);
              auVar86 = vfnmadd213ss_fma(local_a40._0_16_,local_a20._0_16_,
                                         SUB6416(ZEXT464(0x40000000),0));
              local_900._0_4_ = auVar86._0_4_;
              local_aa0._0_4_ = auVar166._0_4_;
              if (fVar238 < auVar93._0_4_) {
                fVar241 = sqrtf(fVar238);
                auVar166 = ZEXT416((uint)local_aa0._0_4_);
                auVar86 = local_a80._0_16_;
              }
              else {
                auVar86 = vsqrtss_avx(local_a20._0_16_,local_a20._0_16_);
                fVar241 = auVar86._0_4_;
                auVar86 = local_a80._0_16_;
              }
              fVar238 = fVar240 * 1.5 + fVar238 * -0.5 * fVar240 * fVar240 * fVar240;
              auVar248._0_4_ = auVar86._0_4_ * fVar238;
              auVar248._4_4_ = auVar86._4_4_ * fVar238;
              auVar248._8_4_ = auVar86._8_4_ * fVar238;
              auVar248._12_4_ = auVar86._12_4_ * fVar238;
              auVar93 = vdpps_avx(auVar19,auVar248,0x7f);
              fVar243 = auVar166._0_4_;
              fVar240 = auVar93._0_4_;
              auVar167._0_4_ = fVar240 * fVar240;
              auVar167._4_4_ = auVar93._4_4_ * auVar93._4_4_;
              auVar167._8_4_ = auVar93._8_4_ * auVar93._8_4_;
              auVar167._12_4_ = auVar93._12_4_ * auVar93._12_4_;
              auVar87 = vsubps_avx512vl(auVar85,auVar167);
              fVar242 = auVar87._0_4_;
              auVar187._4_12_ = ZEXT812(0) << 0x20;
              auVar187._0_4_ = fVar242;
              auVar94 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar187);
              auVar95 = vmulss_avx512f(auVar87,ZEXT416(0xbf000000));
              if (fVar242 < 0.0) {
                local_930 = fVar238;
                fStack_92c = fVar238;
                fStack_928 = fVar238;
                fStack_924 = fVar238;
                local_920 = auVar248;
                local_910 = auVar94;
                fVar242 = sqrtf(fVar242);
                auVar95 = ZEXT416(auVar95._0_4_);
                auVar166 = ZEXT416((uint)local_aa0._0_4_);
                auVar248 = local_920;
                auVar87 = local_910;
                auVar86 = local_a80._0_16_;
                fVar238 = local_930;
                fVar265 = fStack_92c;
                fVar266 = fStack_928;
                fVar267 = fStack_924;
              }
              else {
                auVar87 = vsqrtss_avx(auVar87,auVar87);
                fVar242 = auVar87._0_4_;
                auVar87 = auVar94;
                fVar265 = fVar238;
                fVar266 = fVar238;
                fVar267 = fVar238;
              }
              auVar284 = ZEXT1664(auVar19);
              auVar188._0_4_ = (float)local_8e0._0_4_ * (float)local_9e0._0_4_;
              auVar188._4_4_ = (float)local_8e0._0_4_ * (float)local_9e0._4_4_;
              auVar188._8_4_ = (float)local_8e0._0_4_ * fStack_9d8;
              auVar188._12_4_ = (float)local_8e0._0_4_ * fStack_9d4;
              auVar205._4_4_ = local_8c0._0_4_;
              auVar205._0_4_ = local_8c0._0_4_;
              auVar205._8_4_ = local_8c0._0_4_;
              auVar205._12_4_ = local_8c0._0_4_;
              auVar89 = vfmadd132ps_fma(auVar205,auVar188,local_9a0._0_16_);
              auVar189._4_4_ = local_8a0._0_4_;
              auVar189._0_4_ = local_8a0._0_4_;
              auVar189._8_4_ = local_8a0._0_4_;
              auVar189._12_4_ = local_8a0._0_4_;
              auVar89 = vfmadd132ps_fma(auVar189,auVar89,local_9c0._0_16_);
              auVar92 = vfmadd213ss_fma(auVar92,SUB6416(ZEXT464(0xc0400000),0),ZEXT416(0x40000000));
              uVar182 = auVar92._0_4_;
              auVar206._4_4_ = uVar182;
              auVar206._0_4_ = uVar182;
              auVar206._8_4_ = uVar182;
              auVar206._12_4_ = uVar182;
              auVar92 = vfmadd132ps_fma(auVar206,auVar89,local_980._0_16_);
              auVar190._0_4_ = auVar92._0_4_ * (float)local_a20._0_4_;
              auVar190._4_4_ = auVar92._4_4_ * (float)local_a20._0_4_;
              auVar190._8_4_ = auVar92._8_4_ * (float)local_a20._0_4_;
              auVar190._12_4_ = auVar92._12_4_ * (float)local_a20._0_4_;
              auVar92 = vdpps_avx(auVar86,auVar92,0x7f);
              fVar201 = auVar92._0_4_;
              auVar207._0_4_ = auVar86._0_4_ * fVar201;
              auVar207._4_4_ = auVar86._4_4_ * fVar201;
              auVar207._8_4_ = auVar86._8_4_ * fVar201;
              auVar207._12_4_ = auVar86._12_4_ * fVar201;
              auVar92 = vsubps_avx(auVar190,auVar207);
              fVar201 = (float)local_900._0_4_ * (float)local_a40._0_4_;
              auVar89 = vmaxss_avx(ZEXT416((uint)fVar217),
                                   ZEXT416((uint)(local_800._0_4_ * fVar244 * 1.9073486e-06)));
              auVar26._8_4_ = 0x80000000;
              auVar26._0_8_ = 0x8000000080000000;
              auVar26._12_4_ = 0x80000000;
              auVar152._16_48_ = local_800._16_48_;
              auVar96 = vxorps_avx512vl(auVar86,auVar26);
              auVar208._0_4_ = fVar238 * auVar92._0_4_ * fVar201;
              auVar208._4_4_ = fVar265 * auVar92._4_4_ * fVar201;
              auVar208._8_4_ = fVar266 * auVar92._8_4_ * fVar201;
              auVar208._12_4_ = fVar267 * auVar92._12_4_ * fVar201;
              auVar92 = vdpps_avx(auVar96,auVar248,0x7f);
              auVar88 = vfmadd213ss_fma(auVar166,ZEXT416((uint)fVar217),auVar89);
              auVar166 = vdpps_avx(auVar19,auVar208,0x7f);
              auVar88 = vfmadd213ss_fma(ZEXT416((uint)(fVar243 + 1.0)),
                                        ZEXT416((uint)(fVar217 / fVar241)),auVar88);
              fVar238 = auVar92._0_4_ + auVar166._0_4_;
              auVar285 = ZEXT464((uint)fVar238);
              auVar92 = vdpps_avx(local_9f0,auVar248,0x7f);
              auVar166 = vdpps_avx(auVar19,auVar96,0x7f);
              auVar95 = vmulss_avx512f(auVar95,auVar87);
              fVar241 = auVar94._0_4_ * 1.5 + auVar95._0_4_ * auVar87._0_4_ * auVar87._0_4_;
              auVar87 = vdpps_avx(auVar19,local_9f0,0x7f);
              auVar95 = vfnmadd231ss_fma(auVar166,auVar93,ZEXT416((uint)fVar238));
              auVar87 = vfnmadd231ss_fma(auVar87,auVar93,auVar92);
              auVar166 = vpermilps_avx(_local_880,0xff);
              fVar242 = fVar242 - auVar166._0_4_;
              auVar94 = vshufps_avx(auVar86,auVar86,0xff);
              auVar166 = vfmsub213ss_fma(auVar95,ZEXT416((uint)fVar241),auVar94);
              auVar275._8_4_ = 0x80000000;
              auVar275._0_8_ = 0x8000000080000000;
              auVar275._12_4_ = 0x80000000;
              auVar278 = ZEXT1664(auVar275);
              auVar270._0_8_ = auVar166._0_8_ ^ 0x8000000080000000;
              auVar270._8_4_ = auVar166._8_4_ ^ 0x80000000;
              auVar270._12_4_ = auVar166._12_4_ ^ 0x80000000;
              auVar273 = ZEXT1664(auVar270);
              auVar87 = ZEXT416((uint)(auVar87._0_4_ * fVar241));
              auVar95 = vfmsub231ss_fma(ZEXT416((uint)(auVar92._0_4_ * auVar166._0_4_)),
                                        ZEXT416((uint)fVar238),auVar87);
              auVar166 = vinsertps_avx(auVar270,auVar87,0x1c);
              auVar254._0_8_ = auVar92._0_8_ ^ 0x8000000080000000;
              auVar254._8_4_ = auVar92._8_4_ ^ 0x80000000;
              auVar254._12_4_ = auVar92._12_4_ ^ 0x80000000;
              auVar87 = vinsertps_avx(ZEXT416((uint)fVar238),auVar254,0x10);
              auVar225._0_4_ = auVar95._0_4_;
              auVar225._4_4_ = auVar225._0_4_;
              auVar225._8_4_ = auVar225._0_4_;
              auVar225._12_4_ = auVar225._0_4_;
              auVar92 = vdivps_avx(auVar166,auVar225);
              auVar166 = vdivps_avx(auVar87,auVar225);
              auVar226._0_4_ = fVar240 * auVar92._0_4_ + fVar242 * auVar166._0_4_;
              auVar226._4_4_ = fVar240 * auVar92._4_4_ + fVar242 * auVar166._4_4_;
              auVar226._8_4_ = fVar240 * auVar92._8_4_ + fVar242 * auVar166._8_4_;
              auVar226._12_4_ = fVar240 * auVar92._12_4_ + fVar242 * auVar166._12_4_;
              auVar92 = vsubps_avx(local_800._0_16_,auVar226);
              auVar148 = ZEXT1664(auVar92);
              auVar27._8_4_ = 0x7fffffff;
              auVar27._0_8_ = 0x7fffffff7fffffff;
              auVar27._12_4_ = 0x7fffffff;
              auVar152._0_16_ = vandps_avx512vl(auVar93,auVar27);
            } while (auVar88._0_4_ <= auVar152._0_4_);
            auVar166 = vfmadd231ss_fma(ZEXT416((uint)(auVar88._0_4_ + auVar89._0_4_)),local_940,
                                       ZEXT416(0x36000000));
            auVar28._8_4_ = 0x7fffffff;
            auVar28._0_8_ = 0x7fffffff7fffffff;
            auVar28._12_4_ = 0x7fffffff;
            auVar152._0_16_ = vandps_avx512vl(ZEXT416((uint)fVar242),auVar28);
          } while (auVar166._0_4_ <= auVar152._0_4_);
          fVar244 = auVar92._0_4_ + (float)local_950._0_4_;
          if ((fVar161 <= fVar244) &&
             (fVar217 = *(float *)(ray + k * 4 + 0x200), fVar244 <= fVar217)) {
            auVar92 = vmovshdup_avx(auVar92);
            fVar240 = auVar92._0_4_;
            if ((0.0 <= fVar240) && (fVar240 <= 1.0)) {
              auVar52._12_4_ = 0;
              auVar52._0_12_ = ZEXT412(0);
              auVar151._16_48_ = auVar152._16_48_;
              auVar151._4_12_ = ZEXT412(0);
              auVar151._0_4_ = fVar239;
              auVar92 = vrsqrt14ss_avx512f(auVar52 << 0x20,auVar151._0_16_);
              fVar239 = auVar92._0_4_;
              auVar152._0_16_ = vmulss_avx512f(auVar85,ZEXT416(0xbf000000));
              pGVar3 = (context->scene->geometries).items[uVar1].ptr;
              if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                fVar239 = fVar239 * 1.5 + auVar152._0_4_ * fVar239 * fVar239 * fVar239;
                auVar227._0_4_ = auVar19._0_4_ * fVar239;
                auVar227._4_4_ = auVar19._4_4_ * fVar239;
                auVar227._8_4_ = auVar19._8_4_ * fVar239;
                auVar227._12_4_ = auVar19._12_4_ * fVar239;
                auVar166 = vfmadd213ps_fma(auVar94,auVar227,auVar86);
                auVar85 = vshufps_avx(auVar227,auVar227,0xc9);
                auVar92 = vshufps_avx(auVar86,auVar86,0xc9);
                auVar228._0_4_ = auVar227._0_4_ * auVar92._0_4_;
                auVar228._4_4_ = auVar227._4_4_ * auVar92._4_4_;
                auVar228._8_4_ = auVar227._8_4_ * auVar92._8_4_;
                auVar228._12_4_ = auVar227._12_4_ * auVar92._12_4_;
                auVar86 = vfmsub231ps_fma(auVar228,auVar86,auVar85);
                auVar85 = vshufps_avx(auVar86,auVar86,0xc9);
                auVar92 = vshufps_avx(auVar166,auVar166,0xc9);
                auVar86 = vshufps_avx(auVar86,auVar86,0xd2);
                auVar168._0_4_ = auVar166._0_4_ * auVar86._0_4_;
                auVar168._4_4_ = auVar166._4_4_ * auVar86._4_4_;
                auVar168._8_4_ = auVar166._8_4_ * auVar86._8_4_;
                auVar168._12_4_ = auVar166._12_4_ * auVar86._12_4_;
                auVar85 = vfmsub231ps_fma(auVar168,auVar85,auVar92);
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  *(float *)(ray + k * 4 + 0x200) = fVar244;
                  uVar182 = vextractps_avx(auVar85,1);
                  *(undefined4 *)(ray + k * 4 + 0x300) = uVar182;
                  uVar182 = vextractps_avx(auVar85,2);
                  *(undefined4 *)(ray + k * 4 + 0x340) = uVar182;
                  *(int *)(ray + k * 4 + 0x380) = auVar85._0_4_;
                  *(float *)(ray + k * 4 + 0x3c0) = fVar240;
                  *(undefined4 *)(ray + k * 4 + 0x400) = 0;
                  *(uint *)(ray + k * 4 + 0x440) = uVar2;
                  *(uint *)(ray + k * 4 + 0x480) = uVar1;
                  *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                }
                else {
                  pRVar5 = context->user;
                  auVar181 = vbroadcastss_avx512f(ZEXT416(1));
                  local_340 = vpermps_avx512f(auVar181,auVar148);
                  auVar148 = vpermps_avx512f(auVar181,ZEXT1664(auVar85));
                  auVar181 = vbroadcastss_avx512f(ZEXT416(2));
                  local_3c0 = vpermps_avx512f(auVar181,ZEXT1664(auVar85));
                  local_380 = vbroadcastss_avx512f(auVar85);
                  local_400[0] = (RTCHitN)auVar148[0];
                  local_400[1] = (RTCHitN)auVar148[1];
                  local_400[2] = (RTCHitN)auVar148[2];
                  local_400[3] = (RTCHitN)auVar148[3];
                  local_400[4] = (RTCHitN)auVar148[4];
                  local_400[5] = (RTCHitN)auVar148[5];
                  local_400[6] = (RTCHitN)auVar148[6];
                  local_400[7] = (RTCHitN)auVar148[7];
                  local_400[8] = (RTCHitN)auVar148[8];
                  local_400[9] = (RTCHitN)auVar148[9];
                  local_400[10] = (RTCHitN)auVar148[10];
                  local_400[0xb] = (RTCHitN)auVar148[0xb];
                  local_400[0xc] = (RTCHitN)auVar148[0xc];
                  local_400[0xd] = (RTCHitN)auVar148[0xd];
                  local_400[0xe] = (RTCHitN)auVar148[0xe];
                  local_400[0xf] = (RTCHitN)auVar148[0xf];
                  local_400[0x10] = (RTCHitN)auVar148[0x10];
                  local_400[0x11] = (RTCHitN)auVar148[0x11];
                  local_400[0x12] = (RTCHitN)auVar148[0x12];
                  local_400[0x13] = (RTCHitN)auVar148[0x13];
                  local_400[0x14] = (RTCHitN)auVar148[0x14];
                  local_400[0x15] = (RTCHitN)auVar148[0x15];
                  local_400[0x16] = (RTCHitN)auVar148[0x16];
                  local_400[0x17] = (RTCHitN)auVar148[0x17];
                  local_400[0x18] = (RTCHitN)auVar148[0x18];
                  local_400[0x19] = (RTCHitN)auVar148[0x19];
                  local_400[0x1a] = (RTCHitN)auVar148[0x1a];
                  local_400[0x1b] = (RTCHitN)auVar148[0x1b];
                  local_400[0x1c] = (RTCHitN)auVar148[0x1c];
                  local_400[0x1d] = (RTCHitN)auVar148[0x1d];
                  local_400[0x1e] = (RTCHitN)auVar148[0x1e];
                  local_400[0x1f] = (RTCHitN)auVar148[0x1f];
                  local_400[0x20] = (RTCHitN)auVar148[0x20];
                  local_400[0x21] = (RTCHitN)auVar148[0x21];
                  local_400[0x22] = (RTCHitN)auVar148[0x22];
                  local_400[0x23] = (RTCHitN)auVar148[0x23];
                  local_400[0x24] = (RTCHitN)auVar148[0x24];
                  local_400[0x25] = (RTCHitN)auVar148[0x25];
                  local_400[0x26] = (RTCHitN)auVar148[0x26];
                  local_400[0x27] = (RTCHitN)auVar148[0x27];
                  local_400[0x28] = (RTCHitN)auVar148[0x28];
                  local_400[0x29] = (RTCHitN)auVar148[0x29];
                  local_400[0x2a] = (RTCHitN)auVar148[0x2a];
                  local_400[0x2b] = (RTCHitN)auVar148[0x2b];
                  local_400[0x2c] = (RTCHitN)auVar148[0x2c];
                  local_400[0x2d] = (RTCHitN)auVar148[0x2d];
                  local_400[0x2e] = (RTCHitN)auVar148[0x2e];
                  local_400[0x2f] = (RTCHitN)auVar148[0x2f];
                  local_400[0x30] = (RTCHitN)auVar148[0x30];
                  local_400[0x31] = (RTCHitN)auVar148[0x31];
                  local_400[0x32] = (RTCHitN)auVar148[0x32];
                  local_400[0x33] = (RTCHitN)auVar148[0x33];
                  local_400[0x34] = (RTCHitN)auVar148[0x34];
                  local_400[0x35] = (RTCHitN)auVar148[0x35];
                  local_400[0x36] = (RTCHitN)auVar148[0x36];
                  local_400[0x37] = (RTCHitN)auVar148[0x37];
                  local_400[0x38] = (RTCHitN)auVar148[0x38];
                  local_400[0x39] = (RTCHitN)auVar148[0x39];
                  local_400[0x3a] = (RTCHitN)auVar148[0x3a];
                  local_400[0x3b] = (RTCHitN)auVar148[0x3b];
                  local_400[0x3c] = (RTCHitN)auVar148[0x3c];
                  local_400[0x3d] = (RTCHitN)auVar148[0x3d];
                  local_400[0x3e] = (RTCHitN)auVar148[0x3e];
                  local_400[0x3f] = (RTCHitN)auVar148[0x3f];
                  local_300 = 0;
                  uStack_2f8 = 0;
                  uStack_2f0 = 0;
                  uStack_2e8 = 0;
                  uStack_2e0 = 0;
                  uStack_2d8 = 0;
                  uStack_2d0 = 0;
                  uStack_2c8 = 0;
                  local_2c0 = local_480._0_8_;
                  uStack_2b8 = local_480._8_8_;
                  uStack_2b0 = local_480._16_8_;
                  uStack_2a8 = local_480._24_8_;
                  uStack_2a0 = local_480._32_8_;
                  uStack_298 = local_480._40_8_;
                  uStack_290 = local_480._48_8_;
                  uStack_288 = local_480._56_8_;
                  auVar148 = vmovdqa64_avx512f(local_440);
                  local_280 = vmovdqa64_avx512f(auVar148);
                  auVar148._32_32_ = vpcmpeqd_avx2(auVar148._0_32_,auVar148._0_32_);
                  local_a58[3] = auVar148._32_32_;
                  local_a58[2] = auVar148._32_32_;
                  local_a58[1] = auVar148._32_32_;
                  *local_a58 = auVar148._32_32_;
                  local_240 = vbroadcastss_avx512f(ZEXT416(pRVar5->instID[0]));
                  local_200 = vbroadcastss_avx512f(ZEXT416(pRVar5->instPrimID[0]));
                  *(float *)(ray + k * 4 + 0x200) = fVar244;
                  auVar152 = vmovdqa64_avx512f(local_4c0);
                  local_7c0 = vmovdqa64_avx512f(auVar152);
                  local_ad0.valid = (int *)local_7c0;
                  local_ad0.geometryUserPtr = pGVar3->userPtr;
                  local_ad0.context = context->user;
                  local_ad0.hit = local_400;
                  local_ad0.N = 0x10;
                  local_ad0.ray = (RTCRayN *)ray;
                  if (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar273 = ZEXT1664(auVar270);
                    auVar278 = ZEXT1664(auVar275);
                    auVar284 = ZEXT1664(auVar19);
                    auVar285 = ZEXT1664(ZEXT416((uint)fVar238));
                    (*pGVar3->intersectionFilterN)(&local_ad0);
                    auVar152 = vmovdqa64_avx512f(local_7c0);
                  }
                  uVar20 = vptestmd_avx512f(auVar152,auVar152);
                  if ((short)uVar20 != 0) {
                    p_Var4 = context->args->filter;
                    if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar273 = ZEXT1664(auVar273._0_16_);
                      auVar278 = ZEXT1664(auVar278._0_16_);
                      auVar284 = ZEXT1664(auVar284._0_16_);
                      auVar285 = ZEXT1664(auVar285._0_16_);
                      (*p_Var4)(&local_ad0);
                      auVar152 = vmovdqa64_avx512f(local_7c0);
                    }
                    uVar83 = vptestmd_avx512f(auVar152,auVar152);
                    if ((short)uVar83 != 0) {
                      iVar55 = *(int *)(local_ad0.hit + 4);
                      iVar56 = *(int *)(local_ad0.hit + 8);
                      iVar57 = *(int *)(local_ad0.hit + 0xc);
                      iVar58 = *(int *)(local_ad0.hit + 0x10);
                      iVar59 = *(int *)(local_ad0.hit + 0x14);
                      iVar60 = *(int *)(local_ad0.hit + 0x18);
                      iVar61 = *(int *)(local_ad0.hit + 0x1c);
                      iVar62 = *(int *)(local_ad0.hit + 0x20);
                      iVar63 = *(int *)(local_ad0.hit + 0x24);
                      iVar64 = *(int *)(local_ad0.hit + 0x28);
                      iVar65 = *(int *)(local_ad0.hit + 0x2c);
                      iVar66 = *(int *)(local_ad0.hit + 0x30);
                      iVar67 = *(int *)(local_ad0.hit + 0x34);
                      iVar68 = *(int *)(local_ad0.hit + 0x38);
                      iVar69 = *(int *)(local_ad0.hit + 0x3c);
                      bVar76 = (byte)uVar83;
                      bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
                      bVar6 = (bool)((byte)(uVar83 >> 2) & 1);
                      bVar7 = (bool)((byte)(uVar83 >> 3) & 1);
                      bVar8 = (bool)((byte)(uVar83 >> 4) & 1);
                      bVar9 = (bool)((byte)(uVar83 >> 5) & 1);
                      bVar10 = (bool)((byte)(uVar83 >> 6) & 1);
                      bVar11 = (bool)((byte)(uVar83 >> 7) & 1);
                      bVar75 = (byte)(uVar83 >> 8);
                      bVar12 = (bool)((byte)(uVar83 >> 9) & 1);
                      bVar13 = (bool)((byte)(uVar83 >> 10) & 1);
                      bVar14 = (bool)((byte)(uVar83 >> 0xb) & 1);
                      bVar15 = (bool)((byte)(uVar83 >> 0xc) & 1);
                      bVar16 = (bool)((byte)(uVar83 >> 0xd) & 1);
                      bVar17 = (bool)((byte)(uVar83 >> 0xe) & 1);
                      bVar18 = SUB81(uVar83 >> 0xf,0);
                      *(uint *)(local_ad0.ray + 0x300) =
                           (uint)(bVar76 & 1) * *(int *)local_ad0.hit |
                           (uint)!(bool)(bVar76 & 1) * *(int *)(local_ad0.ray + 0x300);
                      *(uint *)(local_ad0.ray + 0x304) =
                           (uint)bVar82 * iVar55 | (uint)!bVar82 * *(int *)(local_ad0.ray + 0x304);
                      *(uint *)(local_ad0.ray + 0x308) =
                           (uint)bVar6 * iVar56 | (uint)!bVar6 * *(int *)(local_ad0.ray + 0x308);
                      *(uint *)(local_ad0.ray + 0x30c) =
                           (uint)bVar7 * iVar57 | (uint)!bVar7 * *(int *)(local_ad0.ray + 0x30c);
                      *(uint *)(local_ad0.ray + 0x310) =
                           (uint)bVar8 * iVar58 | (uint)!bVar8 * *(int *)(local_ad0.ray + 0x310);
                      *(uint *)(local_ad0.ray + 0x314) =
                           (uint)bVar9 * iVar59 | (uint)!bVar9 * *(int *)(local_ad0.ray + 0x314);
                      *(uint *)(local_ad0.ray + 0x318) =
                           (uint)bVar10 * iVar60 | (uint)!bVar10 * *(int *)(local_ad0.ray + 0x318);
                      *(uint *)(local_ad0.ray + 0x31c) =
                           (uint)bVar11 * iVar61 | (uint)!bVar11 * *(int *)(local_ad0.ray + 0x31c);
                      *(uint *)(local_ad0.ray + 800) =
                           (uint)(bVar75 & 1) * iVar62 |
                           (uint)!(bool)(bVar75 & 1) * *(int *)(local_ad0.ray + 800);
                      *(uint *)(local_ad0.ray + 0x324) =
                           (uint)bVar12 * iVar63 | (uint)!bVar12 * *(int *)(local_ad0.ray + 0x324);
                      *(uint *)(local_ad0.ray + 0x328) =
                           (uint)bVar13 * iVar64 | (uint)!bVar13 * *(int *)(local_ad0.ray + 0x328);
                      *(uint *)(local_ad0.ray + 0x32c) =
                           (uint)bVar14 * iVar65 | (uint)!bVar14 * *(int *)(local_ad0.ray + 0x32c);
                      *(uint *)(local_ad0.ray + 0x330) =
                           (uint)bVar15 * iVar66 | (uint)!bVar15 * *(int *)(local_ad0.ray + 0x330);
                      *(uint *)(local_ad0.ray + 0x334) =
                           (uint)bVar16 * iVar67 | (uint)!bVar16 * *(int *)(local_ad0.ray + 0x334);
                      *(uint *)(local_ad0.ray + 0x338) =
                           (uint)bVar17 * iVar68 | (uint)!bVar17 * *(int *)(local_ad0.ray + 0x338);
                      *(uint *)(local_ad0.ray + 0x33c) =
                           (uint)bVar18 * iVar69 | (uint)!bVar18 * *(int *)(local_ad0.ray + 0x33c);
                      iVar55 = *(int *)(local_ad0.hit + 0x44);
                      iVar56 = *(int *)(local_ad0.hit + 0x48);
                      iVar57 = *(int *)(local_ad0.hit + 0x4c);
                      iVar58 = *(int *)(local_ad0.hit + 0x50);
                      iVar59 = *(int *)(local_ad0.hit + 0x54);
                      iVar60 = *(int *)(local_ad0.hit + 0x58);
                      iVar61 = *(int *)(local_ad0.hit + 0x5c);
                      iVar62 = *(int *)(local_ad0.hit + 0x60);
                      iVar63 = *(int *)(local_ad0.hit + 100);
                      iVar64 = *(int *)(local_ad0.hit + 0x68);
                      iVar65 = *(int *)(local_ad0.hit + 0x6c);
                      iVar66 = *(int *)(local_ad0.hit + 0x70);
                      iVar67 = *(int *)(local_ad0.hit + 0x74);
                      iVar68 = *(int *)(local_ad0.hit + 0x78);
                      iVar69 = *(int *)(local_ad0.hit + 0x7c);
                      bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
                      bVar6 = (bool)((byte)(uVar83 >> 2) & 1);
                      bVar7 = (bool)((byte)(uVar83 >> 3) & 1);
                      bVar8 = (bool)((byte)(uVar83 >> 4) & 1);
                      bVar9 = (bool)((byte)(uVar83 >> 5) & 1);
                      bVar10 = (bool)((byte)(uVar83 >> 6) & 1);
                      bVar11 = (bool)((byte)(uVar83 >> 7) & 1);
                      bVar12 = (bool)((byte)(uVar83 >> 9) & 1);
                      bVar13 = (bool)((byte)(uVar83 >> 10) & 1);
                      bVar14 = (bool)((byte)(uVar83 >> 0xb) & 1);
                      bVar15 = (bool)((byte)(uVar83 >> 0xc) & 1);
                      bVar16 = (bool)((byte)(uVar83 >> 0xd) & 1);
                      bVar17 = (bool)((byte)(uVar83 >> 0xe) & 1);
                      bVar18 = SUB81(uVar83 >> 0xf,0);
                      *(uint *)(local_ad0.ray + 0x340) =
                           (uint)(bVar76 & 1) * *(int *)(local_ad0.hit + 0x40) |
                           (uint)!(bool)(bVar76 & 1) * *(int *)(local_ad0.ray + 0x340);
                      *(uint *)(local_ad0.ray + 0x344) =
                           (uint)bVar82 * iVar55 | (uint)!bVar82 * *(int *)(local_ad0.ray + 0x344);
                      *(uint *)(local_ad0.ray + 0x348) =
                           (uint)bVar6 * iVar56 | (uint)!bVar6 * *(int *)(local_ad0.ray + 0x348);
                      *(uint *)(local_ad0.ray + 0x34c) =
                           (uint)bVar7 * iVar57 | (uint)!bVar7 * *(int *)(local_ad0.ray + 0x34c);
                      *(uint *)(local_ad0.ray + 0x350) =
                           (uint)bVar8 * iVar58 | (uint)!bVar8 * *(int *)(local_ad0.ray + 0x350);
                      *(uint *)(local_ad0.ray + 0x354) =
                           (uint)bVar9 * iVar59 | (uint)!bVar9 * *(int *)(local_ad0.ray + 0x354);
                      *(uint *)(local_ad0.ray + 0x358) =
                           (uint)bVar10 * iVar60 | (uint)!bVar10 * *(int *)(local_ad0.ray + 0x358);
                      *(uint *)(local_ad0.ray + 0x35c) =
                           (uint)bVar11 * iVar61 | (uint)!bVar11 * *(int *)(local_ad0.ray + 0x35c);
                      *(uint *)(local_ad0.ray + 0x360) =
                           (uint)(bVar75 & 1) * iVar62 |
                           (uint)!(bool)(bVar75 & 1) * *(int *)(local_ad0.ray + 0x360);
                      *(uint *)(local_ad0.ray + 0x364) =
                           (uint)bVar12 * iVar63 | (uint)!bVar12 * *(int *)(local_ad0.ray + 0x364);
                      *(uint *)(local_ad0.ray + 0x368) =
                           (uint)bVar13 * iVar64 | (uint)!bVar13 * *(int *)(local_ad0.ray + 0x368);
                      *(uint *)(local_ad0.ray + 0x36c) =
                           (uint)bVar14 * iVar65 | (uint)!bVar14 * *(int *)(local_ad0.ray + 0x36c);
                      *(uint *)(local_ad0.ray + 0x370) =
                           (uint)bVar15 * iVar66 | (uint)!bVar15 * *(int *)(local_ad0.ray + 0x370);
                      *(uint *)(local_ad0.ray + 0x374) =
                           (uint)bVar16 * iVar67 | (uint)!bVar16 * *(int *)(local_ad0.ray + 0x374);
                      *(uint *)(local_ad0.ray + 0x378) =
                           (uint)bVar17 * iVar68 | (uint)!bVar17 * *(int *)(local_ad0.ray + 0x378);
                      *(uint *)(local_ad0.ray + 0x37c) =
                           (uint)bVar18 * iVar69 | (uint)!bVar18 * *(int *)(local_ad0.ray + 0x37c);
                      iVar55 = *(int *)(local_ad0.hit + 0x84);
                      iVar56 = *(int *)(local_ad0.hit + 0x88);
                      iVar57 = *(int *)(local_ad0.hit + 0x8c);
                      iVar58 = *(int *)(local_ad0.hit + 0x90);
                      iVar59 = *(int *)(local_ad0.hit + 0x94);
                      iVar60 = *(int *)(local_ad0.hit + 0x98);
                      iVar61 = *(int *)(local_ad0.hit + 0x9c);
                      iVar62 = *(int *)(local_ad0.hit + 0xa0);
                      iVar63 = *(int *)(local_ad0.hit + 0xa4);
                      iVar64 = *(int *)(local_ad0.hit + 0xa8);
                      iVar65 = *(int *)(local_ad0.hit + 0xac);
                      iVar66 = *(int *)(local_ad0.hit + 0xb0);
                      iVar67 = *(int *)(local_ad0.hit + 0xb4);
                      iVar68 = *(int *)(local_ad0.hit + 0xb8);
                      iVar69 = *(int *)(local_ad0.hit + 0xbc);
                      bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
                      bVar6 = (bool)((byte)(uVar83 >> 2) & 1);
                      bVar7 = (bool)((byte)(uVar83 >> 3) & 1);
                      bVar8 = (bool)((byte)(uVar83 >> 4) & 1);
                      bVar9 = (bool)((byte)(uVar83 >> 5) & 1);
                      bVar10 = (bool)((byte)(uVar83 >> 6) & 1);
                      bVar11 = (bool)((byte)(uVar83 >> 7) & 1);
                      bVar12 = (bool)((byte)(uVar83 >> 9) & 1);
                      bVar13 = (bool)((byte)(uVar83 >> 10) & 1);
                      bVar14 = (bool)((byte)(uVar83 >> 0xb) & 1);
                      bVar15 = (bool)((byte)(uVar83 >> 0xc) & 1);
                      bVar16 = (bool)((byte)(uVar83 >> 0xd) & 1);
                      bVar17 = (bool)((byte)(uVar83 >> 0xe) & 1);
                      bVar18 = SUB81(uVar83 >> 0xf,0);
                      *(uint *)(local_ad0.ray + 0x380) =
                           (uint)(bVar76 & 1) * *(int *)(local_ad0.hit + 0x80) |
                           (uint)!(bool)(bVar76 & 1) * *(int *)(local_ad0.ray + 0x380);
                      *(uint *)(local_ad0.ray + 900) =
                           (uint)bVar82 * iVar55 | (uint)!bVar82 * *(int *)(local_ad0.ray + 900);
                      *(uint *)(local_ad0.ray + 0x388) =
                           (uint)bVar6 * iVar56 | (uint)!bVar6 * *(int *)(local_ad0.ray + 0x388);
                      *(uint *)(local_ad0.ray + 0x38c) =
                           (uint)bVar7 * iVar57 | (uint)!bVar7 * *(int *)(local_ad0.ray + 0x38c);
                      *(uint *)(local_ad0.ray + 0x390) =
                           (uint)bVar8 * iVar58 | (uint)!bVar8 * *(int *)(local_ad0.ray + 0x390);
                      *(uint *)(local_ad0.ray + 0x394) =
                           (uint)bVar9 * iVar59 | (uint)!bVar9 * *(int *)(local_ad0.ray + 0x394);
                      *(uint *)(local_ad0.ray + 0x398) =
                           (uint)bVar10 * iVar60 | (uint)!bVar10 * *(int *)(local_ad0.ray + 0x398);
                      *(uint *)(local_ad0.ray + 0x39c) =
                           (uint)bVar11 * iVar61 | (uint)!bVar11 * *(int *)(local_ad0.ray + 0x39c);
                      *(uint *)(local_ad0.ray + 0x3a0) =
                           (uint)(bVar75 & 1) * iVar62 |
                           (uint)!(bool)(bVar75 & 1) * *(int *)(local_ad0.ray + 0x3a0);
                      *(uint *)(local_ad0.ray + 0x3a4) =
                           (uint)bVar12 * iVar63 | (uint)!bVar12 * *(int *)(local_ad0.ray + 0x3a4);
                      *(uint *)(local_ad0.ray + 0x3a8) =
                           (uint)bVar13 * iVar64 | (uint)!bVar13 * *(int *)(local_ad0.ray + 0x3a8);
                      *(uint *)(local_ad0.ray + 0x3ac) =
                           (uint)bVar14 * iVar65 | (uint)!bVar14 * *(int *)(local_ad0.ray + 0x3ac);
                      *(uint *)(local_ad0.ray + 0x3b0) =
                           (uint)bVar15 * iVar66 | (uint)!bVar15 * *(int *)(local_ad0.ray + 0x3b0);
                      *(uint *)(local_ad0.ray + 0x3b4) =
                           (uint)bVar16 * iVar67 | (uint)!bVar16 * *(int *)(local_ad0.ray + 0x3b4);
                      *(uint *)(local_ad0.ray + 0x3b8) =
                           (uint)bVar17 * iVar68 | (uint)!bVar17 * *(int *)(local_ad0.ray + 0x3b8);
                      *(uint *)(local_ad0.ray + 0x3bc) =
                           (uint)bVar18 * iVar69 | (uint)!bVar18 * *(int *)(local_ad0.ray + 0x3bc);
                      iVar55 = *(int *)(local_ad0.hit + 0xc4);
                      iVar56 = *(int *)(local_ad0.hit + 200);
                      iVar57 = *(int *)(local_ad0.hit + 0xcc);
                      iVar58 = *(int *)(local_ad0.hit + 0xd0);
                      iVar59 = *(int *)(local_ad0.hit + 0xd4);
                      iVar60 = *(int *)(local_ad0.hit + 0xd8);
                      iVar61 = *(int *)(local_ad0.hit + 0xdc);
                      iVar62 = *(int *)(local_ad0.hit + 0xe0);
                      iVar63 = *(int *)(local_ad0.hit + 0xe4);
                      iVar64 = *(int *)(local_ad0.hit + 0xe8);
                      iVar65 = *(int *)(local_ad0.hit + 0xec);
                      iVar66 = *(int *)(local_ad0.hit + 0xf0);
                      iVar67 = *(int *)(local_ad0.hit + 0xf4);
                      iVar68 = *(int *)(local_ad0.hit + 0xf8);
                      iVar69 = *(int *)(local_ad0.hit + 0xfc);
                      bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
                      bVar6 = (bool)((byte)(uVar83 >> 2) & 1);
                      bVar7 = (bool)((byte)(uVar83 >> 3) & 1);
                      bVar8 = (bool)((byte)(uVar83 >> 4) & 1);
                      bVar9 = (bool)((byte)(uVar83 >> 5) & 1);
                      bVar10 = (bool)((byte)(uVar83 >> 6) & 1);
                      bVar11 = (bool)((byte)(uVar83 >> 7) & 1);
                      bVar12 = (bool)((byte)(uVar83 >> 9) & 1);
                      bVar13 = (bool)((byte)(uVar83 >> 10) & 1);
                      bVar14 = (bool)((byte)(uVar83 >> 0xb) & 1);
                      bVar15 = (bool)((byte)(uVar83 >> 0xc) & 1);
                      bVar16 = (bool)((byte)(uVar83 >> 0xd) & 1);
                      bVar17 = (bool)((byte)(uVar83 >> 0xe) & 1);
                      bVar18 = SUB81(uVar83 >> 0xf,0);
                      *(uint *)(local_ad0.ray + 0x3c0) =
                           (uint)(bVar76 & 1) * *(int *)(local_ad0.hit + 0xc0) |
                           (uint)!(bool)(bVar76 & 1) * *(int *)(local_ad0.ray + 0x3c0);
                      *(uint *)(local_ad0.ray + 0x3c4) =
                           (uint)bVar82 * iVar55 | (uint)!bVar82 * *(int *)(local_ad0.ray + 0x3c4);
                      *(uint *)(local_ad0.ray + 0x3c8) =
                           (uint)bVar6 * iVar56 | (uint)!bVar6 * *(int *)(local_ad0.ray + 0x3c8);
                      *(uint *)(local_ad0.ray + 0x3cc) =
                           (uint)bVar7 * iVar57 | (uint)!bVar7 * *(int *)(local_ad0.ray + 0x3cc);
                      *(uint *)(local_ad0.ray + 0x3d0) =
                           (uint)bVar8 * iVar58 | (uint)!bVar8 * *(int *)(local_ad0.ray + 0x3d0);
                      *(uint *)(local_ad0.ray + 0x3d4) =
                           (uint)bVar9 * iVar59 | (uint)!bVar9 * *(int *)(local_ad0.ray + 0x3d4);
                      *(uint *)(local_ad0.ray + 0x3d8) =
                           (uint)bVar10 * iVar60 | (uint)!bVar10 * *(int *)(local_ad0.ray + 0x3d8);
                      *(uint *)(local_ad0.ray + 0x3dc) =
                           (uint)bVar11 * iVar61 | (uint)!bVar11 * *(int *)(local_ad0.ray + 0x3dc);
                      *(uint *)(local_ad0.ray + 0x3e0) =
                           (uint)(bVar75 & 1) * iVar62 |
                           (uint)!(bool)(bVar75 & 1) * *(int *)(local_ad0.ray + 0x3e0);
                      *(uint *)(local_ad0.ray + 0x3e4) =
                           (uint)bVar12 * iVar63 | (uint)!bVar12 * *(int *)(local_ad0.ray + 0x3e4);
                      *(uint *)(local_ad0.ray + 1000) =
                           (uint)bVar13 * iVar64 | (uint)!bVar13 * *(int *)(local_ad0.ray + 1000);
                      *(uint *)(local_ad0.ray + 0x3ec) =
                           (uint)bVar14 * iVar65 | (uint)!bVar14 * *(int *)(local_ad0.ray + 0x3ec);
                      *(uint *)(local_ad0.ray + 0x3f0) =
                           (uint)bVar15 * iVar66 | (uint)!bVar15 * *(int *)(local_ad0.ray + 0x3f0);
                      *(uint *)(local_ad0.ray + 0x3f4) =
                           (uint)bVar16 * iVar67 | (uint)!bVar16 * *(int *)(local_ad0.ray + 0x3f4);
                      *(uint *)(local_ad0.ray + 0x3f8) =
                           (uint)bVar17 * iVar68 | (uint)!bVar17 * *(int *)(local_ad0.ray + 0x3f8);
                      *(uint *)(local_ad0.ray + 0x3fc) =
                           (uint)bVar18 * iVar69 | (uint)!bVar18 * *(int *)(local_ad0.ray + 0x3fc);
                      iVar55 = *(int *)(local_ad0.hit + 0x104);
                      iVar56 = *(int *)(local_ad0.hit + 0x108);
                      iVar57 = *(int *)(local_ad0.hit + 0x10c);
                      iVar58 = *(int *)(local_ad0.hit + 0x110);
                      iVar59 = *(int *)(local_ad0.hit + 0x114);
                      iVar60 = *(int *)(local_ad0.hit + 0x118);
                      iVar61 = *(int *)(local_ad0.hit + 0x11c);
                      iVar62 = *(int *)(local_ad0.hit + 0x120);
                      iVar63 = *(int *)(local_ad0.hit + 0x124);
                      iVar64 = *(int *)(local_ad0.hit + 0x128);
                      iVar65 = *(int *)(local_ad0.hit + 300);
                      iVar66 = *(int *)(local_ad0.hit + 0x130);
                      iVar67 = *(int *)(local_ad0.hit + 0x134);
                      iVar68 = *(int *)(local_ad0.hit + 0x138);
                      iVar69 = *(int *)(local_ad0.hit + 0x13c);
                      bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
                      bVar6 = (bool)((byte)(uVar83 >> 2) & 1);
                      bVar7 = (bool)((byte)(uVar83 >> 3) & 1);
                      bVar8 = (bool)((byte)(uVar83 >> 4) & 1);
                      bVar9 = (bool)((byte)(uVar83 >> 5) & 1);
                      bVar10 = (bool)((byte)(uVar83 >> 6) & 1);
                      bVar11 = (bool)((byte)(uVar83 >> 7) & 1);
                      bVar12 = (bool)((byte)(uVar83 >> 9) & 1);
                      bVar13 = (bool)((byte)(uVar83 >> 10) & 1);
                      bVar14 = (bool)((byte)(uVar83 >> 0xb) & 1);
                      bVar15 = (bool)((byte)(uVar83 >> 0xc) & 1);
                      bVar16 = (bool)((byte)(uVar83 >> 0xd) & 1);
                      bVar17 = (bool)((byte)(uVar83 >> 0xe) & 1);
                      bVar18 = SUB81(uVar83 >> 0xf,0);
                      *(uint *)(local_ad0.ray + 0x400) =
                           (uint)(bVar76 & 1) * *(int *)(local_ad0.hit + 0x100) |
                           (uint)!(bool)(bVar76 & 1) * *(int *)(local_ad0.ray + 0x400);
                      *(uint *)(local_ad0.ray + 0x404) =
                           (uint)bVar82 * iVar55 | (uint)!bVar82 * *(int *)(local_ad0.ray + 0x404);
                      *(uint *)(local_ad0.ray + 0x408) =
                           (uint)bVar6 * iVar56 | (uint)!bVar6 * *(int *)(local_ad0.ray + 0x408);
                      *(uint *)(local_ad0.ray + 0x40c) =
                           (uint)bVar7 * iVar57 | (uint)!bVar7 * *(int *)(local_ad0.ray + 0x40c);
                      *(uint *)(local_ad0.ray + 0x410) =
                           (uint)bVar8 * iVar58 | (uint)!bVar8 * *(int *)(local_ad0.ray + 0x410);
                      *(uint *)(local_ad0.ray + 0x414) =
                           (uint)bVar9 * iVar59 | (uint)!bVar9 * *(int *)(local_ad0.ray + 0x414);
                      *(uint *)(local_ad0.ray + 0x418) =
                           (uint)bVar10 * iVar60 | (uint)!bVar10 * *(int *)(local_ad0.ray + 0x418);
                      *(uint *)(local_ad0.ray + 0x41c) =
                           (uint)bVar11 * iVar61 | (uint)!bVar11 * *(int *)(local_ad0.ray + 0x41c);
                      *(uint *)(local_ad0.ray + 0x420) =
                           (uint)(bVar75 & 1) * iVar62 |
                           (uint)!(bool)(bVar75 & 1) * *(int *)(local_ad0.ray + 0x420);
                      *(uint *)(local_ad0.ray + 0x424) =
                           (uint)bVar12 * iVar63 | (uint)!bVar12 * *(int *)(local_ad0.ray + 0x424);
                      *(uint *)(local_ad0.ray + 0x428) =
                           (uint)bVar13 * iVar64 | (uint)!bVar13 * *(int *)(local_ad0.ray + 0x428);
                      *(uint *)(local_ad0.ray + 0x42c) =
                           (uint)bVar14 * iVar65 | (uint)!bVar14 * *(int *)(local_ad0.ray + 0x42c);
                      *(uint *)(local_ad0.ray + 0x430) =
                           (uint)bVar15 * iVar66 | (uint)!bVar15 * *(int *)(local_ad0.ray + 0x430);
                      *(uint *)(local_ad0.ray + 0x434) =
                           (uint)bVar16 * iVar67 | (uint)!bVar16 * *(int *)(local_ad0.ray + 0x434);
                      *(uint *)(local_ad0.ray + 0x438) =
                           (uint)bVar17 * iVar68 | (uint)!bVar17 * *(int *)(local_ad0.ray + 0x438);
                      *(uint *)(local_ad0.ray + 0x43c) =
                           (uint)bVar18 * iVar69 | (uint)!bVar18 * *(int *)(local_ad0.ray + 0x43c);
                      auVar148 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_ad0.hit + 0x140));
                      auVar148 = vmovdqu32_avx512f(auVar148);
                      *(undefined1 (*) [64])(local_ad0.ray + 0x440) = auVar148;
                      auVar148 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_ad0.hit + 0x180));
                      auVar148 = vmovdqu32_avx512f(auVar148);
                      *(undefined1 (*) [64])(local_ad0.ray + 0x480) = auVar148;
                      auVar181 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_ad0.hit + 0x1c0));
                      auVar148 = vmovdqa32_avx512f(auVar181);
                      *(undefined1 (*) [64])(local_ad0.ray + 0x4c0) = auVar148;
                      auVar148 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_ad0.hit + 0x200));
                      bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
                      auVar49._4_56_ = auVar148._8_56_;
                      auVar49._0_4_ = (uint)bVar82 * auVar148._4_4_ | (uint)!bVar82 * auVar181._4_4_
                      ;
                      auVar152._0_8_ = auVar49._0_8_ << 0x20;
                      bVar82 = (bool)((byte)(uVar83 >> 2) & 1);
                      auVar152._8_4_ =
                           (uint)bVar82 * auVar148._8_4_ | (uint)!bVar82 * auVar181._8_4_;
                      bVar82 = (bool)((byte)(uVar83 >> 3) & 1);
                      auVar152._12_4_ =
                           (uint)bVar82 * auVar148._12_4_ | (uint)!bVar82 * auVar181._12_4_;
                      bVar82 = (bool)((byte)(uVar83 >> 4) & 1);
                      auVar152._16_4_ =
                           (uint)bVar82 * auVar148._16_4_ | (uint)!bVar82 * auVar181._16_4_;
                      bVar82 = (bool)((byte)(uVar83 >> 5) & 1);
                      auVar152._20_4_ =
                           (uint)bVar82 * auVar148._20_4_ | (uint)!bVar82 * auVar181._20_4_;
                      bVar82 = (bool)((byte)(uVar83 >> 6) & 1);
                      auVar152._24_4_ =
                           (uint)bVar82 * auVar148._24_4_ | (uint)!bVar82 * auVar181._24_4_;
                      bVar82 = (bool)((byte)(uVar83 >> 7) & 1);
                      auVar152._28_4_ =
                           (uint)bVar82 * auVar148._28_4_ | (uint)!bVar82 * auVar181._28_4_;
                      auVar152._32_4_ =
                           (uint)(bVar75 & 1) * auVar148._32_4_ |
                           (uint)!(bool)(bVar75 & 1) * auVar181._32_4_;
                      bVar82 = (bool)((byte)(uVar83 >> 9) & 1);
                      auVar152._36_4_ =
                           (uint)bVar82 * auVar148._36_4_ | (uint)!bVar82 * auVar181._36_4_;
                      bVar82 = (bool)((byte)(uVar83 >> 10) & 1);
                      auVar152._40_4_ =
                           (uint)bVar82 * auVar148._40_4_ | (uint)!bVar82 * auVar181._40_4_;
                      bVar82 = (bool)((byte)(uVar83 >> 0xb) & 1);
                      auVar152._44_4_ =
                           (uint)bVar82 * auVar148._44_4_ | (uint)!bVar82 * auVar181._44_4_;
                      bVar82 = (bool)((byte)(uVar83 >> 0xc) & 1);
                      auVar152._48_4_ =
                           (uint)bVar82 * auVar148._48_4_ | (uint)!bVar82 * auVar181._48_4_;
                      bVar82 = (bool)((byte)(uVar83 >> 0xd) & 1);
                      auVar152._52_4_ =
                           (uint)bVar82 * auVar148._52_4_ | (uint)!bVar82 * auVar181._52_4_;
                      bVar82 = (bool)((byte)(uVar83 >> 0xe) & 1);
                      auVar152._56_4_ =
                           (uint)bVar82 * auVar148._56_4_ | (uint)!bVar82 * auVar181._56_4_;
                      bVar82 = SUB81(uVar83 >> 0xf,0);
                      auVar152._60_4_ =
                           (uint)bVar82 * auVar148._60_4_ | (uint)!bVar82 * auVar181._60_4_;
                      auVar148 = vmovdqa32_avx512f(auVar148);
                      *(undefined1 (*) [64])(local_ad0.ray + 0x500) = auVar148;
                      goto LAB_017f9ba5;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x200) = fVar217;
                }
              }
            }
          }
LAB_017f9ba5:
          uVar182 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar256._4_4_ = uVar182;
          auVar256._0_4_ = uVar182;
          auVar256._8_4_ = uVar182;
          auVar256._12_4_ = uVar182;
          auVar256._16_4_ = uVar182;
          auVar256._20_4_ = uVar182;
          auVar256._24_4_ = uVar182;
          auVar256._28_4_ = uVar182;
          auVar181 = ZEXT3264(auVar256);
          auVar70._4_4_ = fStack_73c;
          auVar70._0_4_ = local_740;
          auVar70._8_4_ = fStack_738;
          auVar70._12_4_ = fStack_734;
          auVar70._16_4_ = fStack_730;
          auVar70._20_4_ = fStack_72c;
          auVar70._24_4_ = fStack_728;
          auVar70._28_4_ = fStack_724;
          uVar20 = vcmpps_avx512vl(auVar256,auVar70,0xd);
        }
        auVar178._0_4_ = (float)local_820._0_4_ + (float)local_760._0_4_;
        auVar178._4_4_ = (float)local_820._4_4_ + (float)local_760._4_4_;
        auVar178._8_4_ = fStack_818 + fStack_758;
        auVar178._12_4_ = fStack_814 + fStack_754;
        auVar178._16_4_ = fStack_810 + fStack_750;
        auVar178._20_4_ = fStack_80c + fStack_74c;
        auVar178._24_4_ = fStack_808 + fStack_748;
        auVar178._28_4_ = fStack_804 + fStack_744;
        uVar182 = auVar181._0_4_;
        auVar198._4_4_ = uVar182;
        auVar198._0_4_ = uVar182;
        auVar198._8_4_ = uVar182;
        auVar198._12_4_ = uVar182;
        auVar198._16_4_ = uVar182;
        auVar198._20_4_ = uVar182;
        auVar198._24_4_ = uVar182;
        auVar198._28_4_ = uVar182;
        uVar20 = vcmpps_avx512vl(auVar178,auVar198,2);
        auVar179._8_4_ = 2;
        auVar179._0_8_ = 0x200000002;
        auVar179._12_4_ = 2;
        auVar179._16_4_ = 2;
        auVar179._20_4_ = 2;
        auVar179._24_4_ = 2;
        auVar179._28_4_ = 2;
        auVar38._8_4_ = 3;
        auVar38._0_8_ = 0x300000003;
        auVar38._12_4_ = 3;
        auVar38._16_4_ = 3;
        auVar38._20_4_ = 3;
        auVar38._24_4_ = 3;
        auVar38._28_4_ = 3;
        auVar148._32_32_ = vpblendmd_avx512vl(auVar179,auVar38);
        local_760._0_4_ = (uint)(bVar74 & 1) * auVar148._32_4_ | (uint)!(bool)(bVar74 & 1) * 2;
        bVar82 = (bool)(bVar74 >> 1 & 1);
        local_760._4_4_ = (uint)bVar82 * auVar148._36_4_ | (uint)!bVar82 * 2;
        bVar82 = (bool)(bVar74 >> 2 & 1);
        fStack_758 = (float)((uint)bVar82 * auVar148._40_4_ | (uint)!bVar82 * 2);
        bVar82 = (bool)(bVar74 >> 3 & 1);
        fStack_754 = (float)((uint)bVar82 * auVar148._44_4_ | (uint)!bVar82 * 2);
        bVar82 = (bool)(bVar74 >> 4 & 1);
        fStack_750 = (float)((uint)bVar82 * auVar148._48_4_ | (uint)!bVar82 * 2);
        bVar82 = (bool)(bVar74 >> 5 & 1);
        fStack_74c = (float)((uint)bVar82 * auVar148._52_4_ | (uint)!bVar82 * 2);
        bVar82 = (bool)(bVar74 >> 6 & 1);
        fStack_748 = (float)((uint)bVar82 * auVar148._56_4_ | (uint)!bVar82 * 2);
        fStack_744 = (float)((uint)(bVar74 >> 7) * auVar148._60_4_ | (uint)!(bool)(bVar74 >> 7) * 2)
        ;
        auVar148._32_32_ = auVar152._32_32_;
        auVar148._0_32_ = _local_760;
        bVar73 = (byte)uVar21 & bVar73 & (byte)uVar20;
        uVar20 = vpcmpd_avx512vl(_local_760,local_700,2);
        local_840 = _local_6c0;
        local_740 = (float)local_820._0_4_ + (float)local_6c0._0_4_;
        fStack_73c = (float)local_820._4_4_ + (float)local_6c0._4_4_;
        fStack_738 = fStack_818 + fStack_6b8;
        fStack_734 = fStack_814 + fStack_6b4;
        fStack_730 = fStack_810 + fStack_6b0;
        fStack_72c = fStack_80c + fStack_6ac;
        fStack_728 = fStack_808 + fStack_6a8;
        fStack_724 = fStack_804 + fStack_6a4;
        for (bVar79 = (byte)uVar20 & bVar73; bVar79 != 0;
            bVar79 = ~('\x01' << ((byte)iVar23 & 0x1f)) & bVar79 & (byte)uVar20) {
          auVar180._8_4_ = 0x7f800000;
          auVar180._0_8_ = 0x7f8000007f800000;
          auVar180._12_4_ = 0x7f800000;
          auVar180._16_4_ = 0x7f800000;
          auVar180._20_4_ = 0x7f800000;
          auVar180._24_4_ = 0x7f800000;
          auVar180._28_4_ = 0x7f800000;
          auVar106 = vblendmps_avx512vl(auVar180,local_840);
          auVar146._0_4_ =
               (uint)(bVar79 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar79 & 1) * 0x7f800000;
          bVar82 = (bool)(bVar79 >> 1 & 1);
          auVar146._4_4_ = (uint)bVar82 * auVar106._4_4_ | (uint)!bVar82 * 0x7f800000;
          bVar82 = (bool)(bVar79 >> 2 & 1);
          auVar146._8_4_ = (uint)bVar82 * auVar106._8_4_ | (uint)!bVar82 * 0x7f800000;
          bVar82 = (bool)(bVar79 >> 3 & 1);
          auVar146._12_4_ = (uint)bVar82 * auVar106._12_4_ | (uint)!bVar82 * 0x7f800000;
          bVar82 = (bool)(bVar79 >> 4 & 1);
          auVar146._16_4_ = (uint)bVar82 * auVar106._16_4_ | (uint)!bVar82 * 0x7f800000;
          bVar82 = (bool)(bVar79 >> 5 & 1);
          auVar146._20_4_ = (uint)bVar82 * auVar106._20_4_ | (uint)!bVar82 * 0x7f800000;
          auVar146._24_4_ =
               (uint)(bVar79 >> 6) * auVar106._24_4_ | (uint)!(bool)(bVar79 >> 6) * 0x7f800000;
          auVar146._28_4_ = 0x7f800000;
          auVar148._0_32_ = auVar146;
          auVar106 = vshufps_avx(auVar146,auVar146,0xb1);
          auVar106 = vminps_avx(auVar146,auVar106);
          auVar109 = vshufpd_avx(auVar106,auVar106,5);
          auVar106 = vminps_avx(auVar106,auVar109);
          auVar109 = vpermpd_avx2(auVar106,0x4e);
          auVar106 = vminps_avx(auVar106,auVar109);
          uVar20 = vcmpps_avx512vl(auVar146,auVar106,0);
          bVar76 = (byte)uVar20 & bVar79;
          bVar74 = bVar79;
          if (bVar76 != 0) {
            bVar74 = bVar76;
          }
          iVar23 = 0;
          for (uVar84 = (uint)bVar74; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x80000000) {
            iVar23 = iVar23 + 1;
          }
          uVar84 = *(uint *)(local_500 + (uint)(iVar23 << 2));
          uVar154 = *(uint *)(local_6a0 + (uint)(iVar23 << 2));
          fVar244 = auVar91._0_4_;
          if ((float)local_a00._0_4_ < 0.0) {
            auVar278 = ZEXT1664(auVar278._0_16_);
            auVar284 = ZEXT1664(auVar284._0_16_);
            auVar285 = ZEXT1664(auVar285._0_16_);
            fVar244 = sqrtf((float)local_a00._0_4_);
            auVar148._0_32_ = auVar150._0_32_;
          }
          auVar273 = ZEXT464(uVar154);
          auVar92 = vminps_avx(local_980._0_16_,local_9c0._0_16_);
          auVar85 = vmaxps_avx(local_980._0_16_,local_9c0._0_16_);
          auVar19 = vminps_avx(local_9a0._0_16_,local_9e0._0_16_);
          auVar86 = vminps_avx(auVar92,auVar19);
          auVar92 = vmaxps_avx(local_9a0._0_16_,local_9e0._0_16_);
          auVar19 = vmaxps_avx(auVar85,auVar92);
          auVar229._8_4_ = 0x7fffffff;
          auVar229._0_8_ = 0x7fffffff7fffffff;
          auVar229._12_4_ = 0x7fffffff;
          auVar85 = vandps_avx(auVar86,auVar229);
          auVar92 = vandps_avx(auVar19,auVar229);
          auVar85 = vmaxps_avx(auVar85,auVar92);
          auVar92 = vmovshdup_avx(auVar85);
          auVar92 = vmaxss_avx(auVar92,auVar85);
          auVar85 = vshufpd_avx(auVar85,auVar85,1);
          auVar85 = vmaxss_avx(auVar85,auVar92);
          fVar217 = auVar85._0_4_ * 1.9073486e-06;
          local_940 = vshufps_avx(auVar19,auVar19,0xff);
          auVar85 = vinsertps_avx(ZEXT416(uVar154),ZEXT416(uVar84),0x10);
          auVar181 = ZEXT1664(auVar85);
          lVar81 = 5;
          do {
            do {
              bVar82 = lVar81 == 0;
              lVar81 = lVar81 + -1;
              if (bVar82) goto LAB_017fa904;
              uVar182 = auVar181._0_4_;
              auVar169._4_4_ = uVar182;
              auVar169._0_4_ = uVar182;
              auVar169._8_4_ = uVar182;
              auVar169._12_4_ = uVar182;
              auVar85 = vfmadd132ps_fma(auVar169,ZEXT816(0) << 0x40,local_9f0);
              auVar92 = vmovshdup_avx(auVar181._0_16_);
              fVar265 = auVar92._0_4_;
              fVar243 = 1.0 - fVar265;
              fVar238 = fVar265 * fVar265;
              auVar87 = SUB6416(ZEXT464(0x40400000),0);
              auVar93 = SUB6416(ZEXT464(0xc0a00000),0);
              auVar86 = vfmadd213ss_fma(auVar87,auVar92,auVar93);
              auVar19 = vfmadd213ss_fma(auVar86,ZEXT416((uint)fVar238),
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar166 = vfmadd213ss_fma(auVar87,ZEXT416((uint)fVar243),auVar93);
              auVar166 = vfmadd213ss_fma(auVar166,ZEXT416((uint)(fVar243 * fVar243)),
                                         SUB6416(ZEXT464(0x40000000),0));
              fVar239 = fVar243 * fVar243 * -fVar265 * 0.5;
              fVar240 = auVar19._0_4_ * 0.5;
              fVar241 = auVar166._0_4_ * 0.5;
              fVar242 = fVar265 * fVar265 * -fVar243 * 0.5;
              auVar230._0_4_ = fVar242 * (float)local_9e0._0_4_;
              auVar230._4_4_ = fVar242 * (float)local_9e0._4_4_;
              auVar230._8_4_ = fVar242 * fStack_9d8;
              auVar230._12_4_ = fVar242 * fStack_9d4;
              auVar249._4_4_ = fVar241;
              auVar249._0_4_ = fVar241;
              auVar249._8_4_ = fVar241;
              auVar249._12_4_ = fVar241;
              auVar19 = vfmadd132ps_fma(auVar249,auVar230,local_9a0._0_16_);
              auVar209._4_4_ = fVar240;
              auVar209._0_4_ = fVar240;
              auVar209._8_4_ = fVar240;
              auVar209._12_4_ = fVar240;
              auVar19 = vfmadd132ps_fma(auVar209,auVar19,local_9c0._0_16_);
              auVar231._4_4_ = fVar239;
              auVar231._0_4_ = fVar239;
              auVar231._8_4_ = fVar239;
              auVar231._12_4_ = fVar239;
              auVar19 = vfmadd132ps_fma(auVar231,auVar19,local_980._0_16_);
              auVar166 = vfmadd231ss_fma(auVar93,auVar92,ZEXT416(0x41100000));
              local_8a0._0_16_ = auVar166;
              auVar166 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar92,ZEXT416(0x40800000))
              ;
              local_8c0._0_16_ = auVar166;
              auVar166 = vfmadd213ss_fma(auVar87,auVar92,ZEXT416(0xbf800000));
              local_8e0._0_16_ = auVar166;
              _local_880 = auVar19;
              auVar19 = vsubps_avx(auVar85,auVar19);
              auVar85 = vdpps_avx(auVar19,auVar19,0x7f);
              fVar239 = auVar85._0_4_;
              local_800 = auVar181;
              if (fVar239 < 0.0) {
                local_a80._0_4_ = auVar86._0_4_;
                local_aa0._0_16_ = ZEXT416((uint)fVar243);
                local_a20._0_4_ = fVar238;
                local_a40._0_4_ = fVar243 * -2.0;
                auVar284._0_4_ = sqrtf(fVar239);
                auVar284._4_60_ = extraout_var_00;
                auVar86 = ZEXT416((uint)local_a80._0_4_);
                auVar166 = auVar284._0_16_;
                auVar93 = local_aa0._0_16_;
              }
              else {
                auVar166 = vsqrtss_avx(auVar85,auVar85);
                local_a40._0_4_ = fVar243 * -2.0;
                local_a20._0_4_ = fVar238;
                auVar93 = ZEXT416((uint)fVar243);
              }
              fVar238 = auVar93._0_4_;
              auVar94 = vfnmadd231ss_fma(ZEXT416((uint)(fVar265 * (fVar238 + fVar238))),auVar93,
                                         auVar93);
              auVar86 = vfmadd213ss_fma(auVar86,ZEXT416((uint)(fVar265 + fVar265)),
                                        ZEXT416((uint)(fVar265 * fVar265 * 3.0)));
              auVar93 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar92,
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar87 = vfmadd231ss_fma(ZEXT416((uint)(fVar238 * fVar238 * -3.0)),
                                        ZEXT416((uint)(fVar238 + fVar238)),auVar93);
              auVar93 = vfmadd213ss_fma(ZEXT416((uint)local_a40._0_4_),auVar92,
                                        ZEXT416((uint)local_a20._0_4_));
              fVar238 = auVar94._0_4_ * 0.5;
              fVar240 = auVar86._0_4_ * 0.5;
              fVar241 = auVar87._0_4_ * 0.5;
              fVar242 = auVar93._0_4_ * 0.5;
              auVar232._0_4_ = fVar242 * (float)local_9e0._0_4_;
              auVar232._4_4_ = fVar242 * (float)local_9e0._4_4_;
              auVar232._8_4_ = fVar242 * fStack_9d8;
              auVar232._12_4_ = fVar242 * fStack_9d4;
              auVar210._4_4_ = fVar241;
              auVar210._0_4_ = fVar241;
              auVar210._8_4_ = fVar241;
              auVar210._12_4_ = fVar241;
              auVar86 = vfmadd132ps_fma(auVar210,auVar232,local_9a0._0_16_);
              auVar191._4_4_ = fVar240;
              auVar191._0_4_ = fVar240;
              auVar191._8_4_ = fVar240;
              auVar191._12_4_ = fVar240;
              auVar86 = vfmadd132ps_fma(auVar191,auVar86,local_9c0._0_16_);
              auVar288._4_4_ = fVar238;
              auVar288._0_4_ = fVar238;
              auVar288._8_4_ = fVar238;
              auVar288._12_4_ = fVar238;
              local_a80._0_16_ = vfmadd132ps_fma(auVar288,auVar86,local_980._0_16_);
              local_a20._0_16_ = vdpps_avx(local_a80._0_16_,local_a80._0_16_,0x7f);
              auVar53._12_4_ = 0;
              auVar53._0_12_ = ZEXT812(0);
              fVar238 = local_a20._0_4_;
              auVar86 = vrsqrt14ss_avx512f(auVar53 << 0x20,ZEXT416((uint)fVar238));
              fVar240 = auVar86._0_4_;
              local_a40._0_16_ = vrcp14ss_avx512f(auVar53 << 0x20,ZEXT416((uint)fVar238));
              auVar29._8_4_ = 0x80000000;
              auVar29._0_8_ = 0x8000000080000000;
              auVar29._12_4_ = 0x80000000;
              auVar93 = vxorps_avx512vl(local_a20._0_16_,auVar29);
              auVar86 = vfnmadd213ss_fma(local_a40._0_16_,local_a20._0_16_,
                                         SUB6416(ZEXT464(0x40000000),0));
              local_900._0_4_ = auVar86._0_4_;
              local_aa0._0_4_ = auVar166._0_4_;
              if (fVar238 < auVar93._0_4_) {
                fVar241 = sqrtf(fVar238);
                auVar166 = ZEXT416((uint)local_aa0._0_4_);
                auVar86 = local_a80._0_16_;
              }
              else {
                auVar86 = vsqrtss_avx(local_a20._0_16_,local_a20._0_16_);
                fVar241 = auVar86._0_4_;
                auVar86 = local_a80._0_16_;
              }
              fVar238 = fVar240 * 1.5 + fVar238 * -0.5 * fVar240 * fVar240 * fVar240;
              auVar250._0_4_ = auVar86._0_4_ * fVar238;
              auVar250._4_4_ = auVar86._4_4_ * fVar238;
              auVar250._8_4_ = auVar86._8_4_ * fVar238;
              auVar250._12_4_ = auVar86._12_4_ * fVar238;
              auVar93 = vdpps_avx(auVar19,auVar250,0x7f);
              fVar243 = auVar166._0_4_;
              fVar240 = auVar93._0_4_;
              auVar170._0_4_ = fVar240 * fVar240;
              auVar170._4_4_ = auVar93._4_4_ * auVar93._4_4_;
              auVar170._8_4_ = auVar93._8_4_ * auVar93._8_4_;
              auVar170._12_4_ = auVar93._12_4_ * auVar93._12_4_;
              auVar87 = vsubps_avx512vl(auVar85,auVar170);
              fVar242 = auVar87._0_4_;
              auVar192._4_12_ = ZEXT812(0) << 0x20;
              auVar192._0_4_ = fVar242;
              auVar94 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar192);
              auVar95 = vmulss_avx512f(auVar87,ZEXT416(0xbf000000));
              if (fVar242 < 0.0) {
                local_930 = fVar238;
                fStack_92c = fVar238;
                fStack_928 = fVar238;
                fStack_924 = fVar238;
                local_920 = auVar250;
                local_910 = auVar94;
                fVar242 = sqrtf(fVar242);
                auVar95 = ZEXT416(auVar95._0_4_);
                auVar166 = ZEXT416((uint)local_aa0._0_4_);
                auVar250 = local_920;
                auVar87 = local_910;
                auVar86 = local_a80._0_16_;
                fVar238 = local_930;
                fVar265 = fStack_92c;
                fVar266 = fStack_928;
                fVar267 = fStack_924;
              }
              else {
                auVar87 = vsqrtss_avx(auVar87,auVar87);
                fVar242 = auVar87._0_4_;
                auVar87 = auVar94;
                fVar265 = fVar238;
                fVar266 = fVar238;
                fVar267 = fVar238;
              }
              auVar284 = ZEXT1664(auVar19);
              auVar193._0_4_ = (float)local_8e0._0_4_ * (float)local_9e0._0_4_;
              auVar193._4_4_ = (float)local_8e0._0_4_ * (float)local_9e0._4_4_;
              auVar193._8_4_ = (float)local_8e0._0_4_ * fStack_9d8;
              auVar193._12_4_ = (float)local_8e0._0_4_ * fStack_9d4;
              auVar211._4_4_ = local_8c0._0_4_;
              auVar211._0_4_ = local_8c0._0_4_;
              auVar211._8_4_ = local_8c0._0_4_;
              auVar211._12_4_ = local_8c0._0_4_;
              auVar89 = vfmadd132ps_fma(auVar211,auVar193,local_9a0._0_16_);
              auVar194._4_4_ = local_8a0._0_4_;
              auVar194._0_4_ = local_8a0._0_4_;
              auVar194._8_4_ = local_8a0._0_4_;
              auVar194._12_4_ = local_8a0._0_4_;
              auVar89 = vfmadd132ps_fma(auVar194,auVar89,local_9c0._0_16_);
              auVar92 = vfmadd213ss_fma(auVar92,SUB6416(ZEXT464(0xc0400000),0),ZEXT416(0x40000000));
              uVar182 = auVar92._0_4_;
              auVar212._4_4_ = uVar182;
              auVar212._0_4_ = uVar182;
              auVar212._8_4_ = uVar182;
              auVar212._12_4_ = uVar182;
              auVar92 = vfmadd132ps_fma(auVar212,auVar89,local_980._0_16_);
              auVar195._0_4_ = auVar92._0_4_ * (float)local_a20._0_4_;
              auVar195._4_4_ = auVar92._4_4_ * (float)local_a20._0_4_;
              auVar195._8_4_ = auVar92._8_4_ * (float)local_a20._0_4_;
              auVar195._12_4_ = auVar92._12_4_ * (float)local_a20._0_4_;
              auVar92 = vdpps_avx(auVar86,auVar92,0x7f);
              fVar201 = auVar92._0_4_;
              auVar213._0_4_ = auVar86._0_4_ * fVar201;
              auVar213._4_4_ = auVar86._4_4_ * fVar201;
              auVar213._8_4_ = auVar86._8_4_ * fVar201;
              auVar213._12_4_ = auVar86._12_4_ * fVar201;
              auVar92 = vsubps_avx(auVar195,auVar213);
              fVar201 = (float)local_900._0_4_ * (float)local_a40._0_4_;
              auVar89 = vmaxss_avx(ZEXT416((uint)fVar217),
                                   ZEXT416((uint)(local_800._0_4_ * fVar244 * 1.9073486e-06)));
              auVar30._8_4_ = 0x80000000;
              auVar30._0_8_ = 0x8000000080000000;
              auVar30._12_4_ = 0x80000000;
              auVar148._16_48_ = local_800._16_48_;
              auVar96 = vxorps_avx512vl(auVar86,auVar30);
              auVar214._0_4_ = fVar238 * auVar92._0_4_ * fVar201;
              auVar214._4_4_ = fVar265 * auVar92._4_4_ * fVar201;
              auVar214._8_4_ = fVar266 * auVar92._8_4_ * fVar201;
              auVar214._12_4_ = fVar267 * auVar92._12_4_ * fVar201;
              auVar92 = vdpps_avx(auVar96,auVar250,0x7f);
              auVar88 = vfmadd213ss_fma(auVar166,ZEXT416((uint)fVar217),auVar89);
              auVar166 = vdpps_avx(auVar19,auVar214,0x7f);
              auVar88 = vfmadd213ss_fma(ZEXT416((uint)(fVar243 + 1.0)),
                                        ZEXT416((uint)(fVar217 / fVar241)),auVar88);
              fVar238 = auVar92._0_4_ + auVar166._0_4_;
              auVar285 = ZEXT464((uint)fVar238);
              auVar92 = vdpps_avx(local_9f0,auVar250,0x7f);
              auVar166 = vdpps_avx(auVar19,auVar96,0x7f);
              auVar95 = vmulss_avx512f(auVar95,auVar87);
              fVar241 = auVar94._0_4_ * 1.5 + auVar95._0_4_ * auVar87._0_4_ * auVar87._0_4_;
              auVar87 = vdpps_avx(auVar19,local_9f0,0x7f);
              auVar95 = vfnmadd231ss_fma(auVar166,auVar93,ZEXT416((uint)fVar238));
              auVar87 = vfnmadd231ss_fma(auVar87,auVar93,auVar92);
              auVar166 = vpermilps_avx(_local_880,0xff);
              fVar242 = fVar242 - auVar166._0_4_;
              auVar94 = vshufps_avx(auVar86,auVar86,0xff);
              auVar166 = vfmsub213ss_fma(auVar95,ZEXT416((uint)fVar241),auVar94);
              auVar276._8_4_ = 0x80000000;
              auVar276._0_8_ = 0x8000000080000000;
              auVar276._12_4_ = 0x80000000;
              auVar278 = ZEXT1664(auVar276);
              auVar271._0_8_ = auVar166._0_8_ ^ 0x8000000080000000;
              auVar271._8_4_ = auVar166._8_4_ ^ 0x80000000;
              auVar271._12_4_ = auVar166._12_4_ ^ 0x80000000;
              auVar273 = ZEXT1664(auVar271);
              auVar87 = ZEXT416((uint)(auVar87._0_4_ * fVar241));
              auVar95 = vfmsub231ss_fma(ZEXT416((uint)(auVar92._0_4_ * auVar166._0_4_)),
                                        ZEXT416((uint)fVar238),auVar87);
              auVar166 = vinsertps_avx(auVar271,auVar87,0x1c);
              auVar255._0_8_ = auVar92._0_8_ ^ 0x8000000080000000;
              auVar255._8_4_ = auVar92._8_4_ ^ 0x80000000;
              auVar255._12_4_ = auVar92._12_4_ ^ 0x80000000;
              auVar87 = vinsertps_avx(ZEXT416((uint)fVar238),auVar255,0x10);
              auVar233._0_4_ = auVar95._0_4_;
              auVar233._4_4_ = auVar233._0_4_;
              auVar233._8_4_ = auVar233._0_4_;
              auVar233._12_4_ = auVar233._0_4_;
              auVar92 = vdivps_avx(auVar166,auVar233);
              auVar166 = vdivps_avx(auVar87,auVar233);
              auVar234._0_4_ = fVar240 * auVar92._0_4_ + fVar242 * auVar166._0_4_;
              auVar234._4_4_ = fVar240 * auVar92._4_4_ + fVar242 * auVar166._4_4_;
              auVar234._8_4_ = fVar240 * auVar92._8_4_ + fVar242 * auVar166._8_4_;
              auVar234._12_4_ = fVar240 * auVar92._12_4_ + fVar242 * auVar166._12_4_;
              auVar92 = vsubps_avx(local_800._0_16_,auVar234);
              auVar181 = ZEXT1664(auVar92);
              auVar31._8_4_ = 0x7fffffff;
              auVar31._0_8_ = 0x7fffffff7fffffff;
              auVar31._12_4_ = 0x7fffffff;
              auVar148._0_16_ = vandps_avx512vl(auVar93,auVar31);
            } while (auVar88._0_4_ <= auVar148._0_4_);
            auVar166 = vfmadd231ss_fma(ZEXT416((uint)(auVar88._0_4_ + auVar89._0_4_)),local_940,
                                       ZEXT416(0x36000000));
            auVar32._8_4_ = 0x7fffffff;
            auVar32._0_8_ = 0x7fffffff7fffffff;
            auVar32._12_4_ = 0x7fffffff;
            auVar148._0_16_ = vandps_avx512vl(ZEXT416((uint)fVar242),auVar32);
          } while (auVar166._0_4_ <= auVar148._0_4_);
          fVar244 = auVar92._0_4_ + (float)local_950._0_4_;
          if ((fVar161 <= fVar244) &&
             (fVar217 = *(float *)(ray + k * 4 + 0x200), fVar244 <= fVar217)) {
            auVar92 = vmovshdup_avx(auVar92);
            fVar240 = auVar92._0_4_;
            if ((0.0 <= fVar240) && (fVar240 <= 1.0)) {
              auVar54._12_4_ = 0;
              auVar54._0_12_ = ZEXT412(0);
              auVar153._16_48_ = auVar148._16_48_;
              auVar153._4_12_ = ZEXT412(0);
              auVar153._0_4_ = fVar239;
              auVar92 = vrsqrt14ss_avx512f(auVar54 << 0x20,auVar153._0_16_);
              fVar239 = auVar92._0_4_;
              auVar148._0_16_ = vmulss_avx512f(auVar85,ZEXT416(0xbf000000));
              pGVar3 = (context->scene->geometries).items[uVar1].ptr;
              if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                fVar239 = fVar239 * 1.5 + auVar148._0_4_ * fVar239 * fVar239 * fVar239;
                auVar235._0_4_ = auVar19._0_4_ * fVar239;
                auVar235._4_4_ = auVar19._4_4_ * fVar239;
                auVar235._8_4_ = auVar19._8_4_ * fVar239;
                auVar235._12_4_ = auVar19._12_4_ * fVar239;
                auVar166 = vfmadd213ps_fma(auVar94,auVar235,auVar86);
                auVar85 = vshufps_avx(auVar235,auVar235,0xc9);
                auVar92 = vshufps_avx(auVar86,auVar86,0xc9);
                auVar236._0_4_ = auVar235._0_4_ * auVar92._0_4_;
                auVar236._4_4_ = auVar235._4_4_ * auVar92._4_4_;
                auVar236._8_4_ = auVar235._8_4_ * auVar92._8_4_;
                auVar236._12_4_ = auVar235._12_4_ * auVar92._12_4_;
                auVar86 = vfmsub231ps_fma(auVar236,auVar86,auVar85);
                auVar85 = vshufps_avx(auVar86,auVar86,0xc9);
                auVar92 = vshufps_avx(auVar166,auVar166,0xc9);
                auVar86 = vshufps_avx(auVar86,auVar86,0xd2);
                auVar171._0_4_ = auVar166._0_4_ * auVar86._0_4_;
                auVar171._4_4_ = auVar166._4_4_ * auVar86._4_4_;
                auVar171._8_4_ = auVar166._8_4_ * auVar86._8_4_;
                auVar171._12_4_ = auVar166._12_4_ * auVar86._12_4_;
                auVar85 = vfmsub231ps_fma(auVar171,auVar85,auVar92);
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  *(float *)(ray + k * 4 + 0x200) = fVar244;
                  uVar182 = vextractps_avx(auVar85,1);
                  *(undefined4 *)(ray + k * 4 + 0x300) = uVar182;
                  uVar182 = vextractps_avx(auVar85,2);
                  *(undefined4 *)(ray + k * 4 + 0x340) = uVar182;
                  *(int *)(ray + k * 4 + 0x380) = auVar85._0_4_;
                  *(float *)(ray + k * 4 + 0x3c0) = fVar240;
                  *(undefined4 *)(ray + k * 4 + 0x400) = 0;
                  *(uint *)(ray + k * 4 + 0x440) = uVar2;
                  *(uint *)(ray + k * 4 + 0x480) = uVar1;
                  *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                }
                else {
                  pRVar5 = context->user;
                  auVar148 = vbroadcastss_avx512f(ZEXT416(1));
                  local_340 = vpermps_avx512f(auVar148,auVar181);
                  auVar148 = vpermps_avx512f(auVar148,ZEXT1664(auVar85));
                  auVar181 = vbroadcastss_avx512f(ZEXT416(2));
                  local_3c0 = vpermps_avx512f(auVar181,ZEXT1664(auVar85));
                  local_380 = vbroadcastss_avx512f(auVar85);
                  local_400[0] = (RTCHitN)auVar148[0];
                  local_400[1] = (RTCHitN)auVar148[1];
                  local_400[2] = (RTCHitN)auVar148[2];
                  local_400[3] = (RTCHitN)auVar148[3];
                  local_400[4] = (RTCHitN)auVar148[4];
                  local_400[5] = (RTCHitN)auVar148[5];
                  local_400[6] = (RTCHitN)auVar148[6];
                  local_400[7] = (RTCHitN)auVar148[7];
                  local_400[8] = (RTCHitN)auVar148[8];
                  local_400[9] = (RTCHitN)auVar148[9];
                  local_400[10] = (RTCHitN)auVar148[10];
                  local_400[0xb] = (RTCHitN)auVar148[0xb];
                  local_400[0xc] = (RTCHitN)auVar148[0xc];
                  local_400[0xd] = (RTCHitN)auVar148[0xd];
                  local_400[0xe] = (RTCHitN)auVar148[0xe];
                  local_400[0xf] = (RTCHitN)auVar148[0xf];
                  local_400[0x10] = (RTCHitN)auVar148[0x10];
                  local_400[0x11] = (RTCHitN)auVar148[0x11];
                  local_400[0x12] = (RTCHitN)auVar148[0x12];
                  local_400[0x13] = (RTCHitN)auVar148[0x13];
                  local_400[0x14] = (RTCHitN)auVar148[0x14];
                  local_400[0x15] = (RTCHitN)auVar148[0x15];
                  local_400[0x16] = (RTCHitN)auVar148[0x16];
                  local_400[0x17] = (RTCHitN)auVar148[0x17];
                  local_400[0x18] = (RTCHitN)auVar148[0x18];
                  local_400[0x19] = (RTCHitN)auVar148[0x19];
                  local_400[0x1a] = (RTCHitN)auVar148[0x1a];
                  local_400[0x1b] = (RTCHitN)auVar148[0x1b];
                  local_400[0x1c] = (RTCHitN)auVar148[0x1c];
                  local_400[0x1d] = (RTCHitN)auVar148[0x1d];
                  local_400[0x1e] = (RTCHitN)auVar148[0x1e];
                  local_400[0x1f] = (RTCHitN)auVar148[0x1f];
                  local_400[0x20] = (RTCHitN)auVar148[0x20];
                  local_400[0x21] = (RTCHitN)auVar148[0x21];
                  local_400[0x22] = (RTCHitN)auVar148[0x22];
                  local_400[0x23] = (RTCHitN)auVar148[0x23];
                  local_400[0x24] = (RTCHitN)auVar148[0x24];
                  local_400[0x25] = (RTCHitN)auVar148[0x25];
                  local_400[0x26] = (RTCHitN)auVar148[0x26];
                  local_400[0x27] = (RTCHitN)auVar148[0x27];
                  local_400[0x28] = (RTCHitN)auVar148[0x28];
                  local_400[0x29] = (RTCHitN)auVar148[0x29];
                  local_400[0x2a] = (RTCHitN)auVar148[0x2a];
                  local_400[0x2b] = (RTCHitN)auVar148[0x2b];
                  local_400[0x2c] = (RTCHitN)auVar148[0x2c];
                  local_400[0x2d] = (RTCHitN)auVar148[0x2d];
                  local_400[0x2e] = (RTCHitN)auVar148[0x2e];
                  local_400[0x2f] = (RTCHitN)auVar148[0x2f];
                  local_400[0x30] = (RTCHitN)auVar148[0x30];
                  local_400[0x31] = (RTCHitN)auVar148[0x31];
                  local_400[0x32] = (RTCHitN)auVar148[0x32];
                  local_400[0x33] = (RTCHitN)auVar148[0x33];
                  local_400[0x34] = (RTCHitN)auVar148[0x34];
                  local_400[0x35] = (RTCHitN)auVar148[0x35];
                  local_400[0x36] = (RTCHitN)auVar148[0x36];
                  local_400[0x37] = (RTCHitN)auVar148[0x37];
                  local_400[0x38] = (RTCHitN)auVar148[0x38];
                  local_400[0x39] = (RTCHitN)auVar148[0x39];
                  local_400[0x3a] = (RTCHitN)auVar148[0x3a];
                  local_400[0x3b] = (RTCHitN)auVar148[0x3b];
                  local_400[0x3c] = (RTCHitN)auVar148[0x3c];
                  local_400[0x3d] = (RTCHitN)auVar148[0x3d];
                  local_400[0x3e] = (RTCHitN)auVar148[0x3e];
                  local_400[0x3f] = (RTCHitN)auVar148[0x3f];
                  local_300 = 0;
                  uStack_2f8 = 0;
                  uStack_2f0 = 0;
                  uStack_2e8 = 0;
                  uStack_2e0 = 0;
                  uStack_2d8 = 0;
                  uStack_2d0 = 0;
                  uStack_2c8 = 0;
                  local_2c0 = local_480._0_8_;
                  uStack_2b8 = local_480._8_8_;
                  uStack_2b0 = local_480._16_8_;
                  uStack_2a8 = local_480._24_8_;
                  uStack_2a0 = local_480._32_8_;
                  uStack_298 = local_480._40_8_;
                  uStack_290 = local_480._48_8_;
                  uStack_288 = local_480._56_8_;
                  auVar148 = vmovdqa64_avx512f(local_440);
                  local_280 = vmovdqa64_avx512f(auVar148);
                  auVar148._32_32_ = vpcmpeqd_avx2(auVar148._0_32_,auVar148._0_32_);
                  local_a58[3] = auVar148._32_32_;
                  local_a58[2] = auVar148._32_32_;
                  local_a58[1] = auVar148._32_32_;
                  *local_a58 = auVar148._32_32_;
                  local_240 = vbroadcastss_avx512f(ZEXT416(pRVar5->instID[0]));
                  local_200 = vbroadcastss_avx512f(ZEXT416(pRVar5->instPrimID[0]));
                  *(float *)(ray + k * 4 + 0x200) = fVar244;
                  auVar148 = vmovdqa64_avx512f(local_4c0);
                  local_7c0 = vmovdqa64_avx512f(auVar148);
                  local_ad0.valid = (int *)local_7c0;
                  local_ad0.geometryUserPtr = pGVar3->userPtr;
                  local_ad0.context = context->user;
                  local_ad0.hit = local_400;
                  local_ad0.N = 0x10;
                  local_ad0.ray = (RTCRayN *)ray;
                  if (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar273 = ZEXT1664(auVar271);
                    auVar278 = ZEXT1664(auVar276);
                    auVar284 = ZEXT1664(auVar19);
                    auVar285 = ZEXT1664(ZEXT416((uint)fVar238));
                    (*pGVar3->intersectionFilterN)(&local_ad0);
                    auVar148 = vmovdqa64_avx512f(local_7c0);
                  }
                  uVar20 = vptestmd_avx512f(auVar148,auVar148);
                  if ((short)uVar20 != 0) {
                    p_Var4 = context->args->filter;
                    if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar273 = ZEXT1664(auVar273._0_16_);
                      auVar278 = ZEXT1664(auVar278._0_16_);
                      auVar284 = ZEXT1664(auVar284._0_16_);
                      auVar285 = ZEXT1664(auVar285._0_16_);
                      (*p_Var4)(&local_ad0);
                      auVar148 = vmovdqa64_avx512f(local_7c0);
                    }
                    uVar83 = vptestmd_avx512f(auVar148,auVar148);
                    if ((short)uVar83 != 0) {
                      iVar55 = *(int *)(local_ad0.hit + 4);
                      iVar56 = *(int *)(local_ad0.hit + 8);
                      iVar57 = *(int *)(local_ad0.hit + 0xc);
                      iVar58 = *(int *)(local_ad0.hit + 0x10);
                      iVar59 = *(int *)(local_ad0.hit + 0x14);
                      iVar60 = *(int *)(local_ad0.hit + 0x18);
                      iVar61 = *(int *)(local_ad0.hit + 0x1c);
                      iVar62 = *(int *)(local_ad0.hit + 0x20);
                      iVar63 = *(int *)(local_ad0.hit + 0x24);
                      iVar64 = *(int *)(local_ad0.hit + 0x28);
                      iVar65 = *(int *)(local_ad0.hit + 0x2c);
                      iVar66 = *(int *)(local_ad0.hit + 0x30);
                      iVar67 = *(int *)(local_ad0.hit + 0x34);
                      iVar68 = *(int *)(local_ad0.hit + 0x38);
                      iVar69 = *(int *)(local_ad0.hit + 0x3c);
                      bVar74 = (byte)uVar83;
                      bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
                      bVar6 = (bool)((byte)(uVar83 >> 2) & 1);
                      bVar7 = (bool)((byte)(uVar83 >> 3) & 1);
                      bVar8 = (bool)((byte)(uVar83 >> 4) & 1);
                      bVar9 = (bool)((byte)(uVar83 >> 5) & 1);
                      bVar10 = (bool)((byte)(uVar83 >> 6) & 1);
                      bVar11 = (bool)((byte)(uVar83 >> 7) & 1);
                      bVar76 = (byte)(uVar83 >> 8);
                      bVar12 = (bool)((byte)(uVar83 >> 9) & 1);
                      bVar13 = (bool)((byte)(uVar83 >> 10) & 1);
                      bVar14 = (bool)((byte)(uVar83 >> 0xb) & 1);
                      bVar15 = (bool)((byte)(uVar83 >> 0xc) & 1);
                      bVar16 = (bool)((byte)(uVar83 >> 0xd) & 1);
                      bVar17 = (bool)((byte)(uVar83 >> 0xe) & 1);
                      bVar18 = SUB81(uVar83 >> 0xf,0);
                      *(uint *)(local_ad0.ray + 0x300) =
                           (uint)(bVar74 & 1) * *(int *)local_ad0.hit |
                           (uint)!(bool)(bVar74 & 1) * *(int *)(local_ad0.ray + 0x300);
                      *(uint *)(local_ad0.ray + 0x304) =
                           (uint)bVar82 * iVar55 | (uint)!bVar82 * *(int *)(local_ad0.ray + 0x304);
                      *(uint *)(local_ad0.ray + 0x308) =
                           (uint)bVar6 * iVar56 | (uint)!bVar6 * *(int *)(local_ad0.ray + 0x308);
                      *(uint *)(local_ad0.ray + 0x30c) =
                           (uint)bVar7 * iVar57 | (uint)!bVar7 * *(int *)(local_ad0.ray + 0x30c);
                      *(uint *)(local_ad0.ray + 0x310) =
                           (uint)bVar8 * iVar58 | (uint)!bVar8 * *(int *)(local_ad0.ray + 0x310);
                      *(uint *)(local_ad0.ray + 0x314) =
                           (uint)bVar9 * iVar59 | (uint)!bVar9 * *(int *)(local_ad0.ray + 0x314);
                      *(uint *)(local_ad0.ray + 0x318) =
                           (uint)bVar10 * iVar60 | (uint)!bVar10 * *(int *)(local_ad0.ray + 0x318);
                      *(uint *)(local_ad0.ray + 0x31c) =
                           (uint)bVar11 * iVar61 | (uint)!bVar11 * *(int *)(local_ad0.ray + 0x31c);
                      *(uint *)(local_ad0.ray + 800) =
                           (uint)(bVar76 & 1) * iVar62 |
                           (uint)!(bool)(bVar76 & 1) * *(int *)(local_ad0.ray + 800);
                      *(uint *)(local_ad0.ray + 0x324) =
                           (uint)bVar12 * iVar63 | (uint)!bVar12 * *(int *)(local_ad0.ray + 0x324);
                      *(uint *)(local_ad0.ray + 0x328) =
                           (uint)bVar13 * iVar64 | (uint)!bVar13 * *(int *)(local_ad0.ray + 0x328);
                      *(uint *)(local_ad0.ray + 0x32c) =
                           (uint)bVar14 * iVar65 | (uint)!bVar14 * *(int *)(local_ad0.ray + 0x32c);
                      *(uint *)(local_ad0.ray + 0x330) =
                           (uint)bVar15 * iVar66 | (uint)!bVar15 * *(int *)(local_ad0.ray + 0x330);
                      *(uint *)(local_ad0.ray + 0x334) =
                           (uint)bVar16 * iVar67 | (uint)!bVar16 * *(int *)(local_ad0.ray + 0x334);
                      *(uint *)(local_ad0.ray + 0x338) =
                           (uint)bVar17 * iVar68 | (uint)!bVar17 * *(int *)(local_ad0.ray + 0x338);
                      *(uint *)(local_ad0.ray + 0x33c) =
                           (uint)bVar18 * iVar69 | (uint)!bVar18 * *(int *)(local_ad0.ray + 0x33c);
                      iVar55 = *(int *)(local_ad0.hit + 0x44);
                      iVar56 = *(int *)(local_ad0.hit + 0x48);
                      iVar57 = *(int *)(local_ad0.hit + 0x4c);
                      iVar58 = *(int *)(local_ad0.hit + 0x50);
                      iVar59 = *(int *)(local_ad0.hit + 0x54);
                      iVar60 = *(int *)(local_ad0.hit + 0x58);
                      iVar61 = *(int *)(local_ad0.hit + 0x5c);
                      iVar62 = *(int *)(local_ad0.hit + 0x60);
                      iVar63 = *(int *)(local_ad0.hit + 100);
                      iVar64 = *(int *)(local_ad0.hit + 0x68);
                      iVar65 = *(int *)(local_ad0.hit + 0x6c);
                      iVar66 = *(int *)(local_ad0.hit + 0x70);
                      iVar67 = *(int *)(local_ad0.hit + 0x74);
                      iVar68 = *(int *)(local_ad0.hit + 0x78);
                      iVar69 = *(int *)(local_ad0.hit + 0x7c);
                      bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
                      bVar6 = (bool)((byte)(uVar83 >> 2) & 1);
                      bVar7 = (bool)((byte)(uVar83 >> 3) & 1);
                      bVar8 = (bool)((byte)(uVar83 >> 4) & 1);
                      bVar9 = (bool)((byte)(uVar83 >> 5) & 1);
                      bVar10 = (bool)((byte)(uVar83 >> 6) & 1);
                      bVar11 = (bool)((byte)(uVar83 >> 7) & 1);
                      bVar12 = (bool)((byte)(uVar83 >> 9) & 1);
                      bVar13 = (bool)((byte)(uVar83 >> 10) & 1);
                      bVar14 = (bool)((byte)(uVar83 >> 0xb) & 1);
                      bVar15 = (bool)((byte)(uVar83 >> 0xc) & 1);
                      bVar16 = (bool)((byte)(uVar83 >> 0xd) & 1);
                      bVar17 = (bool)((byte)(uVar83 >> 0xe) & 1);
                      bVar18 = SUB81(uVar83 >> 0xf,0);
                      *(uint *)(local_ad0.ray + 0x340) =
                           (uint)(bVar74 & 1) * *(int *)(local_ad0.hit + 0x40) |
                           (uint)!(bool)(bVar74 & 1) * *(int *)(local_ad0.ray + 0x340);
                      *(uint *)(local_ad0.ray + 0x344) =
                           (uint)bVar82 * iVar55 | (uint)!bVar82 * *(int *)(local_ad0.ray + 0x344);
                      *(uint *)(local_ad0.ray + 0x348) =
                           (uint)bVar6 * iVar56 | (uint)!bVar6 * *(int *)(local_ad0.ray + 0x348);
                      *(uint *)(local_ad0.ray + 0x34c) =
                           (uint)bVar7 * iVar57 | (uint)!bVar7 * *(int *)(local_ad0.ray + 0x34c);
                      *(uint *)(local_ad0.ray + 0x350) =
                           (uint)bVar8 * iVar58 | (uint)!bVar8 * *(int *)(local_ad0.ray + 0x350);
                      *(uint *)(local_ad0.ray + 0x354) =
                           (uint)bVar9 * iVar59 | (uint)!bVar9 * *(int *)(local_ad0.ray + 0x354);
                      *(uint *)(local_ad0.ray + 0x358) =
                           (uint)bVar10 * iVar60 | (uint)!bVar10 * *(int *)(local_ad0.ray + 0x358);
                      *(uint *)(local_ad0.ray + 0x35c) =
                           (uint)bVar11 * iVar61 | (uint)!bVar11 * *(int *)(local_ad0.ray + 0x35c);
                      *(uint *)(local_ad0.ray + 0x360) =
                           (uint)(bVar76 & 1) * iVar62 |
                           (uint)!(bool)(bVar76 & 1) * *(int *)(local_ad0.ray + 0x360);
                      *(uint *)(local_ad0.ray + 0x364) =
                           (uint)bVar12 * iVar63 | (uint)!bVar12 * *(int *)(local_ad0.ray + 0x364);
                      *(uint *)(local_ad0.ray + 0x368) =
                           (uint)bVar13 * iVar64 | (uint)!bVar13 * *(int *)(local_ad0.ray + 0x368);
                      *(uint *)(local_ad0.ray + 0x36c) =
                           (uint)bVar14 * iVar65 | (uint)!bVar14 * *(int *)(local_ad0.ray + 0x36c);
                      *(uint *)(local_ad0.ray + 0x370) =
                           (uint)bVar15 * iVar66 | (uint)!bVar15 * *(int *)(local_ad0.ray + 0x370);
                      *(uint *)(local_ad0.ray + 0x374) =
                           (uint)bVar16 * iVar67 | (uint)!bVar16 * *(int *)(local_ad0.ray + 0x374);
                      *(uint *)(local_ad0.ray + 0x378) =
                           (uint)bVar17 * iVar68 | (uint)!bVar17 * *(int *)(local_ad0.ray + 0x378);
                      *(uint *)(local_ad0.ray + 0x37c) =
                           (uint)bVar18 * iVar69 | (uint)!bVar18 * *(int *)(local_ad0.ray + 0x37c);
                      iVar55 = *(int *)(local_ad0.hit + 0x84);
                      iVar56 = *(int *)(local_ad0.hit + 0x88);
                      iVar57 = *(int *)(local_ad0.hit + 0x8c);
                      iVar58 = *(int *)(local_ad0.hit + 0x90);
                      iVar59 = *(int *)(local_ad0.hit + 0x94);
                      iVar60 = *(int *)(local_ad0.hit + 0x98);
                      iVar61 = *(int *)(local_ad0.hit + 0x9c);
                      iVar62 = *(int *)(local_ad0.hit + 0xa0);
                      iVar63 = *(int *)(local_ad0.hit + 0xa4);
                      iVar64 = *(int *)(local_ad0.hit + 0xa8);
                      iVar65 = *(int *)(local_ad0.hit + 0xac);
                      iVar66 = *(int *)(local_ad0.hit + 0xb0);
                      iVar67 = *(int *)(local_ad0.hit + 0xb4);
                      iVar68 = *(int *)(local_ad0.hit + 0xb8);
                      iVar69 = *(int *)(local_ad0.hit + 0xbc);
                      bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
                      bVar6 = (bool)((byte)(uVar83 >> 2) & 1);
                      bVar7 = (bool)((byte)(uVar83 >> 3) & 1);
                      bVar8 = (bool)((byte)(uVar83 >> 4) & 1);
                      bVar9 = (bool)((byte)(uVar83 >> 5) & 1);
                      bVar10 = (bool)((byte)(uVar83 >> 6) & 1);
                      bVar11 = (bool)((byte)(uVar83 >> 7) & 1);
                      bVar12 = (bool)((byte)(uVar83 >> 9) & 1);
                      bVar13 = (bool)((byte)(uVar83 >> 10) & 1);
                      bVar14 = (bool)((byte)(uVar83 >> 0xb) & 1);
                      bVar15 = (bool)((byte)(uVar83 >> 0xc) & 1);
                      bVar16 = (bool)((byte)(uVar83 >> 0xd) & 1);
                      bVar17 = (bool)((byte)(uVar83 >> 0xe) & 1);
                      bVar18 = SUB81(uVar83 >> 0xf,0);
                      *(uint *)(local_ad0.ray + 0x380) =
                           (uint)(bVar74 & 1) * *(int *)(local_ad0.hit + 0x80) |
                           (uint)!(bool)(bVar74 & 1) * *(int *)(local_ad0.ray + 0x380);
                      *(uint *)(local_ad0.ray + 900) =
                           (uint)bVar82 * iVar55 | (uint)!bVar82 * *(int *)(local_ad0.ray + 900);
                      *(uint *)(local_ad0.ray + 0x388) =
                           (uint)bVar6 * iVar56 | (uint)!bVar6 * *(int *)(local_ad0.ray + 0x388);
                      *(uint *)(local_ad0.ray + 0x38c) =
                           (uint)bVar7 * iVar57 | (uint)!bVar7 * *(int *)(local_ad0.ray + 0x38c);
                      *(uint *)(local_ad0.ray + 0x390) =
                           (uint)bVar8 * iVar58 | (uint)!bVar8 * *(int *)(local_ad0.ray + 0x390);
                      *(uint *)(local_ad0.ray + 0x394) =
                           (uint)bVar9 * iVar59 | (uint)!bVar9 * *(int *)(local_ad0.ray + 0x394);
                      *(uint *)(local_ad0.ray + 0x398) =
                           (uint)bVar10 * iVar60 | (uint)!bVar10 * *(int *)(local_ad0.ray + 0x398);
                      *(uint *)(local_ad0.ray + 0x39c) =
                           (uint)bVar11 * iVar61 | (uint)!bVar11 * *(int *)(local_ad0.ray + 0x39c);
                      *(uint *)(local_ad0.ray + 0x3a0) =
                           (uint)(bVar76 & 1) * iVar62 |
                           (uint)!(bool)(bVar76 & 1) * *(int *)(local_ad0.ray + 0x3a0);
                      *(uint *)(local_ad0.ray + 0x3a4) =
                           (uint)bVar12 * iVar63 | (uint)!bVar12 * *(int *)(local_ad0.ray + 0x3a4);
                      *(uint *)(local_ad0.ray + 0x3a8) =
                           (uint)bVar13 * iVar64 | (uint)!bVar13 * *(int *)(local_ad0.ray + 0x3a8);
                      *(uint *)(local_ad0.ray + 0x3ac) =
                           (uint)bVar14 * iVar65 | (uint)!bVar14 * *(int *)(local_ad0.ray + 0x3ac);
                      *(uint *)(local_ad0.ray + 0x3b0) =
                           (uint)bVar15 * iVar66 | (uint)!bVar15 * *(int *)(local_ad0.ray + 0x3b0);
                      *(uint *)(local_ad0.ray + 0x3b4) =
                           (uint)bVar16 * iVar67 | (uint)!bVar16 * *(int *)(local_ad0.ray + 0x3b4);
                      *(uint *)(local_ad0.ray + 0x3b8) =
                           (uint)bVar17 * iVar68 | (uint)!bVar17 * *(int *)(local_ad0.ray + 0x3b8);
                      *(uint *)(local_ad0.ray + 0x3bc) =
                           (uint)bVar18 * iVar69 | (uint)!bVar18 * *(int *)(local_ad0.ray + 0x3bc);
                      iVar55 = *(int *)(local_ad0.hit + 0xc4);
                      iVar56 = *(int *)(local_ad0.hit + 200);
                      iVar57 = *(int *)(local_ad0.hit + 0xcc);
                      iVar58 = *(int *)(local_ad0.hit + 0xd0);
                      iVar59 = *(int *)(local_ad0.hit + 0xd4);
                      iVar60 = *(int *)(local_ad0.hit + 0xd8);
                      iVar61 = *(int *)(local_ad0.hit + 0xdc);
                      iVar62 = *(int *)(local_ad0.hit + 0xe0);
                      iVar63 = *(int *)(local_ad0.hit + 0xe4);
                      iVar64 = *(int *)(local_ad0.hit + 0xe8);
                      iVar65 = *(int *)(local_ad0.hit + 0xec);
                      iVar66 = *(int *)(local_ad0.hit + 0xf0);
                      iVar67 = *(int *)(local_ad0.hit + 0xf4);
                      iVar68 = *(int *)(local_ad0.hit + 0xf8);
                      iVar69 = *(int *)(local_ad0.hit + 0xfc);
                      bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
                      bVar6 = (bool)((byte)(uVar83 >> 2) & 1);
                      bVar7 = (bool)((byte)(uVar83 >> 3) & 1);
                      bVar8 = (bool)((byte)(uVar83 >> 4) & 1);
                      bVar9 = (bool)((byte)(uVar83 >> 5) & 1);
                      bVar10 = (bool)((byte)(uVar83 >> 6) & 1);
                      bVar11 = (bool)((byte)(uVar83 >> 7) & 1);
                      bVar12 = (bool)((byte)(uVar83 >> 9) & 1);
                      bVar13 = (bool)((byte)(uVar83 >> 10) & 1);
                      bVar14 = (bool)((byte)(uVar83 >> 0xb) & 1);
                      bVar15 = (bool)((byte)(uVar83 >> 0xc) & 1);
                      bVar16 = (bool)((byte)(uVar83 >> 0xd) & 1);
                      bVar17 = (bool)((byte)(uVar83 >> 0xe) & 1);
                      bVar18 = SUB81(uVar83 >> 0xf,0);
                      *(uint *)(local_ad0.ray + 0x3c0) =
                           (uint)(bVar74 & 1) * *(int *)(local_ad0.hit + 0xc0) |
                           (uint)!(bool)(bVar74 & 1) * *(int *)(local_ad0.ray + 0x3c0);
                      *(uint *)(local_ad0.ray + 0x3c4) =
                           (uint)bVar82 * iVar55 | (uint)!bVar82 * *(int *)(local_ad0.ray + 0x3c4);
                      *(uint *)(local_ad0.ray + 0x3c8) =
                           (uint)bVar6 * iVar56 | (uint)!bVar6 * *(int *)(local_ad0.ray + 0x3c8);
                      *(uint *)(local_ad0.ray + 0x3cc) =
                           (uint)bVar7 * iVar57 | (uint)!bVar7 * *(int *)(local_ad0.ray + 0x3cc);
                      *(uint *)(local_ad0.ray + 0x3d0) =
                           (uint)bVar8 * iVar58 | (uint)!bVar8 * *(int *)(local_ad0.ray + 0x3d0);
                      *(uint *)(local_ad0.ray + 0x3d4) =
                           (uint)bVar9 * iVar59 | (uint)!bVar9 * *(int *)(local_ad0.ray + 0x3d4);
                      *(uint *)(local_ad0.ray + 0x3d8) =
                           (uint)bVar10 * iVar60 | (uint)!bVar10 * *(int *)(local_ad0.ray + 0x3d8);
                      *(uint *)(local_ad0.ray + 0x3dc) =
                           (uint)bVar11 * iVar61 | (uint)!bVar11 * *(int *)(local_ad0.ray + 0x3dc);
                      *(uint *)(local_ad0.ray + 0x3e0) =
                           (uint)(bVar76 & 1) * iVar62 |
                           (uint)!(bool)(bVar76 & 1) * *(int *)(local_ad0.ray + 0x3e0);
                      *(uint *)(local_ad0.ray + 0x3e4) =
                           (uint)bVar12 * iVar63 | (uint)!bVar12 * *(int *)(local_ad0.ray + 0x3e4);
                      *(uint *)(local_ad0.ray + 1000) =
                           (uint)bVar13 * iVar64 | (uint)!bVar13 * *(int *)(local_ad0.ray + 1000);
                      *(uint *)(local_ad0.ray + 0x3ec) =
                           (uint)bVar14 * iVar65 | (uint)!bVar14 * *(int *)(local_ad0.ray + 0x3ec);
                      *(uint *)(local_ad0.ray + 0x3f0) =
                           (uint)bVar15 * iVar66 | (uint)!bVar15 * *(int *)(local_ad0.ray + 0x3f0);
                      *(uint *)(local_ad0.ray + 0x3f4) =
                           (uint)bVar16 * iVar67 | (uint)!bVar16 * *(int *)(local_ad0.ray + 0x3f4);
                      *(uint *)(local_ad0.ray + 0x3f8) =
                           (uint)bVar17 * iVar68 | (uint)!bVar17 * *(int *)(local_ad0.ray + 0x3f8);
                      *(uint *)(local_ad0.ray + 0x3fc) =
                           (uint)bVar18 * iVar69 | (uint)!bVar18 * *(int *)(local_ad0.ray + 0x3fc);
                      iVar55 = *(int *)(local_ad0.hit + 0x104);
                      iVar56 = *(int *)(local_ad0.hit + 0x108);
                      iVar57 = *(int *)(local_ad0.hit + 0x10c);
                      iVar58 = *(int *)(local_ad0.hit + 0x110);
                      iVar59 = *(int *)(local_ad0.hit + 0x114);
                      iVar60 = *(int *)(local_ad0.hit + 0x118);
                      iVar61 = *(int *)(local_ad0.hit + 0x11c);
                      iVar62 = *(int *)(local_ad0.hit + 0x120);
                      iVar63 = *(int *)(local_ad0.hit + 0x124);
                      iVar64 = *(int *)(local_ad0.hit + 0x128);
                      iVar65 = *(int *)(local_ad0.hit + 300);
                      iVar66 = *(int *)(local_ad0.hit + 0x130);
                      iVar67 = *(int *)(local_ad0.hit + 0x134);
                      iVar68 = *(int *)(local_ad0.hit + 0x138);
                      iVar69 = *(int *)(local_ad0.hit + 0x13c);
                      bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
                      bVar6 = (bool)((byte)(uVar83 >> 2) & 1);
                      bVar7 = (bool)((byte)(uVar83 >> 3) & 1);
                      bVar8 = (bool)((byte)(uVar83 >> 4) & 1);
                      bVar9 = (bool)((byte)(uVar83 >> 5) & 1);
                      bVar10 = (bool)((byte)(uVar83 >> 6) & 1);
                      bVar11 = (bool)((byte)(uVar83 >> 7) & 1);
                      bVar12 = (bool)((byte)(uVar83 >> 9) & 1);
                      bVar13 = (bool)((byte)(uVar83 >> 10) & 1);
                      bVar14 = (bool)((byte)(uVar83 >> 0xb) & 1);
                      bVar15 = (bool)((byte)(uVar83 >> 0xc) & 1);
                      bVar16 = (bool)((byte)(uVar83 >> 0xd) & 1);
                      bVar17 = (bool)((byte)(uVar83 >> 0xe) & 1);
                      bVar18 = SUB81(uVar83 >> 0xf,0);
                      *(uint *)(local_ad0.ray + 0x400) =
                           (uint)(bVar74 & 1) * *(int *)(local_ad0.hit + 0x100) |
                           (uint)!(bool)(bVar74 & 1) * *(int *)(local_ad0.ray + 0x400);
                      *(uint *)(local_ad0.ray + 0x404) =
                           (uint)bVar82 * iVar55 | (uint)!bVar82 * *(int *)(local_ad0.ray + 0x404);
                      *(uint *)(local_ad0.ray + 0x408) =
                           (uint)bVar6 * iVar56 | (uint)!bVar6 * *(int *)(local_ad0.ray + 0x408);
                      *(uint *)(local_ad0.ray + 0x40c) =
                           (uint)bVar7 * iVar57 | (uint)!bVar7 * *(int *)(local_ad0.ray + 0x40c);
                      *(uint *)(local_ad0.ray + 0x410) =
                           (uint)bVar8 * iVar58 | (uint)!bVar8 * *(int *)(local_ad0.ray + 0x410);
                      *(uint *)(local_ad0.ray + 0x414) =
                           (uint)bVar9 * iVar59 | (uint)!bVar9 * *(int *)(local_ad0.ray + 0x414);
                      *(uint *)(local_ad0.ray + 0x418) =
                           (uint)bVar10 * iVar60 | (uint)!bVar10 * *(int *)(local_ad0.ray + 0x418);
                      *(uint *)(local_ad0.ray + 0x41c) =
                           (uint)bVar11 * iVar61 | (uint)!bVar11 * *(int *)(local_ad0.ray + 0x41c);
                      *(uint *)(local_ad0.ray + 0x420) =
                           (uint)(bVar76 & 1) * iVar62 |
                           (uint)!(bool)(bVar76 & 1) * *(int *)(local_ad0.ray + 0x420);
                      *(uint *)(local_ad0.ray + 0x424) =
                           (uint)bVar12 * iVar63 | (uint)!bVar12 * *(int *)(local_ad0.ray + 0x424);
                      *(uint *)(local_ad0.ray + 0x428) =
                           (uint)bVar13 * iVar64 | (uint)!bVar13 * *(int *)(local_ad0.ray + 0x428);
                      *(uint *)(local_ad0.ray + 0x42c) =
                           (uint)bVar14 * iVar65 | (uint)!bVar14 * *(int *)(local_ad0.ray + 0x42c);
                      *(uint *)(local_ad0.ray + 0x430) =
                           (uint)bVar15 * iVar66 | (uint)!bVar15 * *(int *)(local_ad0.ray + 0x430);
                      *(uint *)(local_ad0.ray + 0x434) =
                           (uint)bVar16 * iVar67 | (uint)!bVar16 * *(int *)(local_ad0.ray + 0x434);
                      *(uint *)(local_ad0.ray + 0x438) =
                           (uint)bVar17 * iVar68 | (uint)!bVar17 * *(int *)(local_ad0.ray + 0x438);
                      *(uint *)(local_ad0.ray + 0x43c) =
                           (uint)bVar18 * iVar69 | (uint)!bVar18 * *(int *)(local_ad0.ray + 0x43c);
                      auVar148 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_ad0.hit + 0x140));
                      auVar148 = vmovdqu32_avx512f(auVar148);
                      *(undefined1 (*) [64])(local_ad0.ray + 0x440) = auVar148;
                      auVar148 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_ad0.hit + 0x180));
                      auVar148 = vmovdqu32_avx512f(auVar148);
                      *(undefined1 (*) [64])(local_ad0.ray + 0x480) = auVar148;
                      auVar181 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_ad0.hit + 0x1c0));
                      auVar148 = vmovdqa32_avx512f(auVar181);
                      *(undefined1 (*) [64])(local_ad0.ray + 0x4c0) = auVar148;
                      auVar200 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_ad0.hit + 0x200));
                      bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
                      auVar50._4_56_ = auVar200._8_56_;
                      auVar50._0_4_ = (uint)bVar82 * auVar200._4_4_ | (uint)!bVar82 * auVar181._4_4_
                      ;
                      auVar148._0_8_ = auVar50._0_8_ << 0x20;
                      bVar82 = (bool)((byte)(uVar83 >> 2) & 1);
                      auVar148._8_4_ =
                           (uint)bVar82 * auVar200._8_4_ | (uint)!bVar82 * auVar181._8_4_;
                      bVar82 = (bool)((byte)(uVar83 >> 3) & 1);
                      auVar148._12_4_ =
                           (uint)bVar82 * auVar200._12_4_ | (uint)!bVar82 * auVar181._12_4_;
                      bVar82 = (bool)((byte)(uVar83 >> 4) & 1);
                      auVar148._16_4_ =
                           (uint)bVar82 * auVar200._16_4_ | (uint)!bVar82 * auVar181._16_4_;
                      bVar82 = (bool)((byte)(uVar83 >> 5) & 1);
                      auVar148._20_4_ =
                           (uint)bVar82 * auVar200._20_4_ | (uint)!bVar82 * auVar181._20_4_;
                      bVar82 = (bool)((byte)(uVar83 >> 6) & 1);
                      auVar148._24_4_ =
                           (uint)bVar82 * auVar200._24_4_ | (uint)!bVar82 * auVar181._24_4_;
                      bVar82 = (bool)((byte)(uVar83 >> 7) & 1);
                      auVar148._28_4_ =
                           (uint)bVar82 * auVar200._28_4_ | (uint)!bVar82 * auVar181._28_4_;
                      auVar148._32_4_ =
                           (uint)(bVar76 & 1) * auVar200._32_4_ |
                           (uint)!(bool)(bVar76 & 1) * auVar181._32_4_;
                      bVar82 = (bool)((byte)(uVar83 >> 9) & 1);
                      auVar148._36_4_ =
                           (uint)bVar82 * auVar200._36_4_ | (uint)!bVar82 * auVar181._36_4_;
                      bVar82 = (bool)((byte)(uVar83 >> 10) & 1);
                      auVar148._40_4_ =
                           (uint)bVar82 * auVar200._40_4_ | (uint)!bVar82 * auVar181._40_4_;
                      bVar82 = (bool)((byte)(uVar83 >> 0xb) & 1);
                      auVar148._44_4_ =
                           (uint)bVar82 * auVar200._44_4_ | (uint)!bVar82 * auVar181._44_4_;
                      bVar82 = (bool)((byte)(uVar83 >> 0xc) & 1);
                      auVar148._48_4_ =
                           (uint)bVar82 * auVar200._48_4_ | (uint)!bVar82 * auVar181._48_4_;
                      bVar82 = (bool)((byte)(uVar83 >> 0xd) & 1);
                      auVar148._52_4_ =
                           (uint)bVar82 * auVar200._52_4_ | (uint)!bVar82 * auVar181._52_4_;
                      bVar82 = (bool)((byte)(uVar83 >> 0xe) & 1);
                      auVar148._56_4_ =
                           (uint)bVar82 * auVar200._56_4_ | (uint)!bVar82 * auVar181._56_4_;
                      bVar82 = SUB81(uVar83 >> 0xf,0);
                      auVar148._60_4_ =
                           (uint)bVar82 * auVar200._60_4_ | (uint)!bVar82 * auVar181._60_4_;
                      auVar181 = vmovdqa32_avx512f(auVar200);
                      *(undefined1 (*) [64])(local_ad0.ray + 0x500) = auVar181;
                      goto LAB_017fa904;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x200) = fVar217;
                }
              }
            }
          }
LAB_017fa904:
          uVar182 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar257._4_4_ = uVar182;
          auVar257._0_4_ = uVar182;
          auVar257._8_4_ = uVar182;
          auVar257._12_4_ = uVar182;
          auVar257._16_4_ = uVar182;
          auVar257._20_4_ = uVar182;
          auVar257._24_4_ = uVar182;
          auVar257._28_4_ = uVar182;
          auVar181 = ZEXT3264(auVar257);
          auVar71._4_4_ = fStack_73c;
          auVar71._0_4_ = local_740;
          auVar71._8_4_ = fStack_738;
          auVar71._12_4_ = fStack_734;
          auVar71._16_4_ = fStack_730;
          auVar71._20_4_ = fStack_72c;
          auVar71._24_4_ = fStack_728;
          auVar71._28_4_ = fStack_724;
          uVar20 = vcmpps_avx512vl(auVar257,auVar71,0xd);
        }
        uVar22 = vpcmpd_avx512vl(local_700,local_680,1);
        uVar21 = vpcmpd_avx512vl(local_700,_local_760,1);
        auVar199._0_4_ = (float)local_820._0_4_ + (float)local_540._0_4_;
        auVar199._4_4_ = (float)local_820._4_4_ + (float)local_540._4_4_;
        auVar199._8_4_ = fStack_818 + fStack_538;
        auVar199._12_4_ = fStack_814 + fStack_534;
        auVar199._16_4_ = fStack_810 + fStack_530;
        auVar199._20_4_ = fStack_80c + fStack_52c;
        auVar199._24_4_ = fStack_808 + fStack_528;
        auVar199._28_4_ = fStack_804 + fStack_524;
        uVar182 = auVar181._0_4_;
        auVar216._4_4_ = uVar182;
        auVar216._0_4_ = uVar182;
        auVar216._8_4_ = uVar182;
        auVar216._12_4_ = uVar182;
        auVar216._16_4_ = uVar182;
        auVar216._20_4_ = uVar182;
        auVar216._24_4_ = uVar182;
        auVar216._28_4_ = uVar182;
        uVar20 = vcmpps_avx512vl(auVar199,auVar216,2);
        bVar77 = bVar77 & (byte)uVar22 & (byte)uVar20;
        auVar237._0_4_ = (float)local_820._0_4_ + local_6c0._0_4_;
        auVar237._4_4_ = (float)local_820._4_4_ + local_6c0._4_4_;
        auVar237._8_4_ = fStack_818 + local_6c0._8_4_;
        auVar237._12_4_ = fStack_814 + local_6c0._12_4_;
        auVar237._16_4_ = fStack_810 + local_6c0._16_4_;
        auVar237._20_4_ = fStack_80c + local_6c0._20_4_;
        auVar237._24_4_ = fStack_808 + local_6c0._24_4_;
        auVar237._28_4_ = fStack_804 + local_6c0._28_4_;
        uVar20 = vcmpps_avx512vl(auVar237,auVar216,2);
        bVar73 = bVar73 & (byte)uVar21 & (byte)uVar20 | bVar77;
        if (bVar73 != 0) {
          abStack_1a0[uVar78 * 0x60] = bVar73;
          auVar147._0_4_ =
               (uint)(bVar77 & 1) * local_540._0_4_ |
               (uint)!(bool)(bVar77 & 1) * (int)local_6c0._0_4_;
          bVar82 = (bool)(bVar77 >> 1 & 1);
          auVar147._4_4_ = (uint)bVar82 * local_540._4_4_ | (uint)!bVar82 * (int)local_6c0._4_4_;
          bVar82 = (bool)(bVar77 >> 2 & 1);
          auVar147._8_4_ = (uint)bVar82 * (int)fStack_538 | (uint)!bVar82 * (int)local_6c0._8_4_;
          bVar82 = (bool)(bVar77 >> 3 & 1);
          auVar147._12_4_ = (uint)bVar82 * (int)fStack_534 | (uint)!bVar82 * (int)local_6c0._12_4_;
          bVar82 = (bool)(bVar77 >> 4 & 1);
          auVar147._16_4_ = (uint)bVar82 * (int)fStack_530 | (uint)!bVar82 * (int)local_6c0._16_4_;
          bVar82 = (bool)(bVar77 >> 5 & 1);
          auVar147._20_4_ = (uint)bVar82 * (int)fStack_52c | (uint)!bVar82 * (int)local_6c0._20_4_;
          auVar147._24_4_ =
               (uint)(bVar77 >> 6) * (int)fStack_528 |
               (uint)!(bool)(bVar77 >> 6) * (int)local_6c0._24_4_;
          auVar147._28_4_ = local_6c0._28_4_;
          auVar148._0_32_ = auVar147;
          *(undefined1 (*) [32])(auStack_180 + uVar78 * 0x60) = auVar147;
          uVar83 = vmovlps_avx(local_710);
          (&uStack_160)[uVar78 * 0xc] = uVar83;
          aiStack_158[uVar78 * 0x18] = local_d24 + 1;
          uVar78 = (ulong)((int)uVar78 + 1);
        }
        auVar258 = ZEXT3264(_DAT_01f7b040);
        prim = local_a50;
      }
    }
    do {
      uVar84 = (uint)uVar78;
      uVar78 = (ulong)(uVar84 - 1);
      if (uVar84 == 0) {
        uVar182 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar33._4_4_ = uVar182;
        auVar33._0_4_ = uVar182;
        auVar33._8_4_ = uVar182;
        auVar33._12_4_ = uVar182;
        uVar20 = vcmpps_avx512vl(local_720,auVar33,2);
        local_a48 = (ulong)((uint)local_a48 & (uint)uVar20);
        goto LAB_017f81a5;
      }
      lVar81 = uVar78 * 0x60;
      auVar106 = *(undefined1 (*) [32])(auStack_180 + lVar81);
      auVar196._0_4_ = auVar106._0_4_ + (float)local_820._0_4_;
      auVar196._4_4_ = auVar106._4_4_ + (float)local_820._4_4_;
      auVar196._8_4_ = auVar106._8_4_ + fStack_818;
      auVar196._12_4_ = auVar106._12_4_ + fStack_814;
      auVar196._16_4_ = auVar106._16_4_ + fStack_810;
      auVar196._20_4_ = auVar106._20_4_ + fStack_80c;
      auVar196._24_4_ = auVar106._24_4_ + fStack_808;
      auVar196._28_4_ = auVar106._28_4_ + fStack_804;
      uVar182 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar39._4_4_ = uVar182;
      auVar39._0_4_ = uVar182;
      auVar39._8_4_ = uVar182;
      auVar39._12_4_ = uVar182;
      auVar39._16_4_ = uVar182;
      auVar39._20_4_ = uVar182;
      auVar39._24_4_ = uVar182;
      auVar39._28_4_ = uVar182;
      uVar20 = vcmpps_avx512vl(auVar196,auVar39,2);
      uVar154 = (uint)uVar20 & (uint)abStack_1a0[lVar81];
    } while (uVar154 == 0);
    uVar83 = (&uStack_160)[uVar78 * 0xc];
    auVar185._8_8_ = 0;
    auVar185._0_8_ = uVar83;
    auVar215._8_4_ = 0x7f800000;
    auVar215._0_8_ = 0x7f8000007f800000;
    auVar215._12_4_ = 0x7f800000;
    auVar215._16_4_ = 0x7f800000;
    auVar215._20_4_ = 0x7f800000;
    auVar215._24_4_ = 0x7f800000;
    auVar215._28_4_ = 0x7f800000;
    auVar109 = vblendmps_avx512vl(auVar215,auVar106);
    bVar73 = (byte)uVar154;
    auVar144._0_4_ =
         (uint)(bVar73 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar73 & 1) * (int)auVar106._0_4_;
    bVar82 = (bool)((byte)(uVar154 >> 1) & 1);
    auVar144._4_4_ = (uint)bVar82 * auVar109._4_4_ | (uint)!bVar82 * (int)auVar106._4_4_;
    bVar82 = (bool)((byte)(uVar154 >> 2) & 1);
    auVar144._8_4_ = (uint)bVar82 * auVar109._8_4_ | (uint)!bVar82 * (int)auVar106._8_4_;
    bVar82 = (bool)((byte)(uVar154 >> 3) & 1);
    auVar144._12_4_ = (uint)bVar82 * auVar109._12_4_ | (uint)!bVar82 * (int)auVar106._12_4_;
    bVar82 = (bool)((byte)(uVar154 >> 4) & 1);
    auVar144._16_4_ = (uint)bVar82 * auVar109._16_4_ | (uint)!bVar82 * (int)auVar106._16_4_;
    bVar82 = (bool)((byte)(uVar154 >> 5) & 1);
    auVar144._20_4_ = (uint)bVar82 * auVar109._20_4_ | (uint)!bVar82 * (int)auVar106._20_4_;
    bVar82 = (bool)((byte)(uVar154 >> 6) & 1);
    auVar144._24_4_ = (uint)bVar82 * auVar109._24_4_ | (uint)!bVar82 * (int)auVar106._24_4_;
    auVar144._28_4_ =
         (uVar154 >> 7) * auVar109._28_4_ | (uint)!SUB41(uVar154 >> 7,0) * (int)auVar106._28_4_;
    auVar106 = vshufps_avx(auVar144,auVar144,0xb1);
    auVar106 = vminps_avx(auVar144,auVar106);
    auVar109 = vshufpd_avx(auVar106,auVar106,5);
    auVar106 = vminps_avx(auVar106,auVar109);
    auVar109 = vpermpd_avx2(auVar106,0x4e);
    auVar106 = vminps_avx(auVar106,auVar109);
    uVar20 = vcmpps_avx512vl(auVar144,auVar106,0);
    bVar79 = (byte)uVar20 & bVar73;
    if (bVar79 != 0) {
      uVar154 = (uint)bVar79;
    }
    uVar155 = 0;
    for (; (uVar154 & 1) == 0; uVar154 = uVar154 >> 1 | 0x80000000) {
      uVar155 = uVar155 + 1;
    }
    local_d24 = aiStack_158[uVar78 * 0x18];
    bVar73 = ~('\x01' << ((byte)uVar155 & 0x1f)) & bVar73;
    abStack_1a0[lVar81] = bVar73;
    if (bVar73 == 0) {
      uVar84 = uVar84 - 1;
    }
    uVar182 = (undefined4)uVar83;
    auVar175._4_4_ = uVar182;
    auVar175._0_4_ = uVar182;
    auVar175._8_4_ = uVar182;
    auVar175._12_4_ = uVar182;
    auVar175._16_4_ = uVar182;
    auVar175._20_4_ = uVar182;
    auVar175._24_4_ = uVar182;
    auVar175._28_4_ = uVar182;
    auVar85 = vmovshdup_avx(auVar185);
    auVar85 = vsubps_avx(auVar85,auVar185);
    auVar197._0_4_ = auVar85._0_4_;
    auVar197._4_4_ = auVar197._0_4_;
    auVar197._8_4_ = auVar197._0_4_;
    auVar197._12_4_ = auVar197._0_4_;
    auVar197._16_4_ = auVar197._0_4_;
    auVar197._20_4_ = auVar197._0_4_;
    auVar197._24_4_ = auVar197._0_4_;
    auVar197._28_4_ = auVar197._0_4_;
    auVar85 = vfmadd132ps_fma(auVar197,auVar175,auVar258._0_32_);
    auVar106 = ZEXT1632(auVar85);
    local_400[0] = (RTCHitN)auVar106[0];
    local_400[1] = (RTCHitN)auVar106[1];
    local_400[2] = (RTCHitN)auVar106[2];
    local_400[3] = (RTCHitN)auVar106[3];
    local_400[4] = (RTCHitN)auVar106[4];
    local_400[5] = (RTCHitN)auVar106[5];
    local_400[6] = (RTCHitN)auVar106[6];
    local_400[7] = (RTCHitN)auVar106[7];
    local_400[8] = (RTCHitN)auVar106[8];
    local_400[9] = (RTCHitN)auVar106[9];
    local_400[10] = (RTCHitN)auVar106[10];
    local_400[0xb] = (RTCHitN)auVar106[0xb];
    local_400[0xc] = (RTCHitN)auVar106[0xc];
    local_400[0xd] = (RTCHitN)auVar106[0xd];
    local_400[0xe] = (RTCHitN)auVar106[0xe];
    local_400[0xf] = (RTCHitN)auVar106[0xf];
    local_400[0x10] = (RTCHitN)auVar106[0x10];
    local_400[0x11] = (RTCHitN)auVar106[0x11];
    local_400[0x12] = (RTCHitN)auVar106[0x12];
    local_400[0x13] = (RTCHitN)auVar106[0x13];
    local_400[0x14] = (RTCHitN)auVar106[0x14];
    local_400[0x15] = (RTCHitN)auVar106[0x15];
    local_400[0x16] = (RTCHitN)auVar106[0x16];
    local_400[0x17] = (RTCHitN)auVar106[0x17];
    local_400[0x18] = (RTCHitN)auVar106[0x18];
    local_400[0x19] = (RTCHitN)auVar106[0x19];
    local_400[0x1a] = (RTCHitN)auVar106[0x1a];
    local_400[0x1b] = (RTCHitN)auVar106[0x1b];
    local_400[0x1c] = (RTCHitN)auVar106[0x1c];
    local_400[0x1d] = (RTCHitN)auVar106[0x1d];
    local_400[0x1e] = (RTCHitN)auVar106[0x1e];
    local_400[0x1f] = (RTCHitN)auVar106[0x1f];
    auVar200 = ZEXT864(*(ulong *)(local_400 + (ulong)uVar155 * 4));
    uVar78 = (ulong)uVar84;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }